

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [24];
  undefined1 auVar39 [32];
  undefined1 auVar40 [24];
  undefined1 auVar41 [32];
  undefined1 auVar42 [24];
  undefined1 auVar43 [32];
  undefined1 auVar44 [24];
  undefined1 auVar45 [32];
  undefined1 auVar46 [24];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [24];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [24];
  long *in_RSI;
  double dVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar194 [16];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_2;
  __m256 tmp_7;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_6;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_8;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  imm_xmm_union u_21;
  imm_xmm_union u_20;
  __m256i ret_8;
  __m128i x2_8;
  __m128i x1_8;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_24;
  imm_xmm_union u_23;
  imm_xmm_union u_22;
  __m256i ret_9;
  __m128i y2_4;
  __m128i y1_4;
  __m128i x2_9;
  __m128i x1_9;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_27;
  imm_xmm_union u_26;
  imm_xmm_union u_25;
  __m256i ret_10;
  __m128i y2_5;
  __m128i y1_5;
  __m128i x2_10;
  __m128i x1_10;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_29;
  imm_xmm_union u_28;
  __m256i ret_11;
  __m128i x2_11;
  __m128i x1_11;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_3;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_9;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_11;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  ulong uStack_9058;
  ulong uStack_8f58;
  undefined8 local_8ef0;
  undefined8 uStack_8ee8;
  undefined8 local_8ee0;
  undefined8 uStack_8ed8;
  undefined8 uStack_8ed0;
  undefined8 uStack_8ec8;
  int local_8eac;
  undefined8 local_8ea8;
  undefined8 local_8ea0;
  undefined8 local_8e98;
  undefined4 local_8e90;
  long local_8e88;
  undefined4 local_8e80;
  undefined4 local_8e7c;
  undefined4 local_8e78;
  undefined4 local_8e74;
  undefined4 local_8e70;
  undefined8 local_8e68;
  undefined1 (*local_8e60) [32];
  int local_8e54;
  undefined8 local_8e50;
  undefined8 uStack_8e48;
  int local_8e3c;
  undefined1 (*local_8df0) [16];
  int local_8de4;
  undefined8 local_8de0;
  undefined8 uStack_8dd8;
  undefined8 uStack_8dd0;
  undefined8 uStack_8dc8;
  int local_8db0;
  undefined1 (*local_8d58) [32];
  int local_8d50;
  int local_8d4c;
  int local_8d48;
  int local_8d44;
  int local_8d40;
  int local_8d3c;
  long *local_8d30;
  undefined1 local_8d15;
  int local_8d14;
  undefined8 *local_8d08;
  undefined8 *local_8cd0;
  undefined8 *local_8c80;
  undefined1 (*local_8c70) [32];
  undefined8 local_8c60;
  undefined8 uStack_8c58;
  undefined8 uStack_8c50;
  undefined8 uStack_8c48;
  undefined8 local_8c20;
  undefined8 uStack_8c18;
  undefined8 uStack_8c10;
  undefined8 uStack_8c08;
  undefined1 (*local_8be8) [32];
  undefined1 (*local_8ba0) [32];
  undefined8 local_8b90;
  undefined8 uStack_8b88;
  undefined8 local_8b70;
  undefined8 uStack_8b68;
  undefined1 (*local_8b58) [32];
  long local_8ac0;
  undefined4 local_8ab4;
  long local_8ab0;
  undefined1 (*local_8aa8) [32];
  undefined4 local_8a9c;
  int local_8a98;
  int local_8a94;
  undefined8 *local_8a90;
  undefined4 local_8a84;
  long local_8a80;
  undefined8 *local_8a40;
  float local_8980;
  float fStack_897c;
  float fStack_8978;
  float fStack_8974;
  float fStack_8970;
  float fStack_896c;
  float fStack_8968;
  float local_8960;
  float fStack_895c;
  float fStack_8958;
  float fStack_8954;
  float fStack_8950;
  float fStack_894c;
  float fStack_8948;
  undefined4 uStack_8944;
  undefined1 local_8940 [8];
  float fStack_8938;
  float fStack_8934;
  float fStack_8930;
  float fStack_892c;
  float fStack_8928;
  undefined1 local_8920 [8];
  float fStack_8918;
  float fStack_8914;
  float fStack_8910;
  float fStack_890c;
  float fStack_8908;
  undefined4 uStack_8904;
  float local_8880;
  float fStack_887c;
  float fStack_8878;
  float fStack_8874;
  float fStack_8870;
  float fStack_886c;
  float fStack_8868;
  float local_8860;
  float fStack_885c;
  float fStack_8858;
  float fStack_8854;
  float fStack_8850;
  float fStack_884c;
  float fStack_8848;
  float local_8840;
  float fStack_883c;
  float fStack_8838;
  float fStack_8834;
  float fStack_8830;
  float fStack_882c;
  float fStack_8828;
  undefined4 uStack_8824;
  undefined8 local_8820;
  undefined8 uStack_8818;
  undefined8 uStack_8810;
  undefined8 uStack_8808;
  undefined8 local_8800;
  undefined8 uStack_87f8;
  undefined8 uStack_87f0;
  undefined8 uStack_87e8;
  undefined8 local_87e0;
  undefined8 uStack_87d8;
  undefined8 uStack_87d0;
  undefined8 uStack_87c8;
  undefined8 local_87c0;
  undefined8 uStack_87b8;
  undefined8 uStack_87b0;
  undefined8 uStack_87a8;
  undefined1 local_87a0 [8];
  float fStack_8798;
  float fStack_8794;
  float fStack_8790;
  float fStack_878c;
  float fStack_8788;
  undefined8 local_8780;
  undefined8 uStack_8778;
  undefined8 uStack_8770;
  undefined8 uStack_8768;
  undefined8 local_8760;
  undefined8 uStack_8758;
  undefined8 uStack_8750;
  undefined8 uStack_8748;
  undefined1 local_8740 [8];
  float fStack_8738;
  float fStack_8734;
  undefined8 uStack_8730;
  undefined8 uStack_8728;
  undefined1 local_86c0 [8];
  float fStack_86b8;
  float fStack_86b4;
  undefined8 uStack_86b0;
  undefined8 uStack_86a8;
  undefined1 local_8640 [8];
  float fStack_8638;
  float fStack_8634;
  undefined8 uStack_8630;
  undefined8 uStack_8628;
  undefined1 local_8560 [8];
  undefined8 uStack_8558;
  undefined8 uStack_8550;
  undefined8 uStack_8548;
  float local_8540;
  float fStack_853c;
  float fStack_8538;
  float fStack_8534;
  float fStack_8530;
  float fStack_852c;
  float fStack_8528;
  float fStack_8524;
  undefined1 local_8520 [32];
  undefined1 local_8500 [32];
  undefined1 local_84e0 [8];
  undefined8 uStack_84d8;
  undefined8 uStack_84d0;
  undefined8 uStack_84c8;
  undefined1 local_84c0 [32];
  undefined8 local_84a0;
  undefined8 uStack_8498;
  undefined8 uStack_8490;
  undefined8 uStack_8488;
  undefined8 local_8480;
  undefined8 uStack_8478;
  undefined8 uStack_8470;
  undefined8 uStack_8468;
  undefined1 local_8460 [8];
  undefined8 uStack_8458;
  undefined8 uStack_8450;
  undefined8 uStack_8448;
  undefined8 local_8440;
  undefined8 uStack_8438;
  undefined8 uStack_8430;
  undefined8 uStack_8428;
  undefined8 local_8420;
  undefined8 uStack_8418;
  undefined8 uStack_8410;
  undefined8 uStack_8408;
  undefined8 local_8400;
  undefined8 uStack_83f8;
  undefined8 uStack_83f0;
  undefined8 uStack_83e8;
  undefined8 local_83e0;
  undefined8 uStack_83d8;
  undefined8 uStack_83d0;
  undefined8 uStack_83c8;
  undefined8 local_83c0;
  undefined8 uStack_83b8;
  undefined8 uStack_83b0;
  undefined8 uStack_83a8;
  undefined8 local_83a0;
  undefined8 uStack_8398;
  undefined8 uStack_8390;
  undefined8 uStack_8388;
  undefined8 local_8380;
  undefined8 uStack_8378;
  undefined8 uStack_8370;
  undefined8 uStack_8368;
  undefined8 local_8360;
  undefined8 uStack_8358;
  undefined8 uStack_8350;
  undefined8 uStack_8348;
  undefined8 local_8340;
  undefined8 uStack_8338;
  undefined8 uStack_8330;
  undefined8 uStack_8328;
  undefined8 local_8320;
  undefined8 uStack_8318;
  undefined8 uStack_8310;
  undefined8 uStack_8308;
  undefined8 local_8300;
  undefined8 uStack_82f8;
  undefined8 uStack_82f0;
  undefined8 uStack_82e8;
  undefined8 local_82e0;
  undefined8 uStack_82d8;
  undefined8 uStack_82d0;
  undefined8 uStack_82c8;
  float local_82c0;
  float fStack_82bc;
  float fStack_82b8;
  float fStack_82b4;
  float fStack_82b0;
  float fStack_82ac;
  float fStack_82a8;
  float fStack_82a4;
  float local_8280;
  float fStack_827c;
  float fStack_8278;
  float fStack_8274;
  float fStack_8270;
  float fStack_826c;
  float fStack_8268;
  float fStack_8264;
  float local_8260;
  float fStack_825c;
  float fStack_8258;
  float fStack_8254;
  float fStack_8250;
  float fStack_824c;
  float fStack_8248;
  float fStack_8244;
  float local_8220;
  float fStack_821c;
  float fStack_8218;
  float fStack_8214;
  float fStack_8210;
  float fStack_820c;
  float fStack_8208;
  float fStack_8204;
  float local_8200;
  float fStack_81fc;
  float fStack_81f8;
  float fStack_81f4;
  float fStack_81f0;
  float fStack_81ec;
  float fStack_81e8;
  float fStack_81e4;
  undefined8 local_81c0;
  undefined8 uStack_81b8;
  undefined8 uStack_81b0;
  undefined8 uStack_81a8;
  undefined8 local_81a0;
  undefined8 uStack_8198;
  undefined8 uStack_8190;
  undefined8 uStack_8188;
  undefined8 local_8100;
  undefined8 uStack_80f8;
  undefined8 uStack_80f0;
  undefined8 uStack_80e8;
  undefined1 local_80e0 [8];
  float fStack_80d8;
  float fStack_80d4;
  float fStack_80d0;
  float fStack_80cc;
  float fStack_80c8;
  undefined4 uStack_80c4;
  float local_8080;
  float fStack_807c;
  float fStack_8078;
  float fStack_8074;
  float fStack_8070;
  float fStack_806c;
  float fStack_8068;
  float local_8020;
  float fStack_801c;
  float fStack_8018;
  float fStack_8014;
  float fStack_8010;
  float fStack_800c;
  float fStack_8008;
  float fStack_8004;
  undefined8 local_7fc0;
  undefined8 uStack_7fb8;
  undefined8 uStack_7fb0;
  undefined8 uStack_7fa8;
  undefined8 local_7fa0;
  undefined8 uStack_7f98;
  undefined8 uStack_7f90;
  undefined8 uStack_7f88;
  undefined1 local_7f80 [32];
  undefined8 local_7f60;
  undefined8 uStack_7f58;
  undefined8 uStack_7f50;
  undefined8 uStack_7f48;
  undefined8 local_7f40;
  undefined8 uStack_7f38;
  undefined8 uStack_7f30;
  undefined8 uStack_7f28;
  undefined1 local_7f20 [8];
  undefined8 uStack_7f18;
  undefined8 uStack_7f10;
  undefined8 uStack_7f08;
  undefined8 local_7f00;
  undefined8 uStack_7ef8;
  undefined8 uStack_7ef0;
  undefined8 uStack_7ee8;
  undefined1 local_7ee0 [32];
  undefined8 local_7ec0;
  undefined8 uStack_7eb8;
  undefined8 uStack_7eb0;
  undefined8 uStack_7ea8;
  undefined8 local_7ea0;
  undefined8 uStack_7e98;
  undefined8 uStack_7e90;
  undefined8 uStack_7e88;
  undefined8 local_7e80;
  undefined8 uStack_7e78;
  undefined8 uStack_7e70;
  undefined8 uStack_7e68;
  undefined8 local_7e60;
  undefined8 uStack_7e58;
  undefined8 uStack_7e50;
  undefined8 uStack_7e48;
  undefined8 local_7e40;
  undefined8 uStack_7e38;
  undefined8 uStack_7e30;
  undefined8 uStack_7e28;
  undefined8 local_7e20;
  undefined8 uStack_7e18;
  undefined8 uStack_7e10;
  undefined8 uStack_7e08;
  undefined4 local_7df8;
  undefined4 local_7df4;
  undefined4 local_7de4;
  undefined8 local_7de0;
  undefined8 uStack_7dd8;
  undefined8 uStack_7dd0;
  undefined8 uStack_7dc8;
  undefined8 local_7dc0;
  undefined8 uStack_7db8;
  undefined8 uStack_7db0;
  undefined8 uStack_7da8;
  undefined1 local_7d60 [32];
  undefined8 local_7d40;
  undefined8 uStack_7d38;
  undefined8 uStack_7d30;
  undefined8 uStack_7d28;
  undefined8 local_7d20;
  undefined8 uStack_7d18;
  undefined8 uStack_7d10;
  undefined8 uStack_7d08;
  undefined8 local_7d00;
  undefined8 uStack_7cf8;
  undefined8 uStack_7cf0;
  undefined8 uStack_7ce8;
  undefined8 local_7c60;
  undefined8 uStack_7c58;
  undefined8 uStack_7c50;
  undefined8 uStack_7c48;
  undefined1 local_7c40 [32];
  undefined8 local_7be0;
  undefined8 uStack_7bd8;
  undefined8 uStack_7bd0;
  undefined8 uStack_7bc8;
  float local_7bc0;
  float fStack_7bbc;
  float fStack_7bb8;
  float fStack_7bb4;
  float fStack_7bb0;
  float fStack_7bac;
  float fStack_7ba8;
  undefined4 uStack_7ba4;
  undefined8 local_7ba0;
  undefined8 uStack_7b98;
  undefined8 uStack_7b90;
  undefined8 uStack_7b88;
  undefined1 local_7b80 [8];
  float fStack_7b78;
  float fStack_7b74;
  float fStack_7b70;
  float fStack_7b6c;
  float fStack_7b68;
  float fStack_7b64;
  undefined8 local_7b60;
  undefined8 uStack_7b58;
  undefined8 uStack_7b50;
  undefined8 uStack_7b48;
  float local_7b40;
  float fStack_7b3c;
  float fStack_7b38;
  float fStack_7b34;
  float fStack_7b30;
  float fStack_7b2c;
  float fStack_7b28;
  float fStack_7b24;
  undefined1 local_7b20 [32];
  undefined8 local_7b00;
  undefined8 uStack_7af8;
  undefined8 uStack_7af0;
  undefined8 uStack_7ae8;
  undefined8 local_7ae0;
  undefined8 uStack_7ad8;
  undefined8 uStack_7ad0;
  undefined8 uStack_7ac8;
  undefined1 local_7ac0 [8];
  undefined8 uStack_7ab8;
  undefined8 uStack_7ab0;
  undefined8 uStack_7aa8;
  undefined8 local_7aa0;
  undefined8 uStack_7a98;
  undefined8 uStack_7a90;
  undefined8 uStack_7a88;
  undefined1 local_7a80 [32];
  undefined8 local_7a60;
  undefined8 uStack_7a58;
  undefined8 uStack_7a50;
  undefined8 uStack_7a48;
  undefined1 local_7a40 [32];
  undefined8 local_7a20;
  undefined8 uStack_7a18;
  undefined8 uStack_7a10;
  undefined8 uStack_7a08;
  undefined8 local_7a00;
  undefined8 uStack_79f8;
  undefined8 uStack_79f0;
  undefined8 uStack_79e8;
  undefined8 local_79e0;
  undefined8 uStack_79d8;
  undefined8 uStack_79d0;
  undefined8 uStack_79c8;
  undefined8 local_79c0;
  undefined8 uStack_79b8;
  undefined8 uStack_79b0;
  undefined8 uStack_79a8;
  undefined4 local_7984;
  undefined8 local_7980;
  undefined8 uStack_7978;
  undefined8 uStack_7970;
  undefined8 uStack_7968;
  undefined8 local_7960;
  undefined8 uStack_7958;
  undefined8 uStack_7950;
  undefined8 uStack_7948;
  undefined8 local_7940;
  undefined8 uStack_7938;
  undefined8 uStack_7930;
  undefined8 uStack_7928;
  undefined8 local_7920;
  ulong uStack_7918;
  undefined8 uStack_7910;
  undefined8 uStack_7908;
  float local_78a0;
  float fStack_789c;
  float fStack_7898;
  float fStack_7894;
  float fStack_7890;
  float fStack_788c;
  float fStack_7888;
  float fStack_7884;
  undefined8 local_7800;
  undefined8 uStack_77f8;
  undefined8 uStack_77f0;
  undefined8 uStack_77e8;
  undefined1 local_77e0 [8];
  float fStack_77d8;
  float fStack_77d4;
  float fStack_77d0;
  float fStack_77cc;
  float fStack_77c8;
  undefined4 uStack_77c4;
  float local_7780;
  float fStack_777c;
  float fStack_7778;
  float fStack_7774;
  float fStack_7770;
  float fStack_776c;
  float fStack_7768;
  float local_7720;
  float fStack_771c;
  float fStack_7718;
  float fStack_7714;
  float fStack_7710;
  float fStack_770c;
  float fStack_7708;
  float fStack_7704;
  float local_75e0;
  float fStack_75dc;
  float fStack_75d8;
  float fStack_75d4;
  float fStack_75d0;
  float fStack_75cc;
  float fStack_75c8;
  float fStack_75c4;
  undefined1 local_75c0 [32];
  undefined8 local_7560;
  ulong uStack_7558;
  undefined8 uStack_7550;
  undefined8 uStack_7548;
  undefined8 local_7540;
  ulong uStack_7538;
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined1 local_7520 [32];
  undefined8 local_74e0;
  ulong uStack_74d8;
  undefined8 uStack_74d0;
  undefined8 uStack_74c8;
  undefined8 local_7460;
  undefined8 uStack_7458;
  undefined8 uStack_7450;
  undefined8 uStack_7448;
  undefined8 local_7440;
  undefined8 uStack_7438;
  undefined8 uStack_7430;
  undefined8 uStack_7428;
  undefined8 local_7420;
  undefined8 uStack_7418;
  undefined8 uStack_7410;
  undefined8 uStack_7408;
  undefined8 local_7400;
  undefined8 uStack_73f8;
  undefined8 uStack_73f0;
  undefined8 uStack_73e8;
  undefined8 local_73a0;
  undefined8 uStack_7398;
  undefined8 uStack_7390;
  undefined8 uStack_7388;
  undefined8 local_7380;
  undefined8 uStack_7378;
  undefined8 uStack_7370;
  undefined8 uStack_7368;
  undefined8 local_7320;
  undefined8 uStack_7318;
  undefined8 uStack_7310;
  undefined8 uStack_7308;
  undefined8 local_7300;
  undefined8 uStack_72f8;
  undefined8 uStack_72f0;
  undefined8 uStack_72e8;
  undefined8 local_72e0;
  undefined8 uStack_72d8;
  undefined8 uStack_72d0;
  undefined8 uStack_72c8;
  undefined1 local_72b0 [16];
  undefined1 local_72a0 [16];
  undefined4 local_7284;
  undefined8 local_7280;
  undefined8 uStack_7278;
  undefined8 uStack_7270;
  undefined8 uStack_7268;
  undefined8 local_71a0;
  undefined8 uStack_7198;
  undefined8 uStack_7190;
  undefined8 uStack_7188;
  undefined8 local_7120;
  undefined8 uStack_7118;
  undefined8 uStack_7110;
  undefined8 uStack_7108;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  undefined8 local_70e0;
  undefined8 uStack_70d8;
  undefined8 uStack_70d0;
  undefined8 uStack_70c8;
  undefined8 local_70c0;
  undefined8 uStack_70b8;
  undefined8 uStack_70b0;
  undefined8 uStack_70a8;
  undefined8 local_7060;
  undefined8 uStack_7058;
  undefined8 uStack_7050;
  undefined8 uStack_7048;
  undefined8 local_7040;
  undefined8 uStack_7038;
  undefined8 uStack_7030;
  undefined8 uStack_7028;
  undefined8 local_7020;
  undefined8 uStack_7018;
  undefined8 uStack_7010;
  undefined8 uStack_7008;
  undefined8 local_7000;
  undefined8 uStack_6ff8;
  undefined8 uStack_6ff0;
  undefined8 uStack_6fe8;
  undefined8 local_6fe0;
  undefined8 uStack_6fd8;
  undefined8 uStack_6fd0;
  undefined8 uStack_6fc8;
  undefined8 local_6fc0;
  undefined8 uStack_6fb8;
  undefined8 uStack_6fb0;
  undefined8 uStack_6fa8;
  undefined8 local_6ee0;
  undefined8 uStack_6ed8;
  undefined8 uStack_6ed0;
  undefined8 uStack_6ec8;
  undefined8 local_6ec0;
  undefined8 uStack_6eb8;
  undefined8 uStack_6eb0;
  undefined8 uStack_6ea8;
  undefined8 local_6ea0;
  undefined8 uStack_6e98;
  undefined8 uStack_6e90;
  undefined8 uStack_6e88;
  undefined8 local_6e80;
  undefined8 uStack_6e78;
  undefined8 uStack_6e70;
  undefined8 uStack_6e68;
  undefined8 local_6de0;
  undefined8 uStack_6dd8;
  undefined8 uStack_6dd0;
  undefined8 uStack_6dc8;
  undefined8 local_6dc0;
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  undefined8 local_6da0;
  undefined8 uStack_6d98;
  undefined8 uStack_6d90;
  undefined8 uStack_6d88;
  undefined8 local_6d80;
  undefined8 uStack_6d78;
  undefined8 uStack_6d70;
  undefined8 uStack_6d68;
  undefined8 local_6d60;
  undefined8 uStack_6d58;
  undefined8 local_6d50;
  undefined8 uStack_6d48;
  undefined1 local_6d40 [16];
  undefined1 local_6d30 [16];
  undefined8 local_6d20;
  undefined8 uStack_6d18;
  undefined8 uStack_6d10;
  undefined8 uStack_6d08;
  undefined8 local_6d00;
  undefined8 uStack_6cf8;
  undefined8 uStack_6cf0;
  undefined8 uStack_6ce8;
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  float local_65e0;
  float fStack_65dc;
  float fStack_65d8;
  float fStack_65d4;
  float fStack_65d0;
  float fStack_65cc;
  float fStack_65c8;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined1 local_6540 [32];
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  float local_64c0;
  float fStack_64bc;
  float fStack_64b8;
  float fStack_64b4;
  float fStack_64b0;
  float fStack_64ac;
  float fStack_64a8;
  float fStack_64a4;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  float local_63e0;
  float fStack_63dc;
  float fStack_63d8;
  float fStack_63d4;
  float fStack_63d0;
  float fStack_63cc;
  float fStack_63c8;
  float fStack_63c4;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined1 local_6380 [32];
  undefined8 local_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  float local_6300;
  float fStack_62fc;
  float fStack_62f8;
  float fStack_62f4;
  float fStack_62f0;
  float fStack_62ec;
  float fStack_62e8;
  float fStack_62e4;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined1 local_62a0 [32];
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  float local_6220;
  float fStack_621c;
  float fStack_6218;
  float fStack_6214;
  float fStack_6210;
  float fStack_620c;
  float fStack_6208;
  float fStack_6204;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined1 local_61c0 [32];
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  float local_6140;
  float fStack_613c;
  float fStack_6138;
  float fStack_6134;
  float fStack_6130;
  float fStack_612c;
  float fStack_6128;
  float fStack_6124;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined1 local_60e0 [32];
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  float local_6060;
  float fStack_605c;
  float fStack_6058;
  float fStack_6054;
  float fStack_6050;
  float fStack_604c;
  float fStack_6048;
  float fStack_6044;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  float local_5f80;
  float fStack_5f7c;
  float fStack_5f78;
  float fStack_5f74;
  float fStack_5f70;
  float fStack_5f6c;
  float fStack_5f68;
  undefined4 uStack_5f64;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  float local_5ea0;
  float fStack_5e9c;
  float fStack_5e98;
  float fStack_5e94;
  float fStack_5e90;
  float fStack_5e8c;
  float fStack_5e88;
  float fStack_5e84;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  float local_5dc0;
  float fStack_5dbc;
  float fStack_5db8;
  float fStack_5db4;
  float fStack_5db0;
  float fStack_5dac;
  float fStack_5da8;
  float fStack_5da4;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  float local_5ce0;
  float fStack_5cdc;
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  float fStack_5cc4;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  float local_5c00;
  float fStack_5bfc;
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  float local_5960;
  float fStack_595c;
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined4 uStack_5944;
  float local_5380;
  float fStack_537c;
  float fStack_5378;
  float fStack_5374;
  float fStack_5370;
  float fStack_536c;
  float fStack_5368;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  float local_5260;
  float fStack_525c;
  float fStack_5258;
  float fStack_5254;
  float fStack_5250;
  float fStack_524c;
  float fStack_5248;
  undefined4 uStack_5244;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  float local_5180;
  float fStack_517c;
  float fStack_5178;
  float fStack_5174;
  float fStack_5170;
  float fStack_516c;
  float fStack_5168;
  undefined4 uStack_5164;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  float local_50a0;
  float fStack_509c;
  float fStack_5098;
  float fStack_5094;
  float fStack_5090;
  float fStack_508c;
  float fStack_5088;
  float fStack_5084;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  float local_4fc0;
  float fStack_4fbc;
  float fStack_4fb8;
  float fStack_4fb4;
  float fStack_4fb0;
  float fStack_4fac;
  float fStack_4fa8;
  float fStack_4fa4;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  float local_4ee0;
  float fStack_4edc;
  float fStack_4ed8;
  float fStack_4ed4;
  float fStack_4ed0;
  float fStack_4ecc;
  float fStack_4ec8;
  float fStack_4ec4;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  float local_4e00;
  float fStack_4dfc;
  float fStack_4df8;
  float fStack_4df4;
  float fStack_4df0;
  float fStack_4dec;
  float fStack_4de8;
  float fStack_4de4;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  float local_4d20;
  float fStack_4d1c;
  float fStack_4d18;
  float fStack_4d14;
  float fStack_4d10;
  float fStack_4d0c;
  float fStack_4d08;
  float fStack_4d04;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  float local_4c40;
  float fStack_4c3c;
  float fStack_4c38;
  float fStack_4c34;
  float fStack_4c30;
  float fStack_4c2c;
  float fStack_4c28;
  float fStack_4c24;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  float local_4b60;
  float fStack_4b5c;
  float fStack_4b58;
  float fStack_4b54;
  float fStack_4b50;
  float fStack_4b4c;
  float fStack_4b48;
  float fStack_4b44;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  float local_4a80;
  float fStack_4a7c;
  float fStack_4a78;
  float fStack_4a74;
  float fStack_4a70;
  float fStack_4a6c;
  float fStack_4a68;
  float fStack_4a64;
  float local_4900;
  float fStack_48fc;
  float fStack_48f8;
  float fStack_48f4;
  float fStack_48f0;
  float fStack_48ec;
  float fStack_48e8;
  float local_4040;
  float fStack_403c;
  float fStack_4038;
  float fStack_4034;
  float fStack_4030;
  float fStack_402c;
  float fStack_4028;
  float fStack_4024;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  float local_3f40;
  float fStack_3f3c;
  float fStack_3f38;
  float fStack_3f34;
  float fStack_3f30;
  float fStack_3f2c;
  float fStack_3f28;
  float fStack_3f24;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  float local_3e60;
  float fStack_3e5c;
  float fStack_3e58;
  float fStack_3e54;
  float fStack_3e50;
  float fStack_3e4c;
  float fStack_3e48;
  float fStack_3e44;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  float local_3d80;
  float fStack_3d7c;
  float fStack_3d78;
  float fStack_3d74;
  float fStack_3d70;
  float fStack_3d6c;
  float fStack_3d68;
  float fStack_3d64;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3ca0;
  float fStack_3c9c;
  float fStack_3c98;
  float fStack_3c94;
  float fStack_3c90;
  float fStack_3c8c;
  float fStack_3c88;
  float fStack_3c84;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  float local_3b00;
  float fStack_3afc;
  float fStack_3af8;
  float fStack_3af4;
  float fStack_3af0;
  float fStack_3aec;
  float fStack_3ae8;
  float fStack_3ae4;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  float local_3a00;
  float fStack_39fc;
  float fStack_39f8;
  float fStack_39f4;
  float fStack_39f0;
  float fStack_39ec;
  float fStack_39e8;
  float fStack_39e4;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined4 local_3894;
  undefined8 local_3890;
  undefined8 uStack_3888;
  undefined4 local_3874;
  undefined8 local_3870;
  undefined8 uStack_3868;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 local_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 local_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 local_34d0;
  undefined8 uStack_34c8;
  undefined1 local_34c0 [16];
  undefined1 local_34b0 [16];
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 local_33d0;
  undefined8 uStack_33c8;
  undefined1 local_33c0 [16];
  undefined1 local_33b0 [16];
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined1 local_3130 [16];
  undefined1 local_3120 [16];
  undefined4 local_3104;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined1 local_3070 [16];
  undefined1 local_3060 [16];
  undefined4 local_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 local_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 local_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 local_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 local_2e30;
  undefined8 uStack_2e28;
  undefined4 local_2d94;
  undefined8 local_2d90;
  undefined8 uStack_2d88;
  undefined4 local_2d74;
  undefined8 local_2d70;
  undefined8 uStack_2d68;
  undefined4 local_2d54;
  undefined8 local_2d50;
  undefined8 uStack_2d48;
  undefined4 local_2d34;
  undefined8 local_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined1 local_2ca0 [16];
  undefined1 auStack_2c90 [16];
  undefined4 local_2c80;
  undefined4 local_2c7c;
  undefined4 local_2c78;
  undefined4 local_2c74;
  undefined4 local_2c70;
  undefined4 local_2c6c;
  undefined4 local_2c68;
  undefined4 local_2c64;
  undefined1 local_2c60 [16];
  undefined1 auStack_2c50 [16];
  undefined4 local_2c40;
  undefined4 local_2c3c;
  undefined4 local_2c38;
  undefined4 local_2c34;
  undefined4 local_2c30;
  undefined4 local_2c2c;
  undefined4 local_2c28;
  undefined4 local_2c24;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined1 local_2b60 [16];
  undefined1 auStack_2b50 [16];
  undefined4 local_2b40;
  undefined4 local_2b3c;
  undefined4 local_2b38;
  undefined4 local_2b34;
  undefined4 local_2b30;
  undefined4 local_2b2c;
  undefined4 local_2b28;
  undefined4 local_2b24;
  undefined1 local_2b20 [16];
  undefined1 auStack_2b10 [16];
  undefined4 local_2af0;
  undefined4 local_2aec;
  undefined4 local_2ae8;
  undefined4 local_2ae4;
  undefined4 local_2ae0;
  undefined4 local_2adc;
  undefined4 local_2ad8;
  undefined4 local_2ad4;
  float local_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  undefined1 local_2ab0 [8];
  float fStack_2aa8;
  float fStack_2aa4;
  undefined1 local_2aa0 [8];
  float fStack_2a98;
  float fStack_2a94;
  float local_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  float fStack_2a44;
  float local_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  float fStack_2a24;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 local_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 local_29f0;
  undefined8 uStack_29e8;
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  undefined8 local_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 local_29b0;
  undefined8 uStack_29a8;
  undefined8 local_2970;
  undefined8 uStack_2968;
  undefined8 local_2930;
  undefined8 uStack_2928;
  undefined1 local_2880 [8];
  undefined8 uStack_2878;
  float local_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  undefined1 local_2860 [16];
  undefined1 local_2850 [16];
  undefined1 local_2840 [8];
  undefined8 uStack_2838;
  undefined1 local_2830 [16];
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined1 local_2810 [16];
  undefined1 local_2800 [8];
  undefined8 uStack_27f8;
  undefined4 local_27e4;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 local_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 local_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 local_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  float local_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  float local_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined1 local_24d0 [16];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [8];
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [16];
  undefined8 local_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined4 local_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 local_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 local_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined4 local_2390;
  undefined4 uStack_238c;
  undefined4 uStack_2388;
  undefined4 uStack_2384;
  undefined4 local_2374;
  undefined4 local_2370;
  undefined4 uStack_236c;
  undefined4 uStack_2368;
  undefined4 uStack_2364;
  undefined4 local_2354;
  undefined4 local_22f0;
  undefined4 uStack_22ec;
  undefined4 uStack_22e8;
  undefined4 uStack_22e4;
  undefined4 local_22d4;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined1 local_2290 [16];
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 local_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 local_2210;
  undefined8 uStack_2208;
  undefined1 local_2200 [16];
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined1 local_21a0 [16];
  undefined8 local_2190;
  undefined8 uStack_2188;
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  undefined1 local_2170 [16];
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined1 local_2150 [16];
  undefined1 local_2140 [8];
  undefined8 uStack_2138;
  undefined8 local_2130;
  undefined8 uStack_2128;
  undefined1 local_2120 [16];
  undefined8 local_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined4 local_20e4;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 local_20d0;
  undefined8 uStack_20c8;
  undefined1 local_20c0 [16];
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined4 local_2030;
  undefined4 uStack_202c;
  undefined4 uStack_2028;
  undefined4 uStack_2024;
  undefined4 local_2014;
  undefined8 local_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 local_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  ulong uStack_1fd8;
  undefined8 local_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  float local_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float local_1e80;
  float fStack_1e7c;
  float fStack_1e78;
  float fStack_1e74;
  float local_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  undefined1 local_1da0 [16];
  undefined8 local_1d70;
  ulong uStack_1d68;
  undefined1 local_1d60 [16];
  undefined1 local_1d50 [16];
  undefined1 local_1d30 [16];
  ulong uStack_1d18;
  undefined8 local_1d10;
  ulong uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 local_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 local_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined1 local_16d0 [16];
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  float local_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 local_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 local_1630;
  undefined8 uStack_1628;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined1 local_15f0 [16];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  float local_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined1 local_1580 [16];
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined1 local_1510 [16];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [16];
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  float local_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  float local_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  float local_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  float local_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  float local_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  float local_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  float local_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  float local_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_8d3c = *(int *)((long)in_RSI + 0x2c);
  local_8d40 = (int)in_RSI[6];
  local_8d44 = (int)in_RSI[7];
  local_8d48 = local_8d3c * local_8d40;
  local_8d4c = (int)in_RSI[3];
  if (local_8d4c == 8) {
    for (local_8d50 = 0; local_8d50 < local_8d44; local_8d50 = local_8d50 + 1) {
      local_8d58 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_8d50 * in_RSI[2]);
      for (local_8db0 = 0; local_8db0 < local_8d48; local_8db0 = local_8db0 + 1) {
        auVar93._8_8_ = 0x42b0c0a542b0c0a5;
        auVar93._0_8_ = 0x42b0c0a542b0c0a5;
        auVar93._16_8_ = 0x42b0c0a542b0c0a5;
        auVar93._24_8_ = 0x42b0c0a542b0c0a5;
        auVar3 = vminps_avx(*local_8d58,auVar93);
        auVar55._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar55._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar55._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar55._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar2 = vmaxps_avx(auVar3,auVar55);
        local_5380 = auVar2._0_4_;
        fStack_537c = auVar2._4_4_;
        fStack_5378 = auVar2._8_4_;
        fStack_5374 = auVar2._12_4_;
        fStack_5370 = auVar2._16_4_;
        fStack_536c = auVar2._20_4_;
        fStack_5368 = auVar2._24_4_;
        local_80e0._4_4_ = fStack_537c * 1.442695 + 0.5;
        local_80e0._0_4_ = local_5380 * 1.442695 + 0.5;
        fStack_80d8 = fStack_5378 * 1.442695 + 0.5;
        fStack_80d4 = fStack_5374 * 1.442695 + 0.5;
        fStack_80d0 = fStack_5370 * 1.442695 + 0.5;
        fStack_80cc = fStack_536c * 1.442695 + 0.5;
        fStack_80c8 = fStack_5368 * 1.442695 + 0.5;
        uStack_80c4 = 0x3ff8aa3b;
        auVar9 = vroundps_avx(_local_80e0,1);
        auVar3 = vcmpps_avx(_local_80e0,auVar9,1);
        auVar63._8_8_ = 0x3f8000003f800000;
        auVar63._0_8_ = 0x3f8000003f800000;
        auVar63._16_8_ = 0x3f8000003f800000;
        auVar63._24_8_ = 0x3f8000003f800000;
        auVar3 = vandps_avx(auVar3,auVar63);
        auVar3 = vsubps_avx(auVar9,auVar3);
        local_3b00 = auVar3._0_4_;
        fStack_3afc = auVar3._4_4_;
        fStack_3af8 = auVar3._8_4_;
        fStack_3af4 = auVar3._12_4_;
        fStack_3af0 = auVar3._16_4_;
        fStack_3aec = auVar3._20_4_;
        fStack_3ae8 = auVar3._24_4_;
        fStack_3ae4 = auVar3._28_4_;
        auVar81._4_4_ = fStack_3afc * 0.6933594;
        auVar81._0_4_ = local_3b00 * 0.6933594;
        auVar81._8_4_ = fStack_3af8 * 0.6933594;
        auVar81._12_4_ = fStack_3af4 * 0.6933594;
        auVar81._16_4_ = fStack_3af0 * 0.6933594;
        auVar81._20_4_ = fStack_3aec * 0.6933594;
        auVar81._24_4_ = fStack_3ae8 * 0.6933594;
        auVar81._28_4_ = fStack_3ae4;
        auVar3 = vsubps_avx(auVar2,auVar81);
        auVar80._4_4_ = fStack_3afc * -0.00021219444;
        auVar80._0_4_ = local_3b00 * -0.00021219444;
        auVar80._8_4_ = fStack_3af8 * -0.00021219444;
        auVar80._12_4_ = fStack_3af4 * -0.00021219444;
        auVar80._16_4_ = fStack_3af0 * -0.00021219444;
        auVar80._20_4_ = fStack_3aec * -0.00021219444;
        auVar80._24_4_ = fStack_3ae8 * -0.00021219444;
        auVar80._28_4_ = fStack_3ae4;
        auVar3 = vsubps_avx(auVar3,auVar80);
        local_8020 = auVar3._0_4_;
        fStack_801c = auVar3._4_4_;
        fStack_8018 = auVar3._8_4_;
        fStack_8014 = auVar3._12_4_;
        fStack_8010 = auVar3._16_4_;
        fStack_800c = auVar3._20_4_;
        fStack_8008 = auVar3._24_4_;
        fStack_8004 = auVar3._28_4_;
        local_8100 = CONCAT44((int)fStack_3afc,(int)local_3b00);
        uStack_80f8 = CONCAT44((int)fStack_3af4,(int)fStack_3af8);
        uStack_80f0 = CONCAT44((int)fStack_3aec,(int)fStack_3af0);
        uStack_80e8 = CONCAT44((int)fStack_3ae4,(int)fStack_3ae8);
        auVar97._8_8_ = uStack_80f8;
        auVar97._0_8_ = local_8100;
        auVar96._8_8_ = 0x7f0000007f;
        auVar96._0_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx(auVar97,auVar96);
        auVar95._8_8_ = uStack_80e8;
        auVar95._0_8_ = uStack_80f0;
        auVar94._8_8_ = 0x7f0000007f;
        auVar94._0_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx(auVar95,auVar94);
        auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
        auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
        local_8080 = auVar5._0_4_;
        fStack_807c = auVar5._4_4_;
        fStack_8078 = auVar5._8_4_;
        fStack_8074 = auVar5._12_4_;
        fStack_8070 = auVar6._0_4_;
        fStack_806c = auVar6._4_4_;
        fStack_8068 = auVar6._8_4_;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        uStack_8f58 = SUB328(ZEXT832(0),4);
        local_8200 = auVar5._0_4_;
        fStack_81fc = auVar5._4_4_;
        fStack_81f8 = auVar5._8_4_;
        fStack_81f4 = auVar5._12_4_;
        fStack_81f0 = auVar6._0_4_;
        fStack_81ec = auVar6._4_4_;
        fStack_81e8 = auVar6._8_4_;
        fStack_81e4 = auVar6._12_4_;
        local_8640._4_4_ =
             ((((((fStack_801c * 0.00019875691 + 0.0013981999) * fStack_801c + 0.008333452) *
                 fStack_801c + 0.041665796) * fStack_801c + 0.16666666) * fStack_801c + 0.5) *
              fStack_801c * fStack_801c + fStack_801c + 1.0) * fStack_807c + fStack_81fc;
        local_8640._0_4_ =
             ((((((local_8020 * 0.00019875691 + 0.0013981999) * local_8020 + 0.008333452) *
                 local_8020 + 0.041665796) * local_8020 + 0.16666666) * local_8020 + 0.5) *
              local_8020 * local_8020 + local_8020 + 1.0) * local_8080 + local_8200;
        fStack_8638 = ((((((fStack_8018 * 0.00019875691 + 0.0013981999) * fStack_8018 + 0.008333452)
                          * fStack_8018 + 0.041665796) * fStack_8018 + 0.16666666) * fStack_8018 +
                       0.5) * fStack_8018 * fStack_8018 + fStack_8018 + 1.0) * fStack_8078 +
                      fStack_81f8;
        fStack_8634 = ((((((fStack_8014 * 0.00019875691 + 0.0013981999) * fStack_8014 + 0.008333452)
                          * fStack_8014 + 0.041665796) * fStack_8014 + 0.16666666) * fStack_8014 +
                       0.5) * fStack_8014 * fStack_8014 + fStack_8014 + 1.0) * fStack_8074 +
                      fStack_81f4;
        uStack_8630._0_4_ =
             ((((((fStack_8010 * 0.00019875691 + 0.0013981999) * fStack_8010 + 0.008333452) *
                 fStack_8010 + 0.041665796) * fStack_8010 + 0.16666666) * fStack_8010 + 0.5) *
              fStack_8010 * fStack_8010 + fStack_8010 + 1.0) * fStack_8070 + fStack_81f0;
        uStack_8630._4_4_ =
             ((((((fStack_800c * 0.00019875691 + 0.0013981999) * fStack_800c + 0.008333452) *
                 fStack_800c + 0.041665796) * fStack_800c + 0.16666666) * fStack_800c + 0.5) *
              fStack_800c * fStack_800c + fStack_800c + 1.0) * fStack_806c + fStack_81ec;
        uStack_8628._0_4_ =
             ((((((fStack_8008 * 0.00019875691 + 0.0013981999) * fStack_8008 + 0.008333452) *
                 fStack_8008 + 0.041665796) * fStack_8008 + 0.16666666) * fStack_8008 + 0.5) *
              fStack_8008 * fStack_8008 + fStack_8008 + 1.0) * fStack_8068 + fStack_81e8;
        uStack_8628._4_4_ = fStack_8004 + fStack_8004 + 1.0 + fStack_81e4;
        auVar3 = _local_8640;
        auVar9 = vcmpps_avx(_local_8640,ZEXT832(uStack_8f58) << 0x40,2);
        uStack_8628 = auVar3._24_8_;
        auVar59._16_8_ = uStack_8630;
        auVar59._0_16_ = _local_8640;
        auVar59._24_8_ = uStack_8628;
        auVar58._8_8_ = 0x80000000800000;
        auVar58._0_8_ = 0x80000000800000;
        auVar58._16_8_ = 0x80000000800000;
        auVar58._24_8_ = 0x80000000800000;
        auVar3 = vmaxps_avx(auVar59,auVar58);
        auVar5 = vpsrld_avx(auVar3._0_16_,ZEXT416(0x17));
        auVar6 = vpsrld_avx(auVar3._16_16_,ZEXT416(0x17));
        auVar67._8_8_ = 0x807fffff807fffff;
        auVar67._0_8_ = 0x807fffff807fffff;
        auVar67._16_8_ = 0x807fffff807fffff;
        auVar67._24_8_ = 0x807fffff807fffff;
        auVar3 = vandps_avx(auVar3,auVar67);
        auVar71._8_8_ = 0x3f0000003f000000;
        auVar71._0_8_ = 0x3f0000003f000000;
        auVar71._16_8_ = 0x3f0000003f000000;
        auVar71._24_8_ = 0x3f0000003f000000;
        auVar4 = vorps_avx(auVar3,auVar71);
        auVar87._8_8_ = 0x7f0000007f;
        auVar87._0_8_ = 0x7f0000007f;
        auVar5 = vpsubd_avx(auVar5,auVar87);
        auVar86._8_8_ = 0x7f0000007f;
        auVar86._0_8_ = 0x7f0000007f;
        auVar6 = vpsubd_avx(auVar6,auVar86);
        local_6c40 = auVar6._0_8_;
        uStack_6c38 = auVar6._8_8_;
        auVar73._16_8_ = local_6c40;
        auVar73._0_16_ = auVar5;
        auVar73._24_8_ = uStack_6c38;
        auVar3 = vcvtdq2ps_avx(auVar73);
        local_8220 = auVar3._0_4_;
        fStack_821c = auVar3._4_4_;
        fStack_8218 = auVar3._8_4_;
        fStack_8214 = auVar3._12_4_;
        fStack_8210 = auVar3._16_4_;
        fStack_820c = auVar3._20_4_;
        fStack_8208 = auVar3._24_4_;
        fStack_8204 = auVar3._28_4_;
        local_86c0._4_4_ = fStack_821c + 1.0;
        local_86c0._0_4_ = local_8220 + 1.0;
        fStack_86b8 = fStack_8218 + 1.0;
        fStack_86b4 = fStack_8214 + 1.0;
        uStack_86b0._0_4_ = fStack_8210 + 1.0;
        uStack_86b0._4_4_ = fStack_820c + 1.0;
        uStack_86a8._0_4_ = fStack_8208 + 1.0;
        uStack_86a8._4_4_ = fStack_8204 + 1.0;
        auVar37 = _local_86c0;
        auVar2 = vcmpps_avx(auVar4,_DAT_01f0ece0,1);
        auVar3 = vandps_avx(auVar4,auVar2);
        auVar34._8_8_ = 0x3f8000003f800000;
        auVar34._0_8_ = 0x3f8000003f800000;
        auVar34._16_8_ = 0x3f8000003f800000;
        auVar34._24_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar4,auVar34);
        uStack_86a8 = auVar37._24_8_;
        auVar66._8_8_ = 0x3f8000003f800000;
        auVar66._0_8_ = 0x3f8000003f800000;
        auVar66._16_8_ = 0x3f8000003f800000;
        auVar66._24_8_ = 0x3f8000003f800000;
        auVar2 = vandps_avx(auVar66,auVar2);
        auVar33._16_8_ = uStack_86b0;
        auVar33._0_16_ = _local_86c0;
        auVar33._24_8_ = uStack_86a8;
        auVar2 = vsubps_avx(auVar33,auVar2);
        local_8260 = auVar4._0_4_;
        fStack_825c = auVar4._4_4_;
        fStack_8258 = auVar4._8_4_;
        fStack_8254 = auVar4._12_4_;
        fStack_8250 = auVar4._16_4_;
        fStack_824c = auVar4._20_4_;
        fStack_8248 = auVar4._24_4_;
        fStack_8244 = auVar4._28_4_;
        local_8280 = auVar3._0_4_;
        fStack_827c = auVar3._4_4_;
        fStack_8278 = auVar3._8_4_;
        fStack_8274 = auVar3._12_4_;
        fStack_8270 = auVar3._16_4_;
        fStack_826c = auVar3._20_4_;
        fStack_8268 = auVar3._24_4_;
        fStack_8264 = auVar3._28_4_;
        local_8260 = local_8260 + local_8280;
        fStack_825c = fStack_825c + fStack_827c;
        fStack_8258 = fStack_8258 + fStack_8278;
        fStack_8254 = fStack_8254 + fStack_8274;
        fStack_8250 = fStack_8250 + fStack_8270;
        fStack_824c = fStack_824c + fStack_826c;
        fStack_8248 = fStack_8248 + fStack_8268;
        fStack_8244 = fStack_8244 + fStack_8264;
        local_4900 = auVar2._0_4_;
        fStack_48fc = auVar2._4_4_;
        fStack_48f8 = auVar2._8_4_;
        fStack_48f4 = auVar2._12_4_;
        fStack_48f0 = auVar2._16_4_;
        fStack_48ec = auVar2._20_4_;
        fStack_48e8 = auVar2._24_4_;
        local_8740._4_4_ =
             fStack_48fc * -0.00021219444 +
             ((((((((fStack_825c * 0.070376836 + -0.1151461) * fStack_825c + 0.116769984) *
                   fStack_825c + -0.12420141) * fStack_825c + 0.14249323) * fStack_825c +
                -0.16668057) * fStack_825c + 0.20000714) * fStack_825c + -0.24999994) * fStack_825c
             + 0.3333333) * fStack_825c * fStack_825c * fStack_825c;
        local_8740._0_4_ =
             local_4900 * -0.00021219444 +
             ((((((((local_8260 * 0.070376836 + -0.1151461) * local_8260 + 0.116769984) * local_8260
                  + -0.12420141) * local_8260 + 0.14249323) * local_8260 + -0.16668057) * local_8260
               + 0.20000714) * local_8260 + -0.24999994) * local_8260 + 0.3333333) * local_8260 *
             local_8260 * local_8260;
        fStack_8738 = fStack_48f8 * -0.00021219444 +
                      ((((((((fStack_8258 * 0.070376836 + -0.1151461) * fStack_8258 + 0.116769984) *
                            fStack_8258 + -0.12420141) * fStack_8258 + 0.14249323) * fStack_8258 +
                         -0.16668057) * fStack_8258 + 0.20000714) * fStack_8258 + -0.24999994) *
                       fStack_8258 + 0.3333333) * fStack_8258 * fStack_8258 * fStack_8258;
        fStack_8734 = fStack_48f4 * -0.00021219444 +
                      ((((((((fStack_8254 * 0.070376836 + -0.1151461) * fStack_8254 + 0.116769984) *
                            fStack_8254 + -0.12420141) * fStack_8254 + 0.14249323) * fStack_8254 +
                         -0.16668057) * fStack_8254 + 0.20000714) * fStack_8254 + -0.24999994) *
                       fStack_8254 + 0.3333333) * fStack_8254 * fStack_8254 * fStack_8254;
        uStack_8730._0_4_ =
             fStack_48f0 * -0.00021219444 +
             ((((((((fStack_8250 * 0.070376836 + -0.1151461) * fStack_8250 + 0.116769984) *
                   fStack_8250 + -0.12420141) * fStack_8250 + 0.14249323) * fStack_8250 +
                -0.16668057) * fStack_8250 + 0.20000714) * fStack_8250 + -0.24999994) * fStack_8250
             + 0.3333333) * fStack_8250 * fStack_8250 * fStack_8250;
        uStack_8730._4_4_ =
             fStack_48ec * -0.00021219444 +
             ((((((((fStack_824c * 0.070376836 + -0.1151461) * fStack_824c + 0.116769984) *
                   fStack_824c + -0.12420141) * fStack_824c + 0.14249323) * fStack_824c +
                -0.16668057) * fStack_824c + 0.20000714) * fStack_824c + -0.24999994) * fStack_824c
             + 0.3333333) * fStack_824c * fStack_824c * fStack_824c;
        uStack_8728._0_4_ =
             fStack_48e8 * -0.00021219444 +
             ((((((((fStack_8248 * 0.070376836 + -0.1151461) * fStack_8248 + 0.116769984) *
                   fStack_8248 + -0.12420141) * fStack_8248 + 0.14249323) * fStack_8248 +
                -0.16668057) * fStack_8248 + 0.20000714) * fStack_8248 + -0.24999994) * fStack_8248
             + 0.3333333) * fStack_8248 * fStack_8248 * fStack_8248;
        uStack_8728._4_4_ = fStack_8244 + 0.3333333 + -0.00021219444;
        auVar3 = _local_8740;
        uStack_8728 = auVar3._24_8_;
        auVar85._16_8_ = uStack_8730;
        auVar85._0_16_ = _local_8740;
        auVar85._24_8_ = uStack_8728;
        auVar84._4_4_ = fStack_825c * fStack_825c * 0.5;
        auVar84._0_4_ = local_8260 * local_8260 * 0.5;
        auVar84._8_4_ = fStack_8258 * fStack_8258 * 0.5;
        auVar84._12_4_ = fStack_8254 * fStack_8254 * 0.5;
        auVar84._16_4_ = fStack_8250 * fStack_8250 * 0.5;
        auVar84._20_4_ = fStack_824c * fStack_824c * 0.5;
        auVar84._24_4_ = fStack_8248 * fStack_8248 * 0.5;
        auVar84._28_4_ = fStack_8244;
        auVar3 = vsubps_avx(auVar85,auVar84);
        local_82c0 = auVar3._0_4_;
        fStack_82bc = auVar3._4_4_;
        fStack_82b8 = auVar3._8_4_;
        fStack_82b4 = auVar3._12_4_;
        fStack_82b0 = auVar3._16_4_;
        fStack_82ac = auVar3._20_4_;
        fStack_82a8 = auVar3._24_4_;
        fStack_82a4 = auVar3._28_4_;
        local_8640._4_4_ = fStack_48fc * 0.6933594 + fStack_825c + fStack_82bc;
        local_8640._0_4_ = local_4900 * 0.6933594 + local_8260 + local_82c0;
        fStack_8638 = fStack_48f8 * 0.6933594 + fStack_8258 + fStack_82b8;
        fStack_8634 = fStack_48f4 * 0.6933594 + fStack_8254 + fStack_82b4;
        uStack_8630._0_4_ = fStack_48f0 * 0.6933594 + fStack_8250 + fStack_82b0;
        uStack_8630._4_4_ = fStack_48ec * 0.6933594 + fStack_824c + fStack_82ac;
        uStack_8628._0_4_ = fStack_48e8 * 0.6933594 + fStack_8248 + fStack_82a8;
        uStack_8628._4_4_ = fStack_8244 + fStack_82a4 + 0.6933594;
        auVar3 = _local_8640;
        uStack_8628 = auVar3._24_8_;
        auVar70._16_8_ = uStack_8630;
        auVar70._0_16_ = _local_8640;
        auVar70._24_8_ = uStack_8628;
        auVar3 = vorps_avx(auVar70,auVar9);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        uStack_2bd0 = auVar6._0_8_;
        uStack_2bc8 = auVar6._8_8_;
        auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        local_8840 = auVar3._0_4_;
        fStack_883c = auVar3._4_4_;
        fStack_8838 = auVar3._8_4_;
        fStack_8834 = auVar3._12_4_;
        fStack_8830 = auVar3._16_4_;
        fStack_882c = auVar3._20_4_;
        fStack_8828 = auVar3._24_4_;
        uStack_8824 = auVar3._28_4_;
        local_8860 = auVar6._0_4_;
        fStack_885c = auVar6._4_4_;
        fStack_8858 = auVar6._8_4_;
        fStack_8854 = auVar6._12_4_;
        fStack_8850 = auVar1._0_4_;
        fStack_884c = auVar1._4_4_;
        fStack_8848 = auVar1._8_4_;
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        uStack_2cd0 = auVar1._0_8_;
        uStack_2cc8 = auVar1._8_8_;
        auVar48._4_4_ = fStack_883c * fStack_885c;
        auVar48._0_4_ = local_8840 * local_8860;
        auVar48._12_4_ = fStack_8834 * fStack_8854;
        auVar48._8_4_ = fStack_8838 * fStack_8858;
        auVar48._20_4_ = fStack_882c * fStack_884c;
        auVar48._16_4_ = fStack_8830 * fStack_8850;
        auVar48._28_4_ = uStack_8824;
        auVar48._24_4_ = fStack_8828 * fStack_8848;
        auVar3 = vsubps_avx(ZEXT832(uStack_8f58) << 0x40,auVar48);
        auVar90._8_8_ = 0x42b0c0a542b0c0a5;
        auVar90._0_8_ = 0x42b0c0a542b0c0a5;
        auVar90._16_8_ = 0x42b0c0a542b0c0a5;
        auVar90._24_8_ = 0x42b0c0a542b0c0a5;
        auVar3 = vminps_avx(auVar3,auVar90);
        auVar52._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar52._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar52._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar2 = vmaxps_avx(auVar3,auVar52);
        local_65e0 = auVar2._0_4_;
        fStack_65dc = auVar2._4_4_;
        fStack_65d8 = auVar2._8_4_;
        fStack_65d4 = auVar2._12_4_;
        fStack_65d0 = auVar2._16_4_;
        fStack_65cc = auVar2._20_4_;
        fStack_65c8 = auVar2._24_4_;
        local_77e0._4_4_ = fStack_65dc * 1.442695 + 0.5;
        local_77e0._0_4_ = local_65e0 * 1.442695 + 0.5;
        fStack_77d8 = fStack_65d8 * 1.442695 + 0.5;
        fStack_77d4 = fStack_65d4 * 1.442695 + 0.5;
        fStack_77d0 = fStack_65d0 * 1.442695 + 0.5;
        fStack_77cc = fStack_65cc * 1.442695 + 0.5;
        fStack_77c8 = fStack_65c8 * 1.442695 + 0.5;
        uStack_77c4 = 0x3ff8aa3b;
        auVar9 = vroundps_avx(_local_77e0,1);
        auVar3 = vcmpps_avx(_local_77e0,auVar9,1);
        auVar60._8_8_ = 0x3f8000003f800000;
        auVar60._0_8_ = 0x3f8000003f800000;
        auVar60._16_8_ = 0x3f8000003f800000;
        auVar60._24_8_ = 0x3f8000003f800000;
        auVar3 = vandps_avx(auVar3,auVar60);
        auVar3 = vsubps_avx(auVar9,auVar3);
        local_4040 = auVar3._0_4_;
        fStack_403c = auVar3._4_4_;
        fStack_4038 = auVar3._8_4_;
        fStack_4034 = auVar3._12_4_;
        fStack_4030 = auVar3._16_4_;
        fStack_402c = auVar3._20_4_;
        fStack_4028 = auVar3._24_4_;
        fStack_4024 = auVar3._28_4_;
        auVar75._4_4_ = fStack_403c * 0.6933594;
        auVar75._0_4_ = local_4040 * 0.6933594;
        auVar75._8_4_ = fStack_4038 * 0.6933594;
        auVar75._12_4_ = fStack_4034 * 0.6933594;
        auVar75._16_4_ = fStack_4030 * 0.6933594;
        auVar75._20_4_ = fStack_402c * 0.6933594;
        auVar75._24_4_ = fStack_4028 * 0.6933594;
        auVar75._28_4_ = fStack_4024;
        auVar3 = vsubps_avx(auVar2,auVar75);
        auVar74._4_4_ = fStack_403c * -0.00021219444;
        auVar74._0_4_ = local_4040 * -0.00021219444;
        auVar74._8_4_ = fStack_4038 * -0.00021219444;
        auVar74._12_4_ = fStack_4034 * -0.00021219444;
        auVar74._16_4_ = fStack_4030 * -0.00021219444;
        auVar74._20_4_ = fStack_402c * -0.00021219444;
        auVar74._24_4_ = fStack_4028 * -0.00021219444;
        auVar74._28_4_ = fStack_4024;
        auVar3 = vsubps_avx(auVar3,auVar74);
        local_7720 = auVar3._0_4_;
        fStack_771c = auVar3._4_4_;
        fStack_7718 = auVar3._8_4_;
        fStack_7714 = auVar3._12_4_;
        fStack_7710 = auVar3._16_4_;
        fStack_770c = auVar3._20_4_;
        fStack_7708 = auVar3._24_4_;
        fStack_7704 = auVar3._28_4_;
        local_7800 = CONCAT44((int)fStack_403c,(int)local_4040);
        uStack_77f8 = CONCAT44((int)fStack_4034,(int)fStack_4038);
        uStack_77f0 = CONCAT44((int)fStack_402c,(int)fStack_4030);
        uStack_77e8 = CONCAT44((int)fStack_4024,(int)fStack_4028);
        auVar109._8_8_ = uStack_77f8;
        auVar109._0_8_ = local_7800;
        auVar108._8_8_ = 0x7f0000007f;
        auVar108._0_8_ = 0x7f0000007f;
        auVar7 = vpaddd_avx(auVar109,auVar108);
        auVar107._8_8_ = uStack_77e8;
        auVar107._0_8_ = uStack_77f0;
        auVar106._8_8_ = 0x7f0000007f;
        auVar106._0_8_ = 0x7f0000007f;
        auVar8 = vpaddd_avx(auVar107,auVar106);
        auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
        auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
        local_7780 = auVar7._0_4_;
        fStack_777c = auVar7._4_4_;
        fStack_7778 = auVar7._8_4_;
        fStack_7774 = auVar7._12_4_;
        fStack_7770 = auVar8._0_4_;
        fStack_776c = auVar8._4_4_;
        fStack_7768 = auVar8._8_4_;
        local_78a0 = auVar6._0_4_;
        fStack_789c = auVar6._4_4_;
        fStack_7898 = auVar6._8_4_;
        fStack_7894 = auVar6._12_4_;
        fStack_7890 = auVar1._0_4_;
        fStack_788c = auVar1._4_4_;
        fStack_7888 = auVar1._8_4_;
        fStack_7884 = auVar1._12_4_;
        auVar50._16_8_ = uStack_2cd0;
        auVar50._0_16_ = auVar6;
        auVar50._24_8_ = uStack_2cc8;
        auVar49._4_4_ =
             fStack_789c +
             (((((fStack_771c * (fStack_771c * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_771c + 0.041665796) * fStack_771c + 0.16666666) * fStack_771c + 0.5) *
              fStack_771c * fStack_771c + fStack_771c + 1.0) * fStack_777c;
        auVar49._0_4_ =
             local_78a0 +
             (((((local_7720 * (local_7720 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 local_7720 + 0.041665796) * local_7720 + 0.16666666) * local_7720 + 0.5) *
              local_7720 * local_7720 + local_7720 + 1.0) * local_7780;
        auVar49._8_4_ =
             fStack_7898 +
             (((((fStack_7718 * (fStack_7718 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_7718 + 0.041665796) * fStack_7718 + 0.16666666) * fStack_7718 + 0.5) *
              fStack_7718 * fStack_7718 + fStack_7718 + 1.0) * fStack_7778;
        auVar49._12_4_ =
             fStack_7894 +
             (((((fStack_7714 * (fStack_7714 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_7714 + 0.041665796) * fStack_7714 + 0.16666666) * fStack_7714 + 0.5) *
              fStack_7714 * fStack_7714 + fStack_7714 + 1.0) * fStack_7774;
        auVar49._16_4_ =
             fStack_7890 +
             (((((fStack_7710 * (fStack_7710 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_7710 + 0.041665796) * fStack_7710 + 0.16666666) * fStack_7710 + 0.5) *
              fStack_7710 * fStack_7710 + fStack_7710 + 1.0) * fStack_7770;
        auVar49._20_4_ =
             fStack_788c +
             (((((fStack_770c * (fStack_770c * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_770c + 0.041665796) * fStack_770c + 0.16666666) * fStack_770c + 0.5) *
              fStack_770c * fStack_770c + fStack_770c + 1.0) * fStack_776c;
        auVar49._24_4_ =
             fStack_7888 +
             (((((fStack_7708 * (fStack_7708 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_7708 + 0.041665796) * fStack_7708 + 0.16666666) * fStack_7708 + 0.5) *
              fStack_7708 * fStack_7708 + fStack_7708 + 1.0) * fStack_7768;
        auVar49._28_4_ = fStack_7884 + fStack_7704 + fStack_7704 + 1.0;
        auVar3 = vdivps_avx(auVar50,auVar49);
        local_8880 = auVar3._0_4_;
        fStack_887c = auVar3._4_4_;
        fStack_8878 = auVar3._8_4_;
        fStack_8874 = auVar3._12_4_;
        fStack_8870 = auVar3._16_4_;
        fStack_886c = auVar3._20_4_;
        fStack_8868 = auVar3._24_4_;
        auVar36._4_4_ = fStack_887c * fStack_885c;
        auVar36._0_4_ = local_8880 * local_8860;
        auVar36._8_4_ = fStack_8878 * fStack_8858;
        auVar36._12_4_ = fStack_8874 * fStack_8854;
        auVar36._16_4_ = fStack_8870 * fStack_8850;
        auVar36._20_4_ = fStack_886c * fStack_884c;
        auVar36._24_4_ = fStack_8868 * fStack_8848;
        auVar36._28_4_ = auVar3._28_4_;
        auVar35._16_8_ = uStack_2bd0;
        auVar35._0_16_ = auVar5;
        auVar35._24_8_ = uStack_2bc8;
        auVar3 = vsubps_avx(auVar36,auVar35);
        local_8960 = (float)*(undefined8 *)*local_8d58;
        fStack_895c = (float)((ulong)*(undefined8 *)*local_8d58 >> 0x20);
        fStack_8958 = (float)*(undefined8 *)(*local_8d58 + 8);
        fStack_8954 = (float)((ulong)*(undefined8 *)(*local_8d58 + 8) >> 0x20);
        fStack_8950 = (float)*(undefined8 *)(*local_8d58 + 0x10);
        fStack_894c = (float)((ulong)*(undefined8 *)(*local_8d58 + 0x10) >> 0x20);
        fStack_8948 = (float)*(undefined8 *)(*local_8d58 + 0x18);
        uStack_8944 = (undefined4)((ulong)*(undefined8 *)(*local_8d58 + 0x18) >> 0x20);
        local_8980 = auVar3._0_4_;
        fStack_897c = auVar3._4_4_;
        fStack_8978 = auVar3._8_4_;
        fStack_8974 = auVar3._12_4_;
        fStack_8970 = auVar3._16_4_;
        fStack_896c = auVar3._20_4_;
        fStack_8968 = auVar3._24_4_;
        local_8de0 = CONCAT44(fStack_895c * fStack_897c,local_8960 * local_8980);
        uStack_8dd8 = CONCAT44(fStack_8954 * fStack_8974,fStack_8958 * fStack_8978);
        uStack_8dd0 = CONCAT44(fStack_894c * fStack_896c,fStack_8950 * fStack_8970);
        uStack_8dc8 = CONCAT44(uStack_8944,fStack_8948 * fStack_8968);
        auVar30._8_8_ = uStack_8dd8;
        auVar30._0_8_ = local_8de0;
        auVar30._16_8_ = uStack_8dd0;
        auVar30._24_8_ = uStack_8dc8;
        *local_8d58 = auVar30;
        local_8d58 = local_8d58 + 1;
      }
    }
  }
  else if (local_8d4c == 4) {
    for (local_8de4 = 0; local_8de4 < local_8d44; local_8de4 = local_8de4 + 1) {
      local_8df0 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_8de4 * in_RSI[2]);
      for (local_8e3c = 0; local_8e3c < local_8d48; local_8e3c = local_8e3c + 1) {
        auVar174._8_8_ = 0x42b0c0a542b0c0a5;
        auVar174._0_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(*local_8df0,auVar174);
        auVar136._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar5,auVar136);
        local_2540 = auVar1._0_4_;
        fStack_253c = auVar1._4_4_;
        fStack_2538 = auVar1._8_4_;
        fStack_2534 = auVar1._12_4_;
        fVar190 = local_2540 * 1.442695 + 0.5;
        fVar191 = fStack_253c * 1.442695 + 0.5;
        fVar192 = fStack_2538 * 1.442695 + 0.5;
        fVar193 = fStack_2534 * 1.442695 + 0.5;
        local_2600 = CONCAT44(fVar191,fVar190);
        uStack_25f8._0_4_ = fVar192;
        uStack_25f8._4_4_ = fVar193;
        local_2610 = CONCAT44((int)fVar191,(int)fVar190);
        uStack_2608._0_4_ = (int)fVar192;
        uStack_2608._4_4_ = (int)fVar193;
        auVar156._8_8_ = uStack_2608;
        auVar156._0_8_ = local_2610;
        auVar6 = vcvtdq2ps_avx(auVar156);
        auVar178._8_8_ = uStack_25f8;
        auVar178._0_8_ = local_2600;
        auVar5 = vcmpps_avx(auVar178,auVar6,1);
        auVar144._8_8_ = 0x3f8000003f800000;
        auVar144._0_8_ = 0x3f8000003f800000;
        auVar5 = vpand_avx(auVar5,auVar144);
        auVar5 = vsubps_avx(auVar6,auVar5);
        local_300 = auVar5._0_4_;
        fStack_2fc = auVar5._4_4_;
        fStack_2f8 = auVar5._8_4_;
        fStack_2f4 = auVar5._12_4_;
        auVar166._4_4_ = fStack_2fc * 0.6933594;
        auVar166._0_4_ = local_300 * 0.6933594;
        auVar166._8_4_ = fStack_2f8 * 0.6933594;
        auVar166._12_4_ = fStack_2f4 * 0.6933594;
        auVar5 = vsubps_avx(auVar1,auVar166);
        auVar165._4_4_ = fStack_2fc * -0.00021219444;
        auVar165._0_4_ = local_300 * -0.00021219444;
        auVar165._8_4_ = fStack_2f8 * -0.00021219444;
        auVar165._12_4_ = fStack_2f4 * -0.00021219444;
        auVar5 = vsubps_avx(auVar5,auVar165);
        local_2560 = auVar5._0_4_;
        fStack_255c = auVar5._4_4_;
        fStack_2558 = auVar5._8_4_;
        fStack_2554 = auVar5._12_4_;
        local_2610 = CONCAT44((int)fStack_2fc,(int)local_300);
        uStack_2608._0_4_ = (int)fStack_2f8;
        uStack_2608._4_4_ = (int)fStack_2f4;
        auVar113._8_8_ = uStack_2608;
        auVar113._0_8_ = local_2610;
        auVar112._8_8_ = 0x7f0000007f;
        auVar112._0_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx(auVar113,auVar112);
        auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
        local_2590 = auVar5._0_4_;
        fStack_258c = auVar5._4_4_;
        fStack_2588 = auVar5._8_4_;
        fStack_2584 = auVar5._12_4_;
        local_2930 = CONCAT44(((((((fStack_255c * 0.00019875691 + 0.0013981999) * fStack_255c +
                                  0.008333452) * fStack_255c + 0.041665796) * fStack_255c +
                                0.16666666) * fStack_255c + 0.5) * fStack_255c * fStack_255c +
                               fStack_255c + 1.0) * fStack_258c + 1.0,
                              ((((((local_2560 * 0.00019875691 + 0.0013981999) * local_2560 +
                                  0.008333452) * local_2560 + 0.041665796) * local_2560 + 0.16666666
                                ) * local_2560 + 0.5) * local_2560 * local_2560 + local_2560 + 1.0)
                              * local_2590 + 1.0);
        uStack_2928._0_4_ =
             ((((((fStack_2558 * 0.00019875691 + 0.0013981999) * fStack_2558 + 0.008333452) *
                 fStack_2558 + 0.041665796) * fStack_2558 + 0.16666666) * fStack_2558 + 0.5) *
              fStack_2558 * fStack_2558 + fStack_2558 + 1.0) * fStack_2588 + 1.0;
        uStack_2928._4_4_ =
             ((((((fStack_2554 * 0.00019875691 + 0.0013981999) * fStack_2554 + 0.008333452) *
                 fStack_2554 + 0.041665796) * fStack_2554 + 0.16666666) * fStack_2554 + 0.5) *
              fStack_2554 * fStack_2554 + fStack_2554 + 1.0) * fStack_2584 + 1.0;
        uStack_1d18 = SUB168(ZEXT816(0),4);
        auVar132._8_8_ = uStack_2928;
        auVar132._0_8_ = local_2930;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = uStack_1d18;
        auVar5 = vcmpps_avx(auVar132,auVar180 << 0x40,2);
        auVar140._8_8_ = uStack_2928;
        auVar140._0_8_ = local_2930;
        auVar139._8_8_ = 0x80000000800000;
        auVar139._0_8_ = 0x80000000800000;
        auVar6 = vmaxps_avx(auVar140,auVar139);
        auVar1 = vpsrld_avx(auVar6,ZEXT416(0x17));
        auVar148._8_8_ = 0x807fffff807fffff;
        auVar148._0_8_ = 0x807fffff807fffff;
        auVar6 = vpand_avx(auVar6,auVar148);
        auVar152._8_8_ = 0x3f0000003f000000;
        auVar152._0_8_ = 0x3f0000003f000000;
        auVar7 = vpor_avx(auVar6,auVar152);
        auVar110._8_8_ = 0x7f0000007f;
        auVar110._0_8_ = 0x7f0000007f;
        auVar6 = vpsubd_avx(auVar1,auVar110);
        auVar6 = vcvtdq2ps_avx(auVar6);
        local_26a0 = auVar6._0_4_;
        fStack_269c = auVar6._4_4_;
        fStack_2698 = auVar6._8_4_;
        fStack_2694 = auVar6._12_4_;
        local_2970 = CONCAT44(fStack_269c + 1.0,local_26a0 + 1.0);
        uStack_2968._0_4_ = fStack_2698 + 1.0;
        uStack_2968._4_4_ = fStack_2694 + 1.0;
        auVar158._8_8_ = 0x3f3504f33f3504f3;
        auVar158._0_8_ = 0x3f3504f33f3504f3;
        auVar6 = vcmpps_avx(auVar7,auVar158,1);
        auVar1 = vpand_avx(auVar7,auVar6);
        auVar119._8_8_ = 0x3f8000003f800000;
        auVar119._0_8_ = 0x3f8000003f800000;
        auVar7 = vsubps_avx(auVar7,auVar119);
        auVar147._8_8_ = 0x3f8000003f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar6 = vpand_avx(auVar147,auVar6);
        auVar118._8_8_ = uStack_2968;
        auVar118._0_8_ = local_2970;
        auVar6 = vsubps_avx(auVar118,auVar6);
        local_26c0 = auVar7._0_4_;
        fStack_26bc = auVar7._4_4_;
        fStack_26b8 = auVar7._8_4_;
        fStack_26b4 = auVar7._12_4_;
        local_26d0 = auVar1._0_4_;
        fStack_26cc = auVar1._4_4_;
        fStack_26c8 = auVar1._8_4_;
        fStack_26c4 = auVar1._12_4_;
        local_26c0 = local_26c0 + local_26d0;
        fStack_26bc = fStack_26bc + fStack_26cc;
        fStack_26b8 = fStack_26b8 + fStack_26c8;
        fStack_26b4 = fStack_26b4 + fStack_26c4;
        local_a00 = auVar6._0_4_;
        fStack_9fc = auVar6._4_4_;
        fStack_9f8 = auVar6._8_4_;
        fStack_9f4 = auVar6._12_4_;
        local_29b0 = CONCAT44(fStack_9fc * -0.00021219444 +
                              ((((((((fStack_26bc * 0.070376836 + -0.1151461) * fStack_26bc +
                                    0.116769984) * fStack_26bc + -0.12420141) * fStack_26bc +
                                  0.14249323) * fStack_26bc + -0.16668057) * fStack_26bc +
                                0.20000714) * fStack_26bc + -0.24999994) * fStack_26bc + 0.3333333)
                              * fStack_26bc * fStack_26bc * fStack_26bc,
                              local_a00 * -0.00021219444 +
                              ((((((((local_26c0 * 0.070376836 + -0.1151461) * local_26c0 +
                                    0.116769984) * local_26c0 + -0.12420141) * local_26c0 +
                                  0.14249323) * local_26c0 + -0.16668057) * local_26c0 + 0.20000714)
                                * local_26c0 + -0.24999994) * local_26c0 + 0.3333333) * local_26c0 *
                              local_26c0 * local_26c0);
        uStack_29a8._0_4_ =
             fStack_9f8 * -0.00021219444 +
             ((((((((fStack_26b8 * 0.070376836 + -0.1151461) * fStack_26b8 + 0.116769984) *
                   fStack_26b8 + -0.12420141) * fStack_26b8 + 0.14249323) * fStack_26b8 +
                -0.16668057) * fStack_26b8 + 0.20000714) * fStack_26b8 + -0.24999994) * fStack_26b8
             + 0.3333333) * fStack_26b8 * fStack_26b8 * fStack_26b8;
        uStack_29a8._4_4_ =
             fStack_9f4 * -0.00021219444 +
             ((((((((fStack_26b4 * 0.070376836 + -0.1151461) * fStack_26b4 + 0.116769984) *
                   fStack_26b4 + -0.12420141) * fStack_26b4 + 0.14249323) * fStack_26b4 +
                -0.16668057) * fStack_26b4 + 0.20000714) * fStack_26b4 + -0.24999994) * fStack_26b4
             + 0.3333333) * fStack_26b4 * fStack_26b4 * fStack_26b4;
        auVar170._8_8_ = uStack_29a8;
        auVar170._0_8_ = local_29b0;
        auVar169._4_4_ = fStack_26bc * fStack_26bc * 0.5;
        auVar169._0_4_ = local_26c0 * local_26c0 * 0.5;
        auVar169._8_4_ = fStack_26b8 * fStack_26b8 * 0.5;
        auVar169._12_4_ = fStack_26b4 * fStack_26b4 * 0.5;
        auVar6 = vsubps_avx(auVar170,auVar169);
        local_26f0 = auVar6._0_4_;
        fStack_26ec = auVar6._4_4_;
        fStack_26e8 = auVar6._8_4_;
        fStack_26e4 = auVar6._12_4_;
        local_2930 = CONCAT44(fStack_9fc * 0.6933594 + fStack_26bc + fStack_26ec,
                              local_a00 * 0.6933594 + local_26c0 + local_26f0);
        uStack_2928._0_4_ = fStack_9f8 * 0.6933594 + fStack_26b8 + fStack_26e8;
        uStack_2928._4_4_ = fStack_9f4 * 0.6933594 + fStack_26b4 + fStack_26e4;
        auVar151._8_8_ = uStack_2928;
        auVar151._0_8_ = local_2930;
        auVar5 = vpor_avx(auVar151,auVar5);
        local_2a30 = auVar5._0_4_;
        fStack_2a2c = auVar5._4_4_;
        fStack_2a28 = auVar5._8_4_;
        fStack_2a24 = auVar5._12_4_;
        auVar125._8_8_ = 0x3f8000003f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        auVar128._4_4_ = fStack_2a2c * 2.0;
        auVar128._0_4_ = local_2a30 * 2.0;
        auVar128._12_4_ = fStack_2a24 * 2.0;
        auVar128._8_4_ = fStack_2a28 * 2.0;
        auVar181._8_8_ = 0;
        auVar181._0_8_ = uStack_1d18;
        auVar5 = vsubps_avx(auVar181 << 0x40,auVar128);
        auVar171._8_8_ = 0x42b0c0a542b0c0a5;
        auVar171._0_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar171);
        auVar133._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar133._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar5,auVar133);
        local_1e80 = auVar1._0_4_;
        fStack_1e7c = auVar1._4_4_;
        fStack_1e78 = auVar1._8_4_;
        fStack_1e74 = auVar1._12_4_;
        fVar190 = local_1e80 * 1.442695 + 0.5;
        fVar191 = fStack_1e7c * 1.442695 + 0.5;
        fVar192 = fStack_1e78 * 1.442695 + 0.5;
        fVar193 = fStack_1e74 * 1.442695 + 0.5;
        local_1f40 = CONCAT44(fVar191,fVar190);
        uStack_1f38._0_4_ = fVar192;
        uStack_1f38._4_4_ = fVar193;
        local_1f50 = CONCAT44((int)fVar191,(int)fVar190);
        uStack_1f48._0_4_ = (int)fVar192;
        uStack_1f48._4_4_ = (int)fVar193;
        auVar153._8_8_ = uStack_1f48;
        auVar153._0_8_ = local_1f50;
        auVar6 = vcvtdq2ps_avx(auVar153);
        auVar175._8_8_ = uStack_1f38;
        auVar175._0_8_ = local_1f40;
        auVar5 = vcmpps_avx(auVar175,auVar6,1);
        auVar141._8_8_ = 0x3f8000003f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar5 = vpand_avx(auVar5,auVar141);
        auVar5 = vsubps_avx(auVar6,auVar5);
        local_5a0 = auVar5._0_4_;
        fStack_59c = auVar5._4_4_;
        fStack_598 = auVar5._8_4_;
        fStack_594 = auVar5._12_4_;
        auVar160._4_4_ = fStack_59c * 0.6933594;
        auVar160._0_4_ = local_5a0 * 0.6933594;
        auVar160._8_4_ = fStack_598 * 0.6933594;
        auVar160._12_4_ = fStack_594 * 0.6933594;
        auVar5 = vsubps_avx(auVar1,auVar160);
        auVar159._4_4_ = fStack_59c * -0.00021219444;
        auVar159._0_4_ = local_5a0 * -0.00021219444;
        auVar159._8_4_ = fStack_598 * -0.00021219444;
        auVar159._12_4_ = fStack_594 * -0.00021219444;
        auVar5 = vsubps_avx(auVar5,auVar159);
        local_1ea0 = auVar5._0_4_;
        fStack_1e9c = auVar5._4_4_;
        fStack_1e98 = auVar5._8_4_;
        fStack_1e94 = auVar5._12_4_;
        local_1f50 = CONCAT44((int)fStack_59c,(int)local_5a0);
        uStack_1f48._0_4_ = (int)fStack_598;
        uStack_1f48._4_4_ = (int)fStack_594;
        auVar127._8_8_ = uStack_1f48;
        auVar127._0_8_ = local_1f50;
        auVar126._8_8_ = 0x7f0000007f;
        auVar126._0_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx(auVar127,auVar126);
        auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
        local_1ed0 = auVar5._0_4_;
        fStack_1ecc = auVar5._4_4_;
        fStack_1ec8 = auVar5._8_4_;
        fStack_1ec4 = auVar5._12_4_;
        auVar129._4_4_ =
             (((((fStack_1e9c * (fStack_1e9c * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_1e9c + 0.041665796) * fStack_1e9c + 0.16666666) * fStack_1e9c + 0.5) *
              fStack_1e9c * fStack_1e9c + fStack_1e9c + 1.0) * fStack_1ecc + 1.0;
        auVar129._0_4_ =
             (((((local_1ea0 * (local_1ea0 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 local_1ea0 + 0.041665796) * local_1ea0 + 0.16666666) * local_1ea0 + 0.5) *
              local_1ea0 * local_1ea0 + local_1ea0 + 1.0) * local_1ed0 + 1.0;
        auVar129._8_4_ =
             (((((fStack_1e98 * (fStack_1e98 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_1e98 + 0.041665796) * fStack_1e98 + 0.16666666) * fStack_1e98 + 0.5) *
              fStack_1e98 * fStack_1e98 + fStack_1e98 + 1.0) * fStack_1ec8 + 1.0;
        auVar129._12_4_ =
             (((((fStack_1e94 * (fStack_1e94 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                 fStack_1e94 + 0.041665796) * fStack_1e94 + 0.16666666) * fStack_1e94 + 0.5) *
              fStack_1e94 * fStack_1e94 + fStack_1e94 + 1.0) * fStack_1ec4 + 1.0;
        auVar5 = vdivps_avx(auVar125,auVar129);
        local_2a50 = auVar5._0_4_;
        fStack_2a4c = auVar5._4_4_;
        fStack_2a48 = auVar5._8_4_;
        fStack_2a44 = auVar5._12_4_;
        auVar194._0_4_ = local_2a50 * 2.0;
        auVar194._4_4_ = fStack_2a4c * 2.0;
        auVar194._8_4_ = fStack_2a48 * 2.0;
        auVar194._12_4_ = fStack_2a44 * 2.0;
        auVar121._8_8_ = 0x3f8000003f800000;
        auVar121._0_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar194,auVar121);
        local_2ac0 = (float)*(undefined8 *)*local_8df0;
        fStack_2abc = (float)((ulong)*(undefined8 *)*local_8df0 >> 0x20);
        fStack_2ab8 = (float)*(undefined8 *)(*local_8df0 + 8);
        fStack_2ab4 = (float)((ulong)*(undefined8 *)(*local_8df0 + 8) >> 0x20);
        local_2ad0 = auVar5._0_4_;
        fStack_2acc = auVar5._4_4_;
        fStack_2ac8 = auVar5._8_4_;
        fStack_2ac4 = auVar5._12_4_;
        local_8e50 = CONCAT44(fStack_2abc * fStack_2acc,local_2ac0 * local_2ad0);
        uStack_8e48 = CONCAT44(fStack_2ab4 * fStack_2ac4,fStack_2ab8 * fStack_2ac8);
        auVar32._8_8_ = uStack_8e48;
        auVar32._0_8_ = local_8e50;
        *local_8df0 = auVar32;
        local_8df0 = local_8df0 + 1;
      }
    }
  }
  else {
    local_8d30 = in_RSI;
    for (local_8e54 = 0; local_8e54 < local_8d44; local_8e54 = local_8e54 + 1) {
      local_8d08 = &local_8ea8;
      local_8a94 = *(int *)((long)local_8d30 + 0x2c);
      local_8a98 = (int)local_8d30[6];
      local_8a9c = *(undefined4 *)((long)local_8d30 + 0x34);
      local_8aa8 = (undefined1 (*) [32])
                   (*local_8d30 + local_8d30[8] * (long)local_8e54 * local_8d30[2]);
      local_8ab0 = local_8d30[2];
      local_8ab4 = (undefined4)local_8d30[3];
      local_8ac0 = local_8d30[4];
      local_8a90 = &local_8ea8;
      local_8a80 = (long)local_8a94 * (long)local_8a98 * local_8ab0;
      local_8cd0 = &local_8ea8;
      local_8c80 = &local_8ea8;
      local_8a84 = 0x10;
      local_8d14 = local_8e54;
      local_8d15 = 1;
      local_8ea8 = 0;
      local_8e98 = 0;
      local_8e90 = 0;
      local_8e80 = 0;
      local_8e7c = 0;
      local_8e78 = 0;
      local_8e74 = 0;
      local_8e70 = 0;
      local_8e68 = 0;
      local_8ea0 = 0;
      local_8e60 = local_8aa8;
      for (local_8eac = 0; local_8eac + 7 < local_8d48; local_8eac = local_8eac + 8) {
        local_8c70 = local_8e60;
        local_8c60 = *(undefined8 *)*local_8e60;
        uStack_8c58 = *(undefined8 *)(*local_8e60 + 8);
        uStack_8c50 = *(undefined8 *)(*local_8e60 + 0x10);
        auVar179 = *(undefined1 (*) [24])*local_8e60;
        auVar38 = *(undefined1 (*) [24])*local_8e60;
        uStack_8c48 = *(undefined8 *)(*local_8e60 + 0x18);
        auVar30 = *local_8e60;
        local_7520 = ZEXT832(0) << 0x20;
        local_84a0 = 0x3f8000003f800000;
        uStack_8498 = 0x3f8000003f800000;
        uStack_8490 = 0x3f8000003f800000;
        uStack_8488 = 0x3f8000003f800000;
        local_7ee0._0_8_ = auVar38._0_8_;
        local_3740 = local_7ee0._0_8_;
        local_7ee0._8_8_ = auVar38._8_8_;
        uStack_3738 = local_7ee0._8_8_;
        local_7ee0._16_8_ = auVar38._16_8_;
        uStack_3730 = local_7ee0._16_8_;
        local_37a0 = 0x42b0c0a542b0c0a5;
        uStack_3798 = 0x42b0c0a542b0c0a5;
        uStack_3790 = 0x42b0c0a542b0c0a5;
        uStack_3788 = 0x42b0c0a542b0c0a5;
        auVar92._8_8_ = 0x42b0c0a542b0c0a5;
        auVar92._0_8_ = 0x42b0c0a542b0c0a5;
        auVar92._16_8_ = 0x42b0c0a542b0c0a5;
        auVar92._24_8_ = 0x42b0c0a542b0c0a5;
        auVar3 = vminps_avx(*local_8e60,auVar92);
        local_7ee0._0_8_ = auVar3._0_8_;
        local_7400 = local_7ee0._0_8_;
        local_7ee0._8_8_ = auVar3._8_8_;
        uStack_73f8 = local_7ee0._8_8_;
        local_7ee0._16_8_ = auVar3._16_8_;
        uStack_73f0 = local_7ee0._16_8_;
        local_7ee0._24_8_ = auVar3._24_8_;
        uStack_73e8 = local_7ee0._24_8_;
        local_7460 = 0xc2b0c0a5c2b0c0a5;
        uStack_7458 = 0xc2b0c0a5c2b0c0a5;
        uStack_7450 = 0xc2b0c0a5c2b0c0a5;
        uStack_7448 = 0xc2b0c0a5c2b0c0a5;
        auVar54._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar54._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar54._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar2 = vmaxps_avx(auVar3,auVar54);
        local_7ee0._0_8_ = auVar2._0_8_;
        local_59e0 = local_7ee0._0_8_;
        local_7ee0._8_8_ = auVar2._8_8_;
        uStack_59d8 = local_7ee0._8_8_;
        local_7ee0._16_8_ = auVar2._16_8_;
        uStack_59d0 = local_7ee0._16_8_;
        local_7ee0._24_8_ = auVar2._24_8_;
        uStack_59c8 = local_7ee0._24_8_;
        local_6020 = 0x3fb8aa3b3fb8aa3b;
        uStack_6018 = 0x3fb8aa3b3fb8aa3b;
        uStack_6010 = 0x3fb8aa3b3fb8aa3b;
        uStack_6008 = 0x3fb8aa3b3fb8aa3b;
        local_6ea0 = 0x3f0000003f000000;
        uStack_6e98 = 0x3f0000003f000000;
        uStack_6e90 = 0x3f0000003f000000;
        uStack_6e88 = 0x3f0000003f000000;
        uVar10 = local_7ee0._0_8_;
        uVar11 = local_7ee0._8_8_;
        uVar12 = local_7ee0._16_8_;
        uVar13 = local_7ee0._24_8_;
        local_59c0 = 0x3fb8aa3b3fb8aa3b;
        uStack_59b8 = 0x3fb8aa3b3fb8aa3b;
        uStack_59b0 = 0x3fb8aa3b3fb8aa3b;
        uStack_59a8 = 0x3fb8aa3b3fb8aa3b;
        local_59a0._0_4_ = auVar2._0_4_;
        local_59a0._4_4_ = auVar2._4_4_;
        uStack_5998._0_4_ = auVar2._8_4_;
        uStack_5998._4_4_ = auVar2._12_4_;
        uStack_5990._0_4_ = auVar2._16_4_;
        uStack_5990._4_4_ = auVar2._20_4_;
        uStack_5988._0_4_ = auVar2._24_4_;
        uStack_5944 = 0x3fb8aa3b;
        local_5960 = (float)local_59a0 * 1.442695;
        fStack_595c = local_59a0._4_4_ * 1.442695;
        fStack_5958 = (float)uStack_5998 * 1.442695;
        fStack_5954 = uStack_5998._4_4_ * 1.442695;
        fStack_5950 = (float)uStack_5990 * 1.442695;
        fStack_594c = uStack_5990._4_4_ * 1.442695;
        fStack_5948 = (float)uStack_5988 * 1.442695;
        local_5980 = 0x3f0000003f000000;
        uStack_5978 = 0x3f0000003f000000;
        uStack_5970 = 0x3f0000003f000000;
        uStack_5968 = 0x3f0000003f000000;
        local_7f20._4_4_ = fStack_595c + 0.5;
        local_7f20._0_4_ = local_5960 + 0.5;
        uStack_7f18._0_4_ = fStack_5958 + 0.5;
        uStack_7f18._4_4_ = fStack_5954 + 0.5;
        uStack_7f10._0_4_ = fStack_5950 + 0.5;
        uStack_7f10._4_4_ = fStack_594c + 0.5;
        uStack_7f08._0_4_ = fStack_5948 + 0.5;
        uStack_7f08._4_4_ = 0x3ff8aa3b;
        auVar9 = vroundps_avx(_local_7f20,1);
        auVar3 = vcmpps_avx(_local_7f20,auVar9,1);
        local_7f80._0_8_ = auVar3._0_8_;
        local_70c0 = local_7f80._0_8_;
        local_7f80._8_8_ = auVar3._8_8_;
        uStack_70b8 = local_7f80._8_8_;
        local_7f80._16_8_ = auVar3._16_8_;
        uStack_70b0 = local_7f80._16_8_;
        local_7f80._24_8_ = auVar3._24_8_;
        uStack_70a8 = local_7f80._24_8_;
        local_70e0 = 0x3f8000003f800000;
        uStack_70d8 = 0x3f8000003f800000;
        uStack_70d0 = 0x3f8000003f800000;
        uStack_70c8 = 0x3f8000003f800000;
        auVar62._8_8_ = 0x3f8000003f800000;
        auVar62._0_8_ = 0x3f8000003f800000;
        auVar62._16_8_ = 0x3f8000003f800000;
        auVar62._24_8_ = 0x3f8000003f800000;
        local_7f80 = vandps_avx(auVar3,auVar62);
        local_7f00 = auVar9._0_8_;
        local_7dc0 = local_7f00;
        uStack_7ef8 = auVar9._8_8_;
        uStack_7db8 = uStack_7ef8;
        uStack_7ef0 = auVar9._16_8_;
        uStack_7db0 = uStack_7ef0;
        uStack_7ee8 = auVar9._24_8_;
        uStack_7da8 = uStack_7ee8;
        local_7de0 = local_7f80._0_8_;
        uStack_7dd8 = local_7f80._8_8_;
        uStack_7dd0 = local_7f80._16_8_;
        uStack_7dc8 = local_7f80._24_8_;
        _local_7f20 = vsubps_avx(auVar9,local_7f80);
        local_3d00 = local_7f20;
        uStack_3cf8 = uStack_7f18;
        uStack_3cf0 = uStack_7f10;
        uStack_3ce8 = uStack_7f08;
        local_3d40 = local_7ee0._0_8_;
        uStack_3d38 = local_7ee0._8_8_;
        uStack_3d30 = local_7ee0._16_8_;
        uStack_3d28 = local_7ee0._24_8_;
        local_5300 = 0x3f3180003f318000;
        uStack_52f8 = 0x3f3180003f318000;
        uStack_52f0 = 0x3f3180003f318000;
        uStack_52e8 = 0x3f3180003f318000;
        local_3c80 = local_7ee0._0_8_;
        uStack_3c78 = local_7ee0._8_8_;
        uStack_3c70 = local_7ee0._16_8_;
        uStack_3c68 = local_7ee0._24_8_;
        local_3ce0 = 0x3f3180003f318000;
        uStack_3cd8 = 0x3f3180003f318000;
        uStack_3cd0 = 0x3f3180003f318000;
        uStack_3cc8 = 0x3f3180003f318000;
        local_3cc0._0_4_ = local_7f20._0_4_;
        local_3cc0._4_4_ = local_7f20._4_4_;
        uStack_3cb8._0_4_ = local_7f20._8_4_;
        uStack_3cb8._4_4_ = local_7f20._12_4_;
        uStack_3cb0._0_4_ = local_7f20._16_4_;
        uStack_3cb0._4_4_ = local_7f20._20_4_;
        uStack_3ca8._0_4_ = local_7f20._24_4_;
        uStack_3ca8._4_4_ = local_7f20._28_4_;
        fStack_3c84 = uStack_3ca8._4_4_;
        local_3ca0 = (float)local_3cc0 * 0.6933594;
        fStack_3c9c = local_3cc0._4_4_ * 0.6933594;
        fStack_3c98 = (float)uStack_3cb8 * 0.6933594;
        fStack_3c94 = uStack_3cb8._4_4_ * 0.6933594;
        fStack_3c90 = (float)uStack_3cb0 * 0.6933594;
        fStack_3c8c = uStack_3cb0._4_4_ * 0.6933594;
        fStack_3c88 = (float)uStack_3ca8 * 0.6933594;
        auVar79._4_4_ = fStack_3c9c;
        auVar79._0_4_ = local_3ca0;
        auVar79._8_4_ = fStack_3c98;
        auVar79._12_4_ = fStack_3c94;
        auVar79._16_4_ = fStack_3c90;
        auVar79._20_4_ = fStack_3c8c;
        auVar79._24_4_ = fStack_3c88;
        auVar79._28_4_ = uStack_3ca8._4_4_;
        auVar3 = vsubps_avx(auVar2,auVar79);
        local_3de0 = local_7f20;
        uStack_3dd8 = uStack_7f18;
        uStack_3dd0 = uStack_7f10;
        uStack_3dc8 = uStack_7f08;
        local_7ee0._0_8_ = auVar3._0_8_;
        local_3e20 = local_7ee0._0_8_;
        local_7ee0._8_8_ = auVar3._8_8_;
        uStack_3e18 = local_7ee0._8_8_;
        local_7ee0._16_8_ = auVar3._16_8_;
        uStack_3e10 = local_7ee0._16_8_;
        local_7ee0._24_8_ = auVar3._24_8_;
        uStack_3e08 = local_7ee0._24_8_;
        local_5220 = 0xb95e8083b95e8083;
        uStack_5218 = 0xb95e8083b95e8083;
        uStack_5210 = 0xb95e8083b95e8083;
        uStack_5208 = 0xb95e8083b95e8083;
        local_3d60 = local_7ee0._0_8_;
        uStack_3d58 = local_7ee0._8_8_;
        uStack_3d50 = local_7ee0._16_8_;
        uStack_3d48 = local_7ee0._24_8_;
        local_3da0 = local_7f20;
        uStack_3d98 = uStack_7f18;
        uStack_3d90 = uStack_7f10;
        uStack_3d88 = uStack_7f08;
        local_3dc0 = 0xb95e8083b95e8083;
        uStack_3db8 = 0xb95e8083b95e8083;
        uStack_3db0 = 0xb95e8083b95e8083;
        uStack_3da8 = 0xb95e8083b95e8083;
        fStack_3d64 = uStack_3ca8._4_4_;
        local_3d80 = (float)local_3cc0 * -0.00021219444;
        fStack_3d7c = local_3cc0._4_4_ * -0.00021219444;
        fStack_3d78 = (float)uStack_3cb8 * -0.00021219444;
        fStack_3d74 = uStack_3cb8._4_4_ * -0.00021219444;
        fStack_3d70 = (float)uStack_3cb0 * -0.00021219444;
        fStack_3d6c = uStack_3cb0._4_4_ * -0.00021219444;
        fStack_3d68 = (float)uStack_3ca8 * -0.00021219444;
        auVar78._4_4_ = fStack_3d7c;
        auVar78._0_4_ = local_3d80;
        auVar78._8_4_ = fStack_3d78;
        auVar78._12_4_ = fStack_3d74;
        auVar78._16_4_ = fStack_3d70;
        auVar78._20_4_ = fStack_3d6c;
        auVar78._24_4_ = fStack_3d68;
        auVar78._28_4_ = uStack_3ca8._4_4_;
        local_7ee0 = vsubps_avx(auVar3,auVar78);
        local_7e80 = local_7ee0._0_8_;
        uStack_7e78 = local_7ee0._8_8_;
        uStack_7e70 = local_7ee0._16_8_;
        uStack_7e68 = local_7ee0._24_8_;
        local_7e60._0_4_ = local_7ee0._0_4_;
        local_7e60._4_4_ = local_7ee0._4_4_;
        uStack_7e58._0_4_ = local_7ee0._8_4_;
        uStack_7e58._4_4_ = local_7ee0._12_4_;
        uStack_7e50._0_4_ = local_7ee0._16_4_;
        uStack_7e50._4_4_ = local_7ee0._20_4_;
        uStack_7e48._0_4_ = local_7ee0._24_4_;
        uStack_7e48._4_4_ = local_7ee0._28_4_;
        local_7f00 = CONCAT44(local_7e60._4_4_ * local_7e60._4_4_,
                              (float)local_7e60 * (float)local_7e60);
        uStack_7ef8._0_4_ = (float)uStack_7e58 * (float)uStack_7e58;
        uStack_7ef8._4_4_ = uStack_7e58._4_4_ * uStack_7e58._4_4_;
        uStack_7ef0._0_4_ = (float)uStack_7e50 * (float)uStack_7e50;
        uStack_7ef0._4_4_ = uStack_7e50._4_4_ * uStack_7e50._4_4_;
        auVar38 = _local_7f00;
        uStack_7ee8._0_4_ = (float)uStack_7e48 * (float)uStack_7e48;
        uStack_7ee8._4_4_ = uStack_7e48._4_4_;
        auVar62 = _local_7f00;
        local_5ac0 = 0x3950696739506967;
        uStack_5ab8 = 0x3950696739506967;
        uStack_5ab0 = 0x3950696739506967;
        uStack_5aa8 = 0x3950696739506967;
        local_5ae0 = local_7ee0._0_8_;
        uStack_5ad8 = local_7ee0._8_8_;
        uStack_5ad0 = local_7ee0._16_8_;
        uStack_5ac8 = local_7ee0._24_8_;
        local_6120 = 0x3ab743ce3ab743ce;
        uStack_6118 = 0x3ab743ce3ab743ce;
        uStack_6110 = 0x3ab743ce3ab743ce;
        uStack_6108 = 0x3ab743ce3ab743ce;
        local_5a80 = 0x3950696739506967;
        uStack_5a78 = 0x3950696739506967;
        uStack_5a70 = 0x3950696739506967;
        uStack_5a68 = 0x3950696739506967;
        local_5aa0 = local_7ee0._0_8_;
        uStack_5a98 = local_7ee0._8_8_;
        uStack_5a90 = local_7ee0._16_8_;
        uStack_5a88 = local_7ee0._24_8_;
        fStack_5a24 = uStack_7e48._4_4_;
        local_5a40 = (float)local_7e60 * 0.00019875691;
        fStack_5a3c = local_7e60._4_4_ * 0.00019875691;
        fStack_5a38 = (float)uStack_7e58 * 0.00019875691;
        fStack_5a34 = uStack_7e58._4_4_ * 0.00019875691;
        fStack_5a30 = (float)uStack_7e50 * 0.00019875691;
        fStack_5a2c = uStack_7e50._4_4_ * 0.00019875691;
        fStack_5a28 = (float)uStack_7e48 * 0.00019875691;
        local_5a60 = 0x3ab743ce3ab743ce;
        uStack_5a58 = 0x3ab743ce3ab743ce;
        uStack_5a50 = 0x3ab743ce3ab743ce;
        uStack_5a48 = 0x3ab743ce3ab743ce;
        local_7fa0 = CONCAT44(fStack_5a3c + 0.0013981999,local_5a40 + 0.0013981999);
        uStack_7f98 = CONCAT44(fStack_5a34 + 0.0013981999,fStack_5a38 + 0.0013981999);
        uStack_7f90 = CONCAT44(fStack_5a2c + 0.0013981999,fStack_5a30 + 0.0013981999);
        uStack_7f88 = CONCAT44(uStack_7e48._4_4_ + 0.0013981999,fStack_5a28 + 0.0013981999);
        local_5ba0 = local_7fa0;
        uStack_5b98 = uStack_7f98;
        uStack_5b90 = uStack_7f90;
        uStack_5b88 = uStack_7f88;
        local_5bc0 = local_7ee0._0_8_;
        uStack_5bb8 = local_7ee0._8_8_;
        uStack_5bb0 = local_7ee0._16_8_;
        uStack_5ba8 = local_7ee0._24_8_;
        local_6200 = 0x3c0889083c088908;
        uStack_61f8 = 0x3c0889083c088908;
        uStack_61f0 = 0x3c0889083c088908;
        uStack_61e8 = 0x3c0889083c088908;
        local_5b60 = local_7fa0;
        uStack_5b58 = uStack_7f98;
        uStack_5b50 = uStack_7f90;
        uStack_5b48 = uStack_7f88;
        local_5b80 = local_7ee0._0_8_;
        uStack_5b78 = local_7ee0._8_8_;
        uStack_5b70 = local_7ee0._16_8_;
        uStack_5b68 = local_7ee0._24_8_;
        fStack_5b04 = uStack_7e48._4_4_;
        local_5b20 = (local_5a40 + 0.0013981999) * (float)local_7e60;
        fStack_5b1c = (fStack_5a3c + 0.0013981999) * local_7e60._4_4_;
        fStack_5b18 = (fStack_5a38 + 0.0013981999) * (float)uStack_7e58;
        fStack_5b14 = (fStack_5a34 + 0.0013981999) * uStack_7e58._4_4_;
        fStack_5b10 = (fStack_5a30 + 0.0013981999) * (float)uStack_7e50;
        fStack_5b0c = (fStack_5a2c + 0.0013981999) * uStack_7e50._4_4_;
        fStack_5b08 = (fStack_5a28 + 0.0013981999) * (float)uStack_7e48;
        local_5b40 = 0x3c0889083c088908;
        uStack_5b38 = 0x3c0889083c088908;
        uStack_5b30 = 0x3c0889083c088908;
        uStack_5b28 = 0x3c0889083c088908;
        local_7fa0 = CONCAT44(fStack_5b1c + 0.008333452,local_5b20 + 0.008333452);
        uStack_7f98 = CONCAT44(fStack_5b14 + 0.008333452,fStack_5b18 + 0.008333452);
        uStack_7f90 = CONCAT44(fStack_5b0c + 0.008333452,fStack_5b10 + 0.008333452);
        uStack_7f88 = CONCAT44(uStack_7e48._4_4_ + 0.008333452,fStack_5b08 + 0.008333452);
        local_5c80 = local_7fa0;
        uStack_5c78 = uStack_7f98;
        uStack_5c70 = uStack_7f90;
        uStack_5c68 = uStack_7f88;
        local_5ca0 = local_7ee0._0_8_;
        uStack_5c98 = local_7ee0._8_8_;
        uStack_5c90 = local_7ee0._16_8_;
        uStack_5c88 = local_7ee0._24_8_;
        local_62e0 = 0x3d2aa9c13d2aa9c1;
        uStack_62d8 = 0x3d2aa9c13d2aa9c1;
        uStack_62d0 = 0x3d2aa9c13d2aa9c1;
        uStack_62c8 = 0x3d2aa9c13d2aa9c1;
        local_5c40 = local_7fa0;
        uStack_5c38 = uStack_7f98;
        uStack_5c30 = uStack_7f90;
        uStack_5c28 = uStack_7f88;
        local_5c60 = local_7ee0._0_8_;
        uStack_5c58 = local_7ee0._8_8_;
        uStack_5c50 = local_7ee0._16_8_;
        uStack_5c48 = local_7ee0._24_8_;
        fStack_5be4 = uStack_7e48._4_4_;
        local_5c00 = (local_5b20 + 0.008333452) * (float)local_7e60;
        fStack_5bfc = (fStack_5b1c + 0.008333452) * local_7e60._4_4_;
        fStack_5bf8 = (fStack_5b18 + 0.008333452) * (float)uStack_7e58;
        fStack_5bf4 = (fStack_5b14 + 0.008333452) * uStack_7e58._4_4_;
        fStack_5bf0 = (fStack_5b10 + 0.008333452) * (float)uStack_7e50;
        fStack_5bec = (fStack_5b0c + 0.008333452) * uStack_7e50._4_4_;
        fStack_5be8 = (fStack_5b08 + 0.008333452) * (float)uStack_7e48;
        local_5c20 = 0x3d2aa9c13d2aa9c1;
        uStack_5c18 = 0x3d2aa9c13d2aa9c1;
        uStack_5c10 = 0x3d2aa9c13d2aa9c1;
        uStack_5c08 = 0x3d2aa9c13d2aa9c1;
        local_7fa0 = CONCAT44(fStack_5bfc + 0.041665796,local_5c00 + 0.041665796);
        uStack_7f98 = CONCAT44(fStack_5bf4 + 0.041665796,fStack_5bf8 + 0.041665796);
        uStack_7f90 = CONCAT44(fStack_5bec + 0.041665796,fStack_5bf0 + 0.041665796);
        uStack_7f88 = CONCAT44(uStack_7e48._4_4_ + 0.041665796,fStack_5be8 + 0.041665796);
        local_5d60 = local_7fa0;
        uStack_5d58 = uStack_7f98;
        uStack_5d50 = uStack_7f90;
        uStack_5d48 = uStack_7f88;
        local_5d80 = local_7ee0._0_8_;
        uStack_5d78 = local_7ee0._8_8_;
        uStack_5d70 = local_7ee0._16_8_;
        uStack_5d68 = local_7ee0._24_8_;
        local_63c0 = 0x3e2aaaaa3e2aaaaa;
        uStack_63b8 = 0x3e2aaaaa3e2aaaaa;
        uStack_63b0 = 0x3e2aaaaa3e2aaaaa;
        uStack_63a8 = 0x3e2aaaaa3e2aaaaa;
        local_5d20 = local_7fa0;
        uStack_5d18 = uStack_7f98;
        uStack_5d10 = uStack_7f90;
        uStack_5d08 = uStack_7f88;
        local_5d40 = local_7ee0._0_8_;
        uStack_5d38 = local_7ee0._8_8_;
        uStack_5d30 = local_7ee0._16_8_;
        uStack_5d28 = local_7ee0._24_8_;
        fStack_5cc4 = uStack_7e48._4_4_;
        local_5ce0 = (local_5c00 + 0.041665796) * (float)local_7e60;
        fStack_5cdc = (fStack_5bfc + 0.041665796) * local_7e60._4_4_;
        fStack_5cd8 = (fStack_5bf8 + 0.041665796) * (float)uStack_7e58;
        fStack_5cd4 = (fStack_5bf4 + 0.041665796) * uStack_7e58._4_4_;
        fStack_5cd0 = (fStack_5bf0 + 0.041665796) * (float)uStack_7e50;
        fStack_5ccc = (fStack_5bec + 0.041665796) * uStack_7e50._4_4_;
        fStack_5cc8 = (fStack_5be8 + 0.041665796) * (float)uStack_7e48;
        local_5d00 = 0x3e2aaaaa3e2aaaaa;
        uStack_5cf8 = 0x3e2aaaaa3e2aaaaa;
        uStack_5cf0 = 0x3e2aaaaa3e2aaaaa;
        uStack_5ce8 = 0x3e2aaaaa3e2aaaaa;
        local_7fa0 = CONCAT44(fStack_5cdc + 0.16666666,local_5ce0 + 0.16666666);
        uStack_7f98 = CONCAT44(fStack_5cd4 + 0.16666666,fStack_5cd8 + 0.16666666);
        uStack_7f90 = CONCAT44(fStack_5ccc + 0.16666666,fStack_5cd0 + 0.16666666);
        uStack_7f88 = CONCAT44(uStack_7e48._4_4_ + 0.16666666,fStack_5cc8 + 0.16666666);
        local_5e40 = local_7fa0;
        uStack_5e38 = uStack_7f98;
        uStack_5e30 = uStack_7f90;
        uStack_5e28 = uStack_7f88;
        local_5e60 = local_7ee0._0_8_;
        uStack_5e58 = local_7ee0._8_8_;
        uStack_5e50 = local_7ee0._16_8_;
        uStack_5e48 = local_7ee0._24_8_;
        local_5e00 = local_7fa0;
        uStack_5df8 = uStack_7f98;
        uStack_5df0 = uStack_7f90;
        uStack_5de8 = uStack_7f88;
        local_5e20 = local_7ee0._0_8_;
        uStack_5e18 = local_7ee0._8_8_;
        uStack_5e10 = local_7ee0._16_8_;
        uStack_5e08 = local_7ee0._24_8_;
        fStack_5da4 = uStack_7e48._4_4_;
        local_5dc0 = (local_5ce0 + 0.16666666) * (float)local_7e60;
        fStack_5dbc = (fStack_5cdc + 0.16666666) * local_7e60._4_4_;
        fStack_5db8 = (fStack_5cd8 + 0.16666666) * (float)uStack_7e58;
        fStack_5db4 = (fStack_5cd4 + 0.16666666) * uStack_7e58._4_4_;
        fStack_5db0 = (fStack_5cd0 + 0.16666666) * (float)uStack_7e50;
        fStack_5dac = (fStack_5ccc + 0.16666666) * uStack_7e50._4_4_;
        fStack_5da8 = (fStack_5cc8 + 0.16666666) * (float)uStack_7e48;
        local_5de0 = 0x3f0000003f000000;
        uStack_5dd8 = 0x3f0000003f000000;
        uStack_5dd0 = 0x3f0000003f000000;
        uStack_5dc8 = 0x3f0000003f000000;
        local_7fa0 = CONCAT44(fStack_5dbc + 0.5,local_5dc0 + 0.5);
        uStack_7f98 = CONCAT44(fStack_5db4 + 0.5,fStack_5db8 + 0.5);
        uStack_7f90 = CONCAT44(fStack_5dac + 0.5,fStack_5db0 + 0.5);
        uStack_7f88 = CONCAT44(uStack_7e48._4_4_ + 0.5,fStack_5da8 + 0.5);
        local_5f20 = local_7fa0;
        uStack_5f18 = uStack_7f98;
        uStack_5f10 = uStack_7f90;
        uStack_5f08 = uStack_7f88;
        local_5f40 = local_7f00;
        uStack_5f38 = uStack_7ef8;
        uStack_7ef0 = auVar38._16_8_;
        uStack_5f30 = uStack_7ef0;
        uStack_7ee8 = auVar62._24_8_;
        uStack_5f28 = uStack_7ee8;
        local_5f60 = local_7ee0._0_8_;
        uStack_5f58 = local_7ee0._8_8_;
        uStack_5f50 = local_7ee0._16_8_;
        uStack_5f48 = local_7ee0._24_8_;
        local_5ee0 = local_7fa0;
        uStack_5ed8 = uStack_7f98;
        uStack_5ed0 = uStack_7f90;
        uStack_5ec8 = uStack_7f88;
        local_5f00 = local_7f00;
        uStack_5ef8 = uStack_7ef8;
        uStack_5ef0 = uStack_7ef0;
        uStack_5ee8 = uStack_7ee8;
        fStack_5e84 = uStack_7e48._4_4_;
        local_5ea0 = (local_5dc0 + 0.5) * (float)local_7e60 * (float)local_7e60;
        fStack_5e9c = (fStack_5dbc + 0.5) * local_7e60._4_4_ * local_7e60._4_4_;
        fStack_5e98 = (fStack_5db8 + 0.5) * (float)uStack_7e58 * (float)uStack_7e58;
        fStack_5e94 = (fStack_5db4 + 0.5) * uStack_7e58._4_4_ * uStack_7e58._4_4_;
        fStack_5e90 = (fStack_5db0 + 0.5) * (float)uStack_7e50 * (float)uStack_7e50;
        fStack_5e8c = (fStack_5dac + 0.5) * uStack_7e50._4_4_ * uStack_7e50._4_4_;
        fStack_5e88 = (fStack_5da8 + 0.5) * (float)uStack_7e48 * (float)uStack_7e48;
        local_5ec0 = local_7ee0._0_8_;
        uStack_5eb8 = local_7ee0._8_8_;
        uStack_5eb0 = local_7ee0._16_8_;
        uStack_5ea8 = local_7ee0._24_8_;
        local_7fa0 = CONCAT44(fStack_5e9c + local_7e60._4_4_,local_5ea0 + (float)local_7e60);
        uStack_7f98 = CONCAT44(fStack_5e94 + uStack_7e58._4_4_,fStack_5e98 + (float)uStack_7e58);
        uStack_7f90 = CONCAT44(fStack_5e8c + uStack_7e50._4_4_,fStack_5e90 + (float)uStack_7e50);
        uStack_7f88 = CONCAT44(uStack_7e48._4_4_ + uStack_7e48._4_4_,
                               fStack_5e88 + (float)uStack_7e48);
        local_7e20 = local_7fa0;
        uStack_7e18 = uStack_7f98;
        uStack_7e10 = uStack_7f90;
        uStack_7e08 = uStack_7f88;
        local_7e40 = 0x3f8000003f800000;
        uStack_7e38 = 0x3f8000003f800000;
        uStack_7e30 = 0x3f8000003f800000;
        uStack_7e28 = 0x3f8000003f800000;
        fVar190 = local_5ea0 + (float)local_7e60 + 1.0;
        fVar191 = fStack_5e9c + local_7e60._4_4_ + 1.0;
        fVar192 = fStack_5e98 + (float)uStack_7e58 + 1.0;
        fVar193 = fStack_5e94 + uStack_7e58._4_4_ + 1.0;
        fVar186 = fStack_5e90 + (float)uStack_7e50 + 1.0;
        fVar187 = fStack_5e8c + uStack_7e50._4_4_ + 1.0;
        fVar188 = fStack_5e88 + (float)uStack_7e48 + 1.0;
        fVar189 = uStack_7e48._4_4_ + uStack_7e48._4_4_ + 1.0;
        local_7fa0 = CONCAT44(fVar191,fVar190);
        uStack_7f98 = CONCAT44(fVar193,fVar192);
        uStack_7f90 = CONCAT44(fVar187,fVar186);
        uStack_7f88 = CONCAT44(fVar189,fVar188);
        local_36a0 = local_7f20;
        uStack_3698 = uStack_7f18;
        uStack_3690 = uStack_7f10;
        uStack_3688 = uStack_7f08;
        local_7f40 = CONCAT44((int)local_3cc0._4_4_,(int)(float)local_3cc0);
        uStack_7f38 = CONCAT44((int)uStack_3cb8._4_4_,(int)(float)uStack_3cb8);
        uStack_7f30 = CONCAT44((int)uStack_3cb0._4_4_,(int)(float)uStack_3cb0);
        uStack_7f28 = CONCAT44((int)uStack_3ca8._4_4_,(int)(float)uStack_3ca8);
        local_3380 = local_7f40;
        uStack_3378 = uStack_7f38;
        uStack_3370 = uStack_7f30;
        uStack_3368 = uStack_7f28;
        local_33a0 = 0x7f0000007f;
        uStack_3398 = 0x7f0000007f;
        uStack_3390 = 0x7f0000007f;
        uStack_3388 = 0x7f0000007f;
        local_3420 = local_7f40;
        uStack_3418 = uStack_7f38;
        uStack_3410 = uStack_7f30;
        uStack_3408 = uStack_7f28;
        local_3440 = 0x7f0000007f;
        uStack_3438 = 0x7f0000007f;
        uStack_3430 = 0x7f0000007f;
        uStack_3428 = 0x7f0000007f;
        local_33d0 = 0x7f0000007f;
        uStack_33c8 = 0x7f0000007f;
        local_33e0 = 0x7f0000007f;
        uStack_33d8 = 0x7f0000007f;
        local_2e70 = local_7f40;
        uStack_2e68 = uStack_7f38;
        local_2e80 = 0x7f0000007f;
        uStack_2e78 = 0x7f0000007f;
        auVar101._8_8_ = uStack_7f38;
        auVar101._0_8_ = local_7f40;
        auVar100._8_8_ = 0x7f0000007f;
        auVar100._0_8_ = 0x7f0000007f;
        local_33b0 = vpaddd_avx(auVar101,auVar100);
        local_2e90 = uStack_7f30;
        uStack_2e88 = uStack_7f28;
        local_2ea0 = 0x7f0000007f;
        uStack_2e98 = 0x7f0000007f;
        auVar99._8_8_ = uStack_7f28;
        auVar99._0_8_ = uStack_7f30;
        auVar98._8_8_ = 0x7f0000007f;
        auVar98._0_8_ = 0x7f0000007f;
        local_33c0 = vpaddd_avx(auVar99,auVar98);
        local_3460 = local_33b0._0_8_;
        uStack_3458 = local_33b0._8_8_;
        uStack_3450 = local_33c0._0_8_;
        uStack_3448 = local_33c0._8_8_;
        local_3400 = local_33b0._0_8_;
        uStack_33f8 = local_33b0._8_8_;
        uStack_33f0 = local_33c0._0_8_;
        uStack_33e8 = local_33c0._8_8_;
        local_3040 = local_33b0._0_8_;
        uStack_3038 = local_33b0._8_8_;
        uStack_3030 = local_33c0._0_8_;
        uStack_3028 = local_33c0._8_8_;
        local_3044 = 0x17;
        local_30c0 = local_33b0._0_8_;
        uStack_30b8 = local_33b0._8_8_;
        uStack_30b0 = local_33c0._0_8_;
        uStack_30a8 = local_33c0._8_8_;
        local_2d70 = local_33b0._0_8_;
        uStack_2d68 = local_33b0._8_8_;
        local_2d74 = 0x17;
        local_3060 = vpslld_avx(local_33b0,ZEXT416(0x17));
        local_2d90 = local_33c0._0_8_;
        uStack_2d88 = local_33c0._8_8_;
        local_2d94 = 0x17;
        local_3070 = vpslld_avx(local_33c0,ZEXT416(0x17));
        local_30e0 = local_3060._0_8_;
        uStack_30d8 = local_3060._8_8_;
        uStack_30d0 = local_3070._0_8_;
        uStack_30c8 = local_3070._8_8_;
        local_30a0 = local_3060._0_8_;
        uStack_3098 = local_3060._8_8_;
        uStack_3090 = local_3070._0_8_;
        uStack_3088 = local_3070._8_8_;
        local_7f40 = local_3060._0_8_;
        uStack_7f38 = local_3060._8_8_;
        uStack_7f30 = local_3070._0_8_;
        uStack_7f28 = local_3070._8_8_;
        local_2f20 = local_3060._0_8_;
        uStack_2f18 = local_3060._8_8_;
        uStack_2f10 = local_3070._0_8_;
        uStack_2f08 = local_3070._8_8_;
        local_7fc0 = local_3060._0_8_;
        uStack_7fb8 = local_3060._8_8_;
        uStack_7fb0 = local_3070._0_8_;
        uStack_7fa8 = local_3070._8_8_;
        local_7ea0 = local_7fa0;
        uStack_7e98 = uStack_7f98;
        uStack_7e90 = uStack_7f90;
        uStack_7e88 = uStack_7f88;
        local_7ec0._0_4_ = local_3060._0_4_;
        local_7ec0._4_4_ = local_3060._4_4_;
        uStack_7eb8._0_4_ = local_3060._8_4_;
        uStack_7eb8._4_4_ = local_3060._12_4_;
        uStack_7eb0._0_4_ = local_3070._0_4_;
        uStack_7eb0._4_4_ = local_3070._4_4_;
        uStack_7ea8._0_4_ = local_3070._8_4_;
        fVar190 = fVar190 * (float)local_7ec0;
        fVar191 = fVar191 * local_7ec0._4_4_;
        fVar192 = fVar192 * (float)uStack_7eb8;
        fVar193 = fVar193 * uStack_7eb8._4_4_;
        fVar186 = fVar186 * (float)uStack_7eb0;
        fVar187 = fVar187 * uStack_7eb0._4_4_;
        fVar188 = fVar188 * (float)uStack_7ea8;
        local_7fa0 = CONCAT44(fVar191,fVar190);
        uStack_7f98 = CONCAT44(fVar193,fVar192);
        uStack_7f90 = CONCAT44(fVar187,fVar186);
        uStack_7f88 = CONCAT44(fVar189,fVar188);
        local_81a0 = local_7fa0;
        uStack_8198 = uStack_7f98;
        uStack_8190 = uStack_7f90;
        uStack_8188 = uStack_7f88;
        local_7de4 = 0x3f800000;
        local_2c40 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        local_2c60 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auStack_2c50 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        local_6d20 = 0x7f0000007f;
        uStack_6d18 = 0x7f0000007f;
        uStack_6d10 = 0x7f0000007f;
        uStack_6d08 = 0x7f0000007f;
        local_7540 = 0;
        uStack_9058 = SUB328(ZEXT832(0),4);
        uStack_7538 = uStack_9058;
        uStack_7530 = 0;
        uStack_7528 = 0;
        local_81c0._0_4_ = local_2c60._0_4_;
        local_81c0._4_4_ = local_2c60._4_4_;
        uStack_81b8._0_4_ = local_2c60._8_4_;
        uStack_81b8._4_4_ = local_2c60._12_4_;
        uStack_81b0._0_4_ = auStack_2c50._0_4_;
        uStack_81b0._4_4_ = auStack_2c50._4_4_;
        uStack_81a8._0_4_ = auStack_2c50._8_4_;
        uStack_81a8._4_4_ = auStack_2c50._12_4_;
        local_8460._4_4_ = fVar191 + local_81c0._4_4_;
        local_8460._0_4_ = fVar190 + (float)local_81c0;
        uStack_8458._0_4_ = fVar192 + (float)uStack_81b8;
        uStack_8458._4_4_ = fVar193 + uStack_81b8._4_4_;
        uStack_8450._0_4_ = fVar186 + (float)uStack_81b0;
        uStack_8450._4_4_ = fVar187 + uStack_81b0._4_4_;
        auVar38 = _local_8460;
        uStack_8448._0_4_ = fVar188 + (float)uStack_81a8;
        uStack_8448._4_4_ = fVar189 + uStack_81a8._4_4_;
        auVar3 = _local_8460;
        local_84c0 = vcmpps_avx(_local_8460,ZEXT832(uStack_9058) << 0x40,2);
        local_7380 = local_8460;
        uStack_7378 = uStack_8458;
        uStack_8450 = auVar38._16_8_;
        uStack_7370 = uStack_8450;
        uStack_8448 = auVar3._24_8_;
        uStack_7368 = uStack_8448;
        local_73a0 = 0x80000000800000;
        uStack_7398 = 0x80000000800000;
        uStack_7390 = 0x80000000800000;
        uStack_7388 = 0x80000000800000;
        auVar57._16_8_ = uStack_8450;
        auVar57._0_16_ = _local_8460;
        auVar57._24_8_ = uStack_8448;
        auVar56._8_8_ = 0x80000000800000;
        auVar56._0_8_ = 0x80000000800000;
        auVar56._16_8_ = 0x80000000800000;
        auVar56._24_8_ = 0x80000000800000;
        auVar3 = vmaxps_avx(auVar57,auVar56);
        local_8460 = auVar3._0_8_;
        local_71a0 = local_8460;
        uStack_8458 = auVar3._8_8_;
        uStack_7198 = uStack_8458;
        uStack_8450 = auVar3._16_8_;
        uStack_7190 = uStack_8450;
        uStack_8448 = auVar3._24_8_;
        uStack_7188 = uStack_8448;
        local_7280 = local_8460;
        uStack_7278 = uStack_8458;
        uStack_7270 = uStack_8450;
        uStack_7268 = uStack_8448;
        local_7284 = 0x17;
        local_7300 = local_8460;
        uStack_72f8 = uStack_8458;
        uStack_72f0 = uStack_8450;
        uStack_72e8 = uStack_8448;
        local_3870 = local_8460;
        uStack_3868 = uStack_8458;
        local_3874 = 0x17;
        local_72a0 = vpsrld_avx(auVar3._0_16_,ZEXT416(0x17));
        local_3890 = uStack_8450;
        uStack_3888 = uStack_8448;
        local_3894 = 0x17;
        local_72b0 = vpsrld_avx(auVar3._16_16_,ZEXT416(0x17));
        local_7320 = local_72a0._0_8_;
        uStack_7318 = local_72a0._8_8_;
        uStack_7310 = local_72b0._0_8_;
        uStack_7308 = local_72b0._8_8_;
        local_72e0 = local_72a0._0_8_;
        uStack_72d8 = local_72a0._8_8_;
        uStack_72d0 = local_72b0._0_8_;
        uStack_72c8 = local_72b0._8_8_;
        local_6fc0 = local_8460;
        uStack_6fb8 = uStack_8458;
        uStack_6fb0 = uStack_8450;
        uStack_6fa8 = uStack_8448;
        local_6fe0 = 0x807fffff807fffff;
        uStack_6fd8 = 0x807fffff807fffff;
        uStack_6fd0 = 0x807fffff807fffff;
        uStack_6fc8 = 0x807fffff807fffff;
        auVar65._8_8_ = 0x807fffff807fffff;
        auVar65._0_8_ = 0x807fffff807fffff;
        auVar65._16_8_ = 0x807fffff807fffff;
        auVar65._24_8_ = 0x807fffff807fffff;
        auVar3 = vandps_avx(auVar3,auVar65);
        local_8460 = auVar3._0_8_;
        local_6e80 = local_8460;
        uStack_8458 = auVar3._8_8_;
        uStack_6e78 = uStack_8458;
        uStack_8450 = auVar3._16_8_;
        uStack_6e70 = uStack_8450;
        uStack_8448 = auVar3._24_8_;
        uStack_6e68 = uStack_8448;
        auVar69._8_8_ = 0x3f0000003f000000;
        auVar69._0_8_ = 0x3f0000003f000000;
        auVar69._16_8_ = 0x3f0000003f000000;
        auVar69._24_8_ = 0x3f0000003f000000;
        auVar2 = vorps_avx(auVar3,auVar69);
        local_6d00 = local_72a0._0_8_;
        uStack_6cf8 = local_72a0._8_8_;
        uStack_6cf0 = local_72b0._0_8_;
        uStack_6ce8 = local_72b0._8_8_;
        local_6da0 = local_72a0._0_8_;
        uStack_6d98 = local_72a0._8_8_;
        uStack_6d90 = local_72b0._0_8_;
        uStack_6d88 = local_72b0._8_8_;
        local_6dc0 = 0x7f0000007f;
        uStack_6db8 = 0x7f0000007f;
        uStack_6db0 = 0x7f0000007f;
        uStack_6da8 = 0x7f0000007f;
        local_6d50 = 0x7f0000007f;
        uStack_6d48 = 0x7f0000007f;
        local_6d60 = 0x7f0000007f;
        uStack_6d58 = 0x7f0000007f;
        local_37f0 = local_72a0._0_8_;
        uStack_37e8 = local_72a0._8_8_;
        local_3800 = 0x7f0000007f;
        uStack_37f8 = 0x7f0000007f;
        auVar89._8_8_ = 0x7f0000007f;
        auVar89._0_8_ = 0x7f0000007f;
        local_6d30 = vpsubd_avx(local_72a0,auVar89);
        local_3810 = local_72b0._0_8_;
        uStack_3808 = local_72b0._8_8_;
        local_3820 = 0x7f0000007f;
        uStack_3818 = 0x7f0000007f;
        auVar88._8_8_ = 0x7f0000007f;
        auVar88._0_8_ = 0x7f0000007f;
        local_6d40 = vpsubd_avx(local_72b0,auVar88);
        local_6de0 = local_6d30._0_8_;
        uStack_6dd8 = local_6d30._8_8_;
        uStack_6dd0 = local_6d40._0_8_;
        uStack_6dc8 = local_6d40._8_8_;
        local_6d80 = local_6d30._0_8_;
        uStack_6d78 = local_6d30._8_8_;
        uStack_6d70 = local_6d40._0_8_;
        uStack_6d68 = local_6d40._8_8_;
        local_8480 = local_6d30._0_8_;
        uStack_8478 = local_6d30._8_8_;
        uStack_8470 = local_6d40._0_8_;
        uStack_8468 = local_6d40._8_8_;
        local_6be0 = local_6d30._0_8_;
        uStack_6bd8 = local_6d30._8_8_;
        uStack_6bd0 = local_6d40._0_8_;
        uStack_6bc8 = local_6d40._8_8_;
        auVar72._16_8_ = local_6d40._0_8_;
        auVar72._0_16_ = local_6d30;
        auVar72._24_8_ = local_6d40._8_8_;
        auVar3 = vcvtdq2ps_avx(auVar72);
        local_84e0 = auVar3._0_8_;
        uVar14 = local_84e0;
        uStack_84d8 = auVar3._8_8_;
        uVar15 = uStack_84d8;
        uStack_84d0 = auVar3._16_8_;
        uVar16 = uStack_84d0;
        uStack_84c8 = auVar3._24_8_;
        uVar17 = uStack_84c8;
        local_8300 = 0x3f8000003f800000;
        uStack_82f8 = 0x3f8000003f800000;
        uStack_82f0 = 0x3f8000003f800000;
        uStack_82e8 = 0x3f8000003f800000;
        local_82e0._0_4_ = auVar3._0_4_;
        local_82e0._4_4_ = auVar3._4_4_;
        uStack_82d8._0_4_ = auVar3._8_4_;
        uStack_82d8._4_4_ = auVar3._12_4_;
        uStack_82d0._0_4_ = auVar3._16_4_;
        uStack_82d0._4_4_ = auVar3._20_4_;
        uStack_82c8._0_4_ = auVar3._24_4_;
        uStack_82c8._4_4_ = auVar3._28_4_;
        local_84e0._4_4_ = local_82e0._4_4_ + 1.0;
        local_84e0._0_4_ = (float)local_82e0 + 1.0;
        uStack_84d8._0_4_ = (float)uStack_82d8 + 1.0;
        uStack_84d8._4_4_ = uStack_82d8._4_4_ + 1.0;
        uStack_84d0._0_4_ = (float)uStack_82d0 + 1.0;
        uStack_84d0._4_4_ = uStack_82d0._4_4_ + 1.0;
        auVar38 = _local_84e0;
        uStack_84c8._0_4_ = (float)uStack_82c8 + 1.0;
        uStack_84c8._4_4_ = uStack_82c8._4_4_ + 1.0;
        auVar4 = _local_84e0;
        local_8500 = vcmpps_avx(auVar2,_DAT_01f0ece0,1);
        local_8460 = auVar2._0_8_;
        local_7000 = local_8460;
        uStack_8458 = auVar2._8_8_;
        uStack_6ff8 = uStack_8458;
        uStack_8450 = auVar2._16_8_;
        uStack_6ff0 = uStack_8450;
        uStack_8448 = auVar2._24_8_;
        uStack_6fe8 = uStack_8448;
        local_7020 = local_8500._0_8_;
        uStack_7018 = local_8500._8_8_;
        uStack_7010 = local_8500._16_8_;
        uStack_7008 = local_8500._24_8_;
        local_8520 = vandps_avx(auVar2,local_8500);
        local_7d00 = local_8460;
        uStack_7cf8 = uStack_8458;
        uStack_7cf0 = uStack_8450;
        uStack_7ce8 = uStack_8448;
        local_7d20 = 0x3f8000003f800000;
        uStack_7d18 = 0x3f8000003f800000;
        uStack_7d10 = 0x3f8000003f800000;
        uStack_7d08 = 0x3f8000003f800000;
        auVar9._8_8_ = 0x3f8000003f800000;
        auVar9._0_8_ = 0x3f8000003f800000;
        auVar9._16_8_ = 0x3f8000003f800000;
        auVar9._24_8_ = 0x3f8000003f800000;
        auVar3 = vsubps_avx(auVar2,auVar9);
        local_7d40 = local_84e0;
        uStack_7d38 = uStack_84d8;
        uStack_84d0 = auVar38._16_8_;
        uStack_7d30 = uStack_84d0;
        uStack_84c8 = auVar4._24_8_;
        uStack_7d28 = uStack_84c8;
        local_7040 = 0x3f8000003f800000;
        uStack_7038 = 0x3f8000003f800000;
        uStack_7030 = 0x3f8000003f800000;
        uStack_7028 = 0x3f8000003f800000;
        local_7060 = local_8500._0_8_;
        uStack_7058 = local_8500._8_8_;
        uStack_7050 = local_8500._16_8_;
        uStack_7048 = local_8500._24_8_;
        auVar64._8_8_ = 0x3f8000003f800000;
        auVar64._0_8_ = 0x3f8000003f800000;
        auVar64._16_8_ = 0x3f8000003f800000;
        auVar64._24_8_ = 0x3f8000003f800000;
        local_7d60 = vandps_avx(auVar64,local_8500);
        auVar2._16_8_ = uStack_84d0;
        auVar2._0_16_ = _local_84e0;
        auVar2._24_8_ = uStack_84c8;
        _local_84e0 = vsubps_avx(auVar2,local_7d60);
        local_8460 = auVar3._0_8_;
        uVar18 = local_8460;
        uStack_8458 = auVar3._8_8_;
        uVar19 = uStack_8458;
        uStack_8450 = auVar3._16_8_;
        uVar20 = uStack_8450;
        uStack_8448 = auVar3._24_8_;
        uVar21 = uStack_8448;
        local_8320._0_4_ = auVar3._0_4_;
        local_8320._4_4_ = auVar3._4_4_;
        uStack_8318._0_4_ = auVar3._8_4_;
        uStack_8318._4_4_ = auVar3._12_4_;
        uStack_8310._0_4_ = auVar3._16_4_;
        uStack_8310._4_4_ = auVar3._20_4_;
        uStack_8308._0_4_ = auVar3._24_4_;
        uStack_8308._4_4_ = auVar3._28_4_;
        local_8340._0_4_ = local_8520._0_4_;
        local_8340._4_4_ = local_8520._4_4_;
        uStack_8338._0_4_ = local_8520._8_4_;
        uStack_8338._4_4_ = local_8520._12_4_;
        uStack_8330._0_4_ = local_8520._16_4_;
        uStack_8330._4_4_ = local_8520._20_4_;
        uStack_8328._0_4_ = local_8520._24_4_;
        uStack_8328._4_4_ = local_8520._28_4_;
        local_8320._0_4_ = (float)local_8320 + (float)local_8340;
        local_8320._4_4_ = local_8320._4_4_ + local_8340._4_4_;
        uStack_8318._0_4_ = (float)uStack_8318 + (float)uStack_8338;
        uStack_8318._4_4_ = uStack_8318._4_4_ + uStack_8338._4_4_;
        uStack_8310._0_4_ = (float)uStack_8310 + (float)uStack_8330;
        uStack_8310._4_4_ = uStack_8310._4_4_ + uStack_8330._4_4_;
        uStack_8308._0_4_ = (float)uStack_8308 + (float)uStack_8328;
        fStack_8524 = uStack_8308._4_4_ + uStack_8328._4_4_;
        local_8460._4_4_ = local_8320._4_4_;
        local_8460._0_4_ = (float)local_8320;
        uStack_8458._0_4_ = (float)uStack_8318;
        uStack_8458._4_4_ = uStack_8318._4_4_;
        uStack_8450._0_4_ = (float)uStack_8310;
        uStack_8450._4_4_ = uStack_8310._4_4_;
        auVar38 = _local_8460;
        uStack_8448._0_4_ = (float)uStack_8308;
        uStack_8448._4_4_ = fStack_8524;
        auVar3 = _local_8460;
        local_83c0 = local_8460;
        uStack_83b8 = uStack_8458;
        uStack_8450 = auVar38._16_8_;
        uStack_83b0 = uStack_8450;
        uStack_8448 = auVar3._24_8_;
        uStack_83a8 = uStack_8448;
        local_8540 = (float)local_8320 * (float)local_8320;
        fStack_853c = local_8320._4_4_ * local_8320._4_4_;
        fStack_8538 = (float)uStack_8318 * (float)uStack_8318;
        fStack_8534 = uStack_8318._4_4_ * uStack_8318._4_4_;
        fStack_8530 = (float)uStack_8310 * (float)uStack_8310;
        fStack_852c = uStack_8310._4_4_ * uStack_8310._4_4_;
        fStack_8528 = (float)uStack_8308 * (float)uStack_8308;
        local_4b00 = 0x3d9021bb3d9021bb;
        uStack_4af8 = 0x3d9021bb3d9021bb;
        uStack_4af0 = 0x3d9021bb3d9021bb;
        uStack_4ae8 = 0x3d9021bb3d9021bb;
        local_4b20 = local_8460;
        uStack_4b18 = uStack_8458;
        uStack_4b10 = uStack_8450;
        uStack_4b08 = uStack_8448;
        local_4b40 = 0xbdebd1b8bdebd1b8;
        uStack_4b38 = 0xbdebd1b8bdebd1b8;
        uStack_4b30 = 0xbdebd1b8bdebd1b8;
        uStack_4b28 = 0xbdebd1b8bdebd1b8;
        local_4ac0 = 0x3d9021bb3d9021bb;
        uStack_4ab8 = 0x3d9021bb3d9021bb;
        uStack_4ab0 = 0x3d9021bb3d9021bb;
        uStack_4aa8 = 0x3d9021bb3d9021bb;
        local_4ae0 = local_8460;
        uStack_4ad8 = uStack_8458;
        uStack_4ad0 = uStack_8450;
        uStack_4ac8 = uStack_8448;
        local_4a80 = (float)local_8320 * 0.070376836;
        fStack_4a7c = local_8320._4_4_ * 0.070376836;
        fStack_4a78 = (float)uStack_8318 * 0.070376836;
        fStack_4a74 = uStack_8318._4_4_ * 0.070376836;
        fStack_4a70 = (float)uStack_8310 * 0.070376836;
        fStack_4a6c = uStack_8310._4_4_ * 0.070376836;
        fStack_4a68 = (float)uStack_8308 * 0.070376836;
        local_4aa0 = 0xbdebd1b8bdebd1b8;
        uStack_4a98 = 0xbdebd1b8bdebd1b8;
        uStack_4a90 = 0xbdebd1b8bdebd1b8;
        uStack_4a88 = 0xbdebd1b8bdebd1b8;
        local_8560._4_4_ = fStack_4a7c + -0.1151461;
        local_8560._0_4_ = local_4a80 + -0.1151461;
        uStack_8558._0_4_ = fStack_4a78 + -0.1151461;
        uStack_8558._4_4_ = fStack_4a74 + -0.1151461;
        uStack_8550._0_4_ = fStack_4a70 + -0.1151461;
        uStack_8550._4_4_ = fStack_4a6c + -0.1151461;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4a68 + -0.1151461;
        uStack_8548._4_4_ = fStack_8524 + -0.1151461;
        auVar3 = _local_8560;
        local_4be0 = local_8560;
        uStack_4bd8 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_4bd0 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_4bc8 = uStack_8548;
        local_4c00 = local_8460;
        uStack_4bf8 = uStack_8458;
        uStack_4bf0 = uStack_8450;
        uStack_4be8 = uStack_8448;
        local_4c20 = 0x3def251a3def251a;
        uStack_4c18 = 0x3def251a3def251a;
        uStack_4c10 = 0x3def251a3def251a;
        uStack_4c08 = 0x3def251a3def251a;
        local_4ba0 = local_8560;
        uStack_4b98 = uStack_8558;
        uStack_4b90 = uStack_8550;
        uStack_4b88 = uStack_8548;
        local_4bc0 = local_8460;
        uStack_4bb8 = uStack_8458;
        uStack_4bb0 = uStack_8450;
        uStack_4ba8 = uStack_8448;
        local_4b60 = (local_4a80 + -0.1151461) * (float)local_8320;
        fStack_4b5c = (fStack_4a7c + -0.1151461) * local_8320._4_4_;
        fStack_4b58 = (fStack_4a78 + -0.1151461) * (float)uStack_8318;
        fStack_4b54 = (fStack_4a74 + -0.1151461) * uStack_8318._4_4_;
        fStack_4b50 = (fStack_4a70 + -0.1151461) * (float)uStack_8310;
        fStack_4b4c = (fStack_4a6c + -0.1151461) * uStack_8310._4_4_;
        fStack_4b48 = (fStack_4a68 + -0.1151461) * (float)uStack_8308;
        local_4b80 = 0x3def251a3def251a;
        uStack_4b78 = 0x3def251a3def251a;
        uStack_4b70 = 0x3def251a3def251a;
        uStack_4b68 = 0x3def251a3def251a;
        local_8560._4_4_ = fStack_4b5c + 0.116769984;
        local_8560._0_4_ = local_4b60 + 0.116769984;
        uStack_8558._0_4_ = fStack_4b58 + 0.116769984;
        uStack_8558._4_4_ = fStack_4b54 + 0.116769984;
        uStack_8550._0_4_ = fStack_4b50 + 0.116769984;
        uStack_8550._4_4_ = fStack_4b4c + 0.116769984;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4b48 + 0.116769984;
        uStack_8548._4_4_ = fStack_8524 + 0.116769984;
        auVar3 = _local_8560;
        local_4cc0 = local_8560;
        uStack_4cb8 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_4cb0 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_4ca8 = uStack_8548;
        local_4ce0 = local_8460;
        uStack_4cd8 = uStack_8458;
        uStack_4cd0 = uStack_8450;
        uStack_4cc8 = uStack_8448;
        local_4d00 = 0xbdfe5d4fbdfe5d4f;
        uStack_4cf8 = 0xbdfe5d4fbdfe5d4f;
        uStack_4cf0 = 0xbdfe5d4fbdfe5d4f;
        uStack_4ce8 = 0xbdfe5d4fbdfe5d4f;
        local_4c80 = local_8560;
        uStack_4c78 = uStack_8558;
        uStack_4c70 = uStack_8550;
        uStack_4c68 = uStack_8548;
        local_4ca0 = local_8460;
        uStack_4c98 = uStack_8458;
        uStack_4c90 = uStack_8450;
        uStack_4c88 = uStack_8448;
        local_4c40 = (local_4b60 + 0.116769984) * (float)local_8320;
        fStack_4c3c = (fStack_4b5c + 0.116769984) * local_8320._4_4_;
        fStack_4c38 = (fStack_4b58 + 0.116769984) * (float)uStack_8318;
        fStack_4c34 = (fStack_4b54 + 0.116769984) * uStack_8318._4_4_;
        fStack_4c30 = (fStack_4b50 + 0.116769984) * (float)uStack_8310;
        fStack_4c2c = (fStack_4b4c + 0.116769984) * uStack_8310._4_4_;
        fStack_4c28 = (fStack_4b48 + 0.116769984) * (float)uStack_8308;
        local_4c60 = 0xbdfe5d4fbdfe5d4f;
        uStack_4c58 = 0xbdfe5d4fbdfe5d4f;
        uStack_4c50 = 0xbdfe5d4fbdfe5d4f;
        uStack_4c48 = 0xbdfe5d4fbdfe5d4f;
        local_8560._4_4_ = fStack_4c3c + -0.12420141;
        local_8560._0_4_ = local_4c40 + -0.12420141;
        uStack_8558._0_4_ = fStack_4c38 + -0.12420141;
        uStack_8558._4_4_ = fStack_4c34 + -0.12420141;
        uStack_8550._0_4_ = fStack_4c30 + -0.12420141;
        uStack_8550._4_4_ = fStack_4c2c + -0.12420141;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4c28 + -0.12420141;
        uStack_8548._4_4_ = fStack_8524 + -0.12420141;
        auVar3 = _local_8560;
        local_4da0 = local_8560;
        uStack_4d98 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_4d90 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_4d88 = uStack_8548;
        local_4dc0 = local_8460;
        uStack_4db8 = uStack_8458;
        uStack_4db0 = uStack_8450;
        uStack_4da8 = uStack_8448;
        local_4de0 = 0x3e11e9bf3e11e9bf;
        uStack_4dd8 = 0x3e11e9bf3e11e9bf;
        uStack_4dd0 = 0x3e11e9bf3e11e9bf;
        uStack_4dc8 = 0x3e11e9bf3e11e9bf;
        local_4d60 = local_8560;
        uStack_4d58 = uStack_8558;
        uStack_4d50 = uStack_8550;
        uStack_4d48 = uStack_8548;
        local_4d80 = local_8460;
        uStack_4d78 = uStack_8458;
        uStack_4d70 = uStack_8450;
        uStack_4d68 = uStack_8448;
        local_4d20 = (local_4c40 + -0.12420141) * (float)local_8320;
        fStack_4d1c = (fStack_4c3c + -0.12420141) * local_8320._4_4_;
        fStack_4d18 = (fStack_4c38 + -0.12420141) * (float)uStack_8318;
        fStack_4d14 = (fStack_4c34 + -0.12420141) * uStack_8318._4_4_;
        fStack_4d10 = (fStack_4c30 + -0.12420141) * (float)uStack_8310;
        fStack_4d0c = (fStack_4c2c + -0.12420141) * uStack_8310._4_4_;
        fStack_4d08 = (fStack_4c28 + -0.12420141) * (float)uStack_8308;
        local_4d40 = 0x3e11e9bf3e11e9bf;
        uStack_4d38 = 0x3e11e9bf3e11e9bf;
        uStack_4d30 = 0x3e11e9bf3e11e9bf;
        uStack_4d28 = 0x3e11e9bf3e11e9bf;
        local_8560._4_4_ = fStack_4d1c + 0.14249323;
        local_8560._0_4_ = local_4d20 + 0.14249323;
        uStack_8558._0_4_ = fStack_4d18 + 0.14249323;
        uStack_8558._4_4_ = fStack_4d14 + 0.14249323;
        uStack_8550._0_4_ = fStack_4d10 + 0.14249323;
        uStack_8550._4_4_ = fStack_4d0c + 0.14249323;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4d08 + 0.14249323;
        uStack_8548._4_4_ = fStack_8524 + 0.14249323;
        auVar3 = _local_8560;
        local_4e80 = local_8560;
        uStack_4e78 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_4e70 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_4e68 = uStack_8548;
        local_4ea0 = local_8460;
        uStack_4e98 = uStack_8458;
        uStack_4e90 = uStack_8450;
        uStack_4e88 = uStack_8448;
        local_4ec0 = 0xbe2aae50be2aae50;
        uStack_4eb8 = 0xbe2aae50be2aae50;
        uStack_4eb0 = 0xbe2aae50be2aae50;
        uStack_4ea8 = 0xbe2aae50be2aae50;
        local_4e40 = local_8560;
        uStack_4e38 = uStack_8558;
        uStack_4e30 = uStack_8550;
        uStack_4e28 = uStack_8548;
        local_4e60 = local_8460;
        uStack_4e58 = uStack_8458;
        uStack_4e50 = uStack_8450;
        uStack_4e48 = uStack_8448;
        local_4e00 = (local_4d20 + 0.14249323) * (float)local_8320;
        fStack_4dfc = (fStack_4d1c + 0.14249323) * local_8320._4_4_;
        fStack_4df8 = (fStack_4d18 + 0.14249323) * (float)uStack_8318;
        fStack_4df4 = (fStack_4d14 + 0.14249323) * uStack_8318._4_4_;
        fStack_4df0 = (fStack_4d10 + 0.14249323) * (float)uStack_8310;
        fStack_4dec = (fStack_4d0c + 0.14249323) * uStack_8310._4_4_;
        fStack_4de8 = (fStack_4d08 + 0.14249323) * (float)uStack_8308;
        local_4e20 = 0xbe2aae50be2aae50;
        uStack_4e18 = 0xbe2aae50be2aae50;
        uStack_4e10 = 0xbe2aae50be2aae50;
        uStack_4e08 = 0xbe2aae50be2aae50;
        local_8560._4_4_ = fStack_4dfc + -0.16668057;
        local_8560._0_4_ = local_4e00 + -0.16668057;
        uStack_8558._0_4_ = fStack_4df8 + -0.16668057;
        uStack_8558._4_4_ = fStack_4df4 + -0.16668057;
        uStack_8550._0_4_ = fStack_4df0 + -0.16668057;
        uStack_8550._4_4_ = fStack_4dec + -0.16668057;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4de8 + -0.16668057;
        uStack_8548._4_4_ = fStack_8524 + -0.16668057;
        auVar3 = _local_8560;
        local_4f60 = local_8560;
        uStack_4f58 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_4f50 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_4f48 = uStack_8548;
        local_4f80 = local_8460;
        uStack_4f78 = uStack_8458;
        uStack_4f70 = uStack_8450;
        uStack_4f68 = uStack_8448;
        local_4fa0 = 0x3e4cceac3e4cceac;
        uStack_4f98 = 0x3e4cceac3e4cceac;
        uStack_4f90 = 0x3e4cceac3e4cceac;
        uStack_4f88 = 0x3e4cceac3e4cceac;
        local_4f20 = local_8560;
        uStack_4f18 = uStack_8558;
        uStack_4f10 = uStack_8550;
        uStack_4f08 = uStack_8548;
        local_4f40 = local_8460;
        uStack_4f38 = uStack_8458;
        uStack_4f30 = uStack_8450;
        uStack_4f28 = uStack_8448;
        local_4ee0 = (local_4e00 + -0.16668057) * (float)local_8320;
        fStack_4edc = (fStack_4dfc + -0.16668057) * local_8320._4_4_;
        fStack_4ed8 = (fStack_4df8 + -0.16668057) * (float)uStack_8318;
        fStack_4ed4 = (fStack_4df4 + -0.16668057) * uStack_8318._4_4_;
        fStack_4ed0 = (fStack_4df0 + -0.16668057) * (float)uStack_8310;
        fStack_4ecc = (fStack_4dec + -0.16668057) * uStack_8310._4_4_;
        fStack_4ec8 = (fStack_4de8 + -0.16668057) * (float)uStack_8308;
        local_4f00 = 0x3e4cceac3e4cceac;
        uStack_4ef8 = 0x3e4cceac3e4cceac;
        uStack_4ef0 = 0x3e4cceac3e4cceac;
        uStack_4ee8 = 0x3e4cceac3e4cceac;
        local_8560._4_4_ = fStack_4edc + 0.20000714;
        local_8560._0_4_ = local_4ee0 + 0.20000714;
        uStack_8558._0_4_ = fStack_4ed8 + 0.20000714;
        uStack_8558._4_4_ = fStack_4ed4 + 0.20000714;
        uStack_8550._0_4_ = fStack_4ed0 + 0.20000714;
        uStack_8550._4_4_ = fStack_4ecc + 0.20000714;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4ec8 + 0.20000714;
        uStack_8548._4_4_ = fStack_8524 + 0.20000714;
        auVar3 = _local_8560;
        local_5040 = local_8560;
        uStack_5038 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_5030 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_5028 = uStack_8548;
        local_5060 = local_8460;
        uStack_5058 = uStack_8458;
        uStack_5050 = uStack_8450;
        uStack_5048 = uStack_8448;
        local_5080 = 0xbe7ffffcbe7ffffc;
        uStack_5078 = 0xbe7ffffcbe7ffffc;
        uStack_5070 = 0xbe7ffffcbe7ffffc;
        uStack_5068 = 0xbe7ffffcbe7ffffc;
        local_5000 = local_8560;
        uStack_4ff8 = uStack_8558;
        uStack_4ff0 = uStack_8550;
        uStack_4fe8 = uStack_8548;
        local_5020 = local_8460;
        uStack_5018 = uStack_8458;
        uStack_5010 = uStack_8450;
        uStack_5008 = uStack_8448;
        local_4fc0 = (local_4ee0 + 0.20000714) * (float)local_8320;
        fStack_4fbc = (fStack_4edc + 0.20000714) * local_8320._4_4_;
        fStack_4fb8 = (fStack_4ed8 + 0.20000714) * (float)uStack_8318;
        fStack_4fb4 = (fStack_4ed4 + 0.20000714) * uStack_8318._4_4_;
        fStack_4fb0 = (fStack_4ed0 + 0.20000714) * (float)uStack_8310;
        fStack_4fac = (fStack_4ecc + 0.20000714) * uStack_8310._4_4_;
        fStack_4fa8 = (fStack_4ec8 + 0.20000714) * (float)uStack_8308;
        local_4fe0 = 0xbe7ffffcbe7ffffc;
        uStack_4fd8 = 0xbe7ffffcbe7ffffc;
        uStack_4fd0 = 0xbe7ffffcbe7ffffc;
        uStack_4fc8 = 0xbe7ffffcbe7ffffc;
        local_8560._4_4_ = fStack_4fbc + -0.24999994;
        local_8560._0_4_ = local_4fc0 + -0.24999994;
        uStack_8558._0_4_ = fStack_4fb8 + -0.24999994;
        uStack_8558._4_4_ = fStack_4fb4 + -0.24999994;
        uStack_8550._0_4_ = fStack_4fb0 + -0.24999994;
        uStack_8550._4_4_ = fStack_4fac + -0.24999994;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_4fa8 + -0.24999994;
        uStack_8548._4_4_ = fStack_8524 + -0.24999994;
        auVar3 = _local_8560;
        local_5120 = local_8560;
        uStack_5118 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_5110 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_5108 = uStack_8548;
        local_5140 = local_8460;
        uStack_5138 = uStack_8458;
        uStack_5130 = uStack_8450;
        uStack_5128 = uStack_8448;
        local_5160 = 0x3eaaaaaa3eaaaaaa;
        uStack_5158 = 0x3eaaaaaa3eaaaaaa;
        uStack_5150 = 0x3eaaaaaa3eaaaaaa;
        uStack_5148 = 0x3eaaaaaa3eaaaaaa;
        local_50e0 = local_8560;
        uStack_50d8 = uStack_8558;
        uStack_50d0 = uStack_8550;
        uStack_50c8 = uStack_8548;
        local_5100 = local_8460;
        uStack_50f8 = uStack_8458;
        uStack_50f0 = uStack_8450;
        uStack_50e8 = uStack_8448;
        local_50a0 = (local_4fc0 + -0.24999994) * (float)local_8320;
        fStack_509c = (fStack_4fbc + -0.24999994) * local_8320._4_4_;
        fStack_5098 = (fStack_4fb8 + -0.24999994) * (float)uStack_8318;
        fStack_5094 = (fStack_4fb4 + -0.24999994) * uStack_8318._4_4_;
        fStack_5090 = (fStack_4fb0 + -0.24999994) * (float)uStack_8310;
        fStack_508c = (fStack_4fac + -0.24999994) * uStack_8310._4_4_;
        fStack_5088 = (fStack_4fa8 + -0.24999994) * (float)uStack_8308;
        local_50c0 = 0x3eaaaaaa3eaaaaaa;
        uStack_50b8 = 0x3eaaaaaa3eaaaaaa;
        uStack_50b0 = 0x3eaaaaaa3eaaaaaa;
        uStack_50a8 = 0x3eaaaaaa3eaaaaaa;
        fVar187 = fStack_8524 + 0.3333333;
        local_8560._4_4_ = fStack_509c + 0.3333333;
        local_8560._0_4_ = local_50a0 + 0.3333333;
        uStack_8558._0_4_ = fStack_5098 + 0.3333333;
        uStack_8558._4_4_ = fStack_5094 + 0.3333333;
        uStack_8550._0_4_ = fStack_5090 + 0.3333333;
        uStack_8550._4_4_ = fStack_508c + 0.3333333;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_5088 + 0.3333333;
        uStack_8548._4_4_ = fVar187;
        auVar3 = _local_8560;
        local_83e0 = local_8560;
        uStack_83d8 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_83d0 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_83c8 = uStack_8548;
        local_8400 = local_8460;
        uStack_83f8 = uStack_8458;
        uStack_83f0 = uStack_8450;
        uStack_83e8 = uStack_8448;
        local_8560._0_4_ = (local_50a0 + 0.3333333) * (float)local_8320;
        local_8560._4_4_ = (fStack_509c + 0.3333333) * local_8320._4_4_;
        fVar190 = (fStack_5098 + 0.3333333) * (float)uStack_8318;
        fVar191 = (fStack_5094 + 0.3333333) * uStack_8318._4_4_;
        fVar192 = (fStack_5090 + 0.3333333) * (float)uStack_8310;
        fVar193 = (fStack_508c + 0.3333333) * uStack_8310._4_4_;
        fVar186 = (fStack_5088 + 0.3333333) * (float)uStack_8308;
        uStack_8558._0_4_ = fVar190;
        uStack_8558._4_4_ = fVar191;
        uStack_8550._0_4_ = fVar192;
        uStack_8550._4_4_ = fVar193;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fVar186;
        auVar3 = _local_8560;
        local_8420 = local_8560;
        uStack_8418 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_8410 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_8408 = uStack_8548;
        local_8440 = CONCAT44(fStack_853c,local_8540);
        uStack_8438 = CONCAT44(fStack_8534,fStack_8538);
        uStack_8430 = CONCAT44(fStack_852c,fStack_8530);
        uStack_8428 = CONCAT44(fStack_8524,fStack_8528);
        local_8560._0_4_ = (float)local_8560._0_4_ * local_8540;
        local_8560._4_4_ = (float)local_8560._4_4_ * fStack_853c;
        fVar190 = fVar190 * fStack_8538;
        fVar191 = fVar191 * fStack_8534;
        fVar192 = fVar192 * fStack_8530;
        fVar193 = fVar193 * fStack_852c;
        fVar186 = fVar186 * fStack_8528;
        uStack_8558._0_4_ = fVar190;
        uStack_8558._4_4_ = fVar191;
        uStack_8550._0_4_ = fVar192;
        uStack_8550._4_4_ = fVar193;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fVar186;
        auVar3 = _local_8560;
        local_5200 = local_84e0;
        uStack_51f8 = uStack_84d8;
        uStack_51f0 = uStack_84d0;
        uStack_51e8 = uStack_84c8;
        local_5240 = local_8560;
        uStack_5238 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_5230 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_5228 = uStack_8548;
        local_51e0 = 0xb95e8083b95e8083;
        uStack_51d8 = 0xb95e8083b95e8083;
        uStack_51d0 = 0xb95e8083b95e8083;
        uStack_51c8 = 0xb95e8083b95e8083;
        local_51c0._0_4_ = local_84e0._0_4_;
        local_51c0._4_4_ = local_84e0._4_4_;
        uStack_51b8._0_4_ = local_84e0._8_4_;
        uStack_51b8._4_4_ = local_84e0._12_4_;
        uStack_51b0._0_4_ = local_84e0._16_4_;
        uStack_51b0._4_4_ = local_84e0._20_4_;
        uStack_51a8._0_4_ = local_84e0._24_4_;
        uStack_5164 = 0xb95e8083;
        local_5180 = (float)local_51c0 * -0.00021219444;
        fStack_517c = local_51c0._4_4_ * -0.00021219444;
        fStack_5178 = (float)uStack_51b8 * -0.00021219444;
        fStack_5174 = uStack_51b8._4_4_ * -0.00021219444;
        fStack_5170 = (float)uStack_51b0 * -0.00021219444;
        fStack_516c = uStack_51b0._4_4_ * -0.00021219444;
        fStack_5168 = (float)uStack_51a8 * -0.00021219444;
        local_51a0 = local_8560;
        uStack_5198 = uStack_8558;
        uStack_5190 = uStack_8550;
        uStack_5188 = uStack_8548;
        local_8560._4_4_ = fStack_517c + (float)local_8560._4_4_;
        local_8560._0_4_ = local_5180 + (float)local_8560._0_4_;
        uStack_8558._0_4_ = fStack_5178 + fVar190;
        uStack_8558._4_4_ = fStack_5174 + fVar191;
        uStack_8550._0_4_ = fStack_5170 + fVar192;
        uStack_8550._4_4_ = fStack_516c + fVar193;
        auVar38 = _local_8560;
        uStack_8548._0_4_ = fStack_5168 + fVar186;
        uStack_8548._4_4_ = fVar187 + -0.00021219444;
        auVar3 = _local_8560;
        local_3a60 = CONCAT44(fStack_853c,local_8540);
        uStack_3a58 = CONCAT44(fStack_8534,fStack_8538);
        uStack_3a50 = CONCAT44(fStack_852c,fStack_8530);
        uStack_3a48 = CONCAT44(fStack_8524,fStack_8528);
        local_3aa0 = local_8560;
        uStack_3a98 = uStack_8558;
        uStack_8550 = auVar38._16_8_;
        uStack_3a90 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uStack_3a88 = uStack_8548;
        local_39e0 = local_8560;
        uStack_39d8 = uStack_8558;
        uStack_39d0 = uStack_8550;
        uStack_39c8 = uStack_8548;
        local_3a40 = 0x3f0000003f000000;
        uStack_3a38 = 0x3f0000003f000000;
        uStack_3a30 = 0x3f0000003f000000;
        uStack_3a28 = 0x3f0000003f000000;
        local_3a00 = local_8540 * 0.5;
        fStack_39fc = fStack_853c * 0.5;
        fStack_39f8 = fStack_8538 * 0.5;
        fStack_39f4 = fStack_8534 * 0.5;
        fStack_39f0 = fStack_8530 * 0.5;
        fStack_39ec = fStack_852c * 0.5;
        fStack_39e8 = fStack_8528 * 0.5;
        auVar83._16_8_ = uStack_8550;
        auVar83._0_16_ = _local_8560;
        auVar83._24_8_ = uStack_8548;
        auVar82._4_4_ = fStack_39fc;
        auVar82._0_4_ = local_3a00;
        auVar82._8_4_ = fStack_39f8;
        auVar82._12_4_ = fStack_39f4;
        auVar82._16_4_ = fStack_39f0;
        auVar82._20_4_ = fStack_39ec;
        auVar82._24_4_ = fStack_39e8;
        auVar82._28_4_ = fStack_8524;
        auVar3 = vsubps_avx(auVar83,auVar82);
        local_8360 = local_8460;
        uStack_8358 = uStack_8458;
        uStack_8350 = uStack_8450;
        uStack_8348 = uStack_8448;
        local_8560 = auVar3._0_8_;
        uVar22 = local_8560;
        uStack_8558 = auVar3._8_8_;
        uVar23 = uStack_8558;
        uStack_8550 = auVar3._16_8_;
        uVar24 = uStack_8550;
        uStack_8548 = auVar3._24_8_;
        uVar25 = uStack_8548;
        local_8380._0_4_ = auVar3._0_4_;
        local_8380._4_4_ = auVar3._4_4_;
        uStack_8378._0_4_ = auVar3._8_4_;
        uStack_8378._4_4_ = auVar3._12_4_;
        uStack_8370._0_4_ = auVar3._16_4_;
        uStack_8370._4_4_ = auVar3._20_4_;
        uStack_8368._0_4_ = auVar3._24_4_;
        uStack_8368._4_4_ = auVar3._28_4_;
        local_8460._4_4_ = local_8320._4_4_ + local_8380._4_4_;
        local_8460._0_4_ = (float)local_8320 + (float)local_8380;
        uStack_8458._0_4_ = (float)uStack_8318 + (float)uStack_8378;
        uStack_8458._4_4_ = uStack_8318._4_4_ + uStack_8378._4_4_;
        uStack_8450._0_4_ = (float)uStack_8310 + (float)uStack_8370;
        uStack_8450._4_4_ = uStack_8310._4_4_ + uStack_8370._4_4_;
        auVar38 = _local_8460;
        uStack_8448._0_4_ = (float)uStack_8308 + (float)uStack_8368;
        uStack_8448._4_4_ = fStack_8524 + uStack_8368._4_4_;
        auVar3 = _local_8460;
        local_52e0 = local_84e0;
        uStack_52d8 = uStack_84d8;
        uStack_52d0 = uStack_84d0;
        uStack_52c8 = uStack_84c8;
        local_5320 = local_8460;
        uStack_5318 = uStack_8458;
        uStack_8450 = auVar38._16_8_;
        uStack_5310 = uStack_8450;
        uStack_8448 = auVar3._24_8_;
        uStack_5308 = uStack_8448;
        local_52a0 = local_84e0;
        uStack_5298 = uStack_84d8;
        uStack_5290 = uStack_84d0;
        uStack_5288 = uStack_84c8;
        local_52c0 = 0x3f3180003f318000;
        uStack_52b8 = 0x3f3180003f318000;
        uStack_52b0 = 0x3f3180003f318000;
        uStack_52a8 = 0x3f3180003f318000;
        uStack_5244 = 0x3f318000;
        local_5260 = (float)local_51c0 * 0.6933594;
        fStack_525c = local_51c0._4_4_ * 0.6933594;
        fStack_5258 = (float)uStack_51b8 * 0.6933594;
        fStack_5254 = uStack_51b8._4_4_ * 0.6933594;
        fStack_5250 = (float)uStack_51b0 * 0.6933594;
        fStack_524c = uStack_51b0._4_4_ * 0.6933594;
        fStack_5248 = (float)uStack_51a8 * 0.6933594;
        local_5280 = local_8460;
        uStack_5278 = uStack_8458;
        uStack_5270 = uStack_8450;
        uStack_5268 = uStack_8448;
        local_8460._4_4_ = fStack_525c + local_8320._4_4_ + local_8380._4_4_;
        local_8460._0_4_ = local_5260 + (float)local_8320 + (float)local_8380;
        uStack_8458._0_4_ = fStack_5258 + (float)uStack_8318 + (float)uStack_8378;
        uStack_8458._4_4_ = fStack_5254 + uStack_8318._4_4_ + uStack_8378._4_4_;
        uStack_8450._0_4_ = fStack_5250 + (float)uStack_8310 + (float)uStack_8370;
        uStack_8450._4_4_ = fStack_524c + uStack_8310._4_4_ + uStack_8370._4_4_;
        auVar38 = _local_8460;
        uStack_8448._0_4_ = fStack_5248 + (float)uStack_8308 + (float)uStack_8368;
        uStack_8448._4_4_ = fStack_8524 + uStack_8368._4_4_ + 0.6933594;
        auVar54 = _local_8460;
        local_6ec0 = local_8460;
        uStack_6eb8 = uStack_8458;
        uStack_8450 = auVar38._16_8_;
        uStack_6eb0 = uStack_8450;
        uStack_8448 = auVar54._24_8_;
        uStack_6ea8 = uStack_8448;
        local_6ee0 = local_84c0._0_8_;
        uStack_6ed8 = local_84c0._8_8_;
        uStack_6ed0 = local_84c0._16_8_;
        uStack_6ec8 = local_84c0._24_8_;
        auVar68._16_8_ = uStack_8450;
        auVar68._0_16_ = _local_8460;
        auVar68._24_8_ = uStack_8448;
        _local_8560 = vorps_avx(auVar68,local_84c0);
        local_87e0 = local_8560;
        uStack_87d8 = uStack_8558;
        uStack_87d0 = uStack_8550;
        uStack_87c8 = uStack_8548;
        local_7df4 = 0x3f800000;
        local_2b40 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        local_2b60 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auStack_2b50 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        local_8800 = local_2b60._0_8_;
        uStack_87f8 = local_2b60._8_8_;
        uStack_87f0 = auStack_2b50._0_8_;
        uStack_87e8 = auStack_2b50._8_8_;
        local_7df8 = 0x40000000;
        local_2af0 = 0x40000000;
        auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
        local_2b20 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
        auStack_2b10 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
        local_8820 = local_2b20._0_8_;
        uStack_8818 = local_2b20._8_8_;
        uStack_8810 = auStack_2b10._0_8_;
        uStack_8808 = auStack_2b10._8_8_;
        local_8760._0_4_ = local_8560._0_4_;
        local_8760._4_4_ = local_8560._4_4_;
        uStack_8758._0_4_ = local_8560._8_4_;
        uStack_8758._4_4_ = local_8560._12_4_;
        uStack_8750._0_4_ = local_8560._16_4_;
        uStack_8750._4_4_ = local_8560._20_4_;
        uStack_8748._0_4_ = local_8560._24_4_;
        uStack_8748._4_4_ = local_8560._28_4_;
        uStack_7ba4 = uStack_8748._4_4_;
        local_8780._0_4_ = local_2b20._0_4_;
        local_8780._4_4_ = local_2b20._4_4_;
        uStack_8778._0_4_ = local_2b20._8_4_;
        uStack_8778._4_4_ = local_2b20._12_4_;
        uStack_8770._0_4_ = auStack_2b10._0_4_;
        uStack_8770._4_4_ = auStack_2b10._4_4_;
        uStack_8768._0_4_ = auStack_2b10._8_4_;
        local_7bc0 = (float)local_8760 * (float)local_8780;
        fStack_7bbc = local_8760._4_4_ * local_8780._4_4_;
        fStack_7bb8 = (float)uStack_8758 * (float)uStack_8778;
        fStack_7bb4 = uStack_8758._4_4_ * uStack_8778._4_4_;
        fStack_7bb0 = (float)uStack_8750 * (float)uStack_8770;
        fStack_7bac = uStack_8750._4_4_ * uStack_8770._4_4_;
        fStack_7ba8 = (float)uStack_8748 * (float)uStack_8768;
        local_7984 = 0x3f800000;
        local_2c80 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        local_2ca0 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auStack_2c90 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        local_7be0 = local_2ca0._0_8_;
        uStack_7bd8 = local_2ca0._8_8_;
        uStack_7bd0 = auStack_2c90._0_8_;
        uStack_7bc8 = auStack_2c90._8_8_;
        local_75c0._16_8_ = auStack_2c90._0_8_;
        local_75c0._0_16_ = local_2ca0;
        local_75c0._24_8_ = auStack_2c90._8_8_;
        local_7920 = 0;
        uStack_7918 = uStack_9058;
        uStack_7910 = 0;
        uStack_7908 = 0;
        local_7940 = CONCAT44(fStack_7bbc,local_7bc0);
        uStack_7938 = CONCAT44(fStack_7bb4,fStack_7bb8);
        uStack_7930 = CONCAT44(fStack_7bac,fStack_7bb0);
        uStack_7928 = CONCAT44(uStack_8748._4_4_,fStack_7ba8);
        auVar47._8_8_ = uStack_7938;
        auVar47._0_8_ = local_7940;
        auVar47._16_8_ = uStack_7930;
        auVar47._24_8_ = uStack_7928;
        auVar3 = vsubps_avx(ZEXT832(uStack_9058) << 0x40,auVar47);
        local_7560 = 0;
        uStack_7558 = uStack_9058;
        uStack_7550 = 0;
        uStack_7548 = 0;
        local_34a0 = 0x7f0000007f;
        uStack_3498 = 0x7f0000007f;
        uStack_3490 = 0x7f0000007f;
        uStack_3488 = 0x7f0000007f;
        local_7a80._0_8_ = auVar3._0_8_;
        local_3780 = local_7a80._0_8_;
        local_7a80._8_8_ = auVar3._8_8_;
        uStack_3778 = local_7a80._8_8_;
        local_7a80._16_8_ = auVar3._16_8_;
        uStack_3770 = local_7a80._16_8_;
        local_7a80._24_8_ = auVar3._24_8_;
        uStack_3768 = local_7a80._24_8_;
        auVar91._8_8_ = 0x42b0c0a542b0c0a5;
        auVar91._0_8_ = 0x42b0c0a542b0c0a5;
        auVar91._16_8_ = 0x42b0c0a542b0c0a5;
        auVar91._24_8_ = 0x42b0c0a542b0c0a5;
        auVar3 = vminps_avx(auVar3,auVar91);
        local_7a80._0_8_ = auVar3._0_8_;
        local_7440 = local_7a80._0_8_;
        local_7a80._8_8_ = auVar3._8_8_;
        uStack_7438 = local_7a80._8_8_;
        local_7a80._16_8_ = auVar3._16_8_;
        uStack_7430 = local_7a80._16_8_;
        local_7a80._24_8_ = auVar3._24_8_;
        uStack_7428 = local_7a80._24_8_;
        auVar53._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar53._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar53._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar53._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar2 = vmaxps_avx(auVar3,auVar53);
        local_7a80._0_8_ = auVar2._0_8_;
        local_6000 = local_7a80._0_8_;
        local_7a80._8_8_ = auVar2._8_8_;
        uStack_5ff8 = local_7a80._8_8_;
        local_7a80._16_8_ = auVar2._16_8_;
        uStack_5ff0 = local_7a80._16_8_;
        local_7a80._24_8_ = auVar2._24_8_;
        uStack_5fe8 = local_7a80._24_8_;
        uVar26 = local_7a80._0_8_;
        uVar27 = local_7a80._8_8_;
        uVar28 = local_7a80._16_8_;
        uVar29 = local_7a80._24_8_;
        local_5fe0 = 0x3fb8aa3b3fb8aa3b;
        uStack_5fd8 = 0x3fb8aa3b3fb8aa3b;
        uStack_5fd0 = 0x3fb8aa3b3fb8aa3b;
        uStack_5fc8 = 0x3fb8aa3b3fb8aa3b;
        local_5fc0._0_4_ = auVar2._0_4_;
        local_5fc0._4_4_ = auVar2._4_4_;
        uStack_5fb8._0_4_ = auVar2._8_4_;
        uStack_5fb8._4_4_ = auVar2._12_4_;
        uStack_5fb0._0_4_ = auVar2._16_4_;
        uStack_5fb0._4_4_ = auVar2._20_4_;
        uStack_5fa8._0_4_ = auVar2._24_4_;
        uStack_5f64 = 0x3fb8aa3b;
        local_5f80 = (float)local_5fc0 * 1.442695;
        fStack_5f7c = local_5fc0._4_4_ * 1.442695;
        fStack_5f78 = (float)uStack_5fb8 * 1.442695;
        fStack_5f74 = uStack_5fb8._4_4_ * 1.442695;
        fStack_5f70 = (float)uStack_5fb0 * 1.442695;
        fStack_5f6c = uStack_5fb0._4_4_ * 1.442695;
        fStack_5f68 = (float)uStack_5fa8 * 1.442695;
        local_5fa0 = 0x3f0000003f000000;
        uStack_5f98 = 0x3f0000003f000000;
        uStack_5f90 = 0x3f0000003f000000;
        uStack_5f88 = 0x3f0000003f000000;
        local_7ac0._4_4_ = fStack_5f7c + 0.5;
        local_7ac0._0_4_ = local_5f80 + 0.5;
        uStack_7ab8._0_4_ = fStack_5f78 + 0.5;
        uStack_7ab8._4_4_ = fStack_5f74 + 0.5;
        uStack_7ab0._0_4_ = fStack_5f70 + 0.5;
        uStack_7ab0._4_4_ = fStack_5f6c + 0.5;
        uStack_7aa8._0_4_ = fStack_5f68 + 0.5;
        uStack_7aa8._4_4_ = 0x3ff8aa3b;
        auVar9 = vroundps_avx(_local_7ac0,1);
        auVar3 = vcmpps_avx(_local_7ac0,auVar9,1);
        local_7b20._0_8_ = auVar3._0_8_;
        local_7100 = local_7b20._0_8_;
        local_7b20._8_8_ = auVar3._8_8_;
        uStack_70f8 = local_7b20._8_8_;
        local_7b20._16_8_ = auVar3._16_8_;
        uStack_70f0 = local_7b20._16_8_;
        local_7b20._24_8_ = auVar3._24_8_;
        uStack_70e8 = local_7b20._24_8_;
        local_7120 = 0x3f8000003f800000;
        uStack_7118 = 0x3f8000003f800000;
        uStack_7110 = 0x3f8000003f800000;
        uStack_7108 = 0x3f8000003f800000;
        auVar61._8_8_ = 0x3f8000003f800000;
        auVar61._0_8_ = 0x3f8000003f800000;
        auVar61._16_8_ = 0x3f8000003f800000;
        auVar61._24_8_ = 0x3f8000003f800000;
        local_7b20 = vandps_avx(auVar3,auVar61);
        local_7aa0 = auVar9._0_8_;
        local_7960 = local_7aa0;
        uStack_7a98 = auVar9._8_8_;
        uStack_7958 = uStack_7a98;
        uStack_7a90 = auVar9._16_8_;
        uStack_7950 = uStack_7a90;
        uStack_7a88 = auVar9._24_8_;
        uStack_7948 = uStack_7a88;
        local_7980 = local_7b20._0_8_;
        uStack_7978 = local_7b20._8_8_;
        uStack_7970 = local_7b20._16_8_;
        uStack_7968 = local_7b20._24_8_;
        _local_7ac0 = vsubps_avx(auVar9,local_7b20);
        local_3ec0 = local_7ac0;
        uStack_3eb8 = uStack_7ab8;
        uStack_3eb0 = uStack_7ab0;
        uStack_3ea8 = uStack_7aa8;
        local_3f00 = local_7a80._0_8_;
        uStack_3ef8 = local_7a80._8_8_;
        uStack_3ef0 = local_7a80._16_8_;
        uStack_3ee8 = local_7a80._24_8_;
        local_3e40 = local_7a80._0_8_;
        uStack_3e38 = local_7a80._8_8_;
        uStack_3e30 = local_7a80._16_8_;
        uStack_3e28 = local_7a80._24_8_;
        local_3ea0 = 0x3f3180003f318000;
        uStack_3e98 = 0x3f3180003f318000;
        uStack_3e90 = 0x3f3180003f318000;
        uStack_3e88 = 0x3f3180003f318000;
        local_3e80._0_4_ = local_7ac0._0_4_;
        local_3e80._4_4_ = local_7ac0._4_4_;
        uStack_3e78._0_4_ = local_7ac0._8_4_;
        uStack_3e78._4_4_ = local_7ac0._12_4_;
        uStack_3e70._0_4_ = local_7ac0._16_4_;
        uStack_3e70._4_4_ = local_7ac0._20_4_;
        uStack_3e68._0_4_ = local_7ac0._24_4_;
        uStack_3e68._4_4_ = local_7ac0._28_4_;
        fStack_3e44 = uStack_3e68._4_4_;
        local_3e60 = (float)local_3e80 * 0.6933594;
        fStack_3e5c = local_3e80._4_4_ * 0.6933594;
        fStack_3e58 = (float)uStack_3e78 * 0.6933594;
        fStack_3e54 = uStack_3e78._4_4_ * 0.6933594;
        fStack_3e50 = (float)uStack_3e70 * 0.6933594;
        fStack_3e4c = uStack_3e70._4_4_ * 0.6933594;
        fStack_3e48 = (float)uStack_3e68 * 0.6933594;
        auVar77._4_4_ = fStack_3e5c;
        auVar77._0_4_ = local_3e60;
        auVar77._8_4_ = fStack_3e58;
        auVar77._12_4_ = fStack_3e54;
        auVar77._16_4_ = fStack_3e50;
        auVar77._20_4_ = fStack_3e4c;
        auVar77._24_4_ = fStack_3e48;
        auVar77._28_4_ = uStack_3e68._4_4_;
        auVar3 = vsubps_avx(auVar2,auVar77);
        local_3fa0 = local_7ac0;
        uStack_3f98 = uStack_7ab8;
        uStack_3f90 = uStack_7ab0;
        uStack_3f88 = uStack_7aa8;
        local_7a80._0_8_ = auVar3._0_8_;
        local_3fe0 = local_7a80._0_8_;
        local_7a80._8_8_ = auVar3._8_8_;
        uStack_3fd8 = local_7a80._8_8_;
        local_7a80._16_8_ = auVar3._16_8_;
        uStack_3fd0 = local_7a80._16_8_;
        local_7a80._24_8_ = auVar3._24_8_;
        uStack_3fc8 = local_7a80._24_8_;
        local_3f20 = local_7a80._0_8_;
        uStack_3f18 = local_7a80._8_8_;
        uStack_3f10 = local_7a80._16_8_;
        uStack_3f08 = local_7a80._24_8_;
        local_3f60 = local_7ac0;
        uStack_3f58 = uStack_7ab8;
        uStack_3f50 = uStack_7ab0;
        uStack_3f48 = uStack_7aa8;
        local_3f80 = 0xb95e8083b95e8083;
        uStack_3f78 = 0xb95e8083b95e8083;
        uStack_3f70 = 0xb95e8083b95e8083;
        uStack_3f68 = 0xb95e8083b95e8083;
        fStack_3f24 = uStack_3e68._4_4_;
        local_3f40 = (float)local_3e80 * -0.00021219444;
        fStack_3f3c = local_3e80._4_4_ * -0.00021219444;
        fStack_3f38 = (float)uStack_3e78 * -0.00021219444;
        fStack_3f34 = uStack_3e78._4_4_ * -0.00021219444;
        fStack_3f30 = (float)uStack_3e70 * -0.00021219444;
        fStack_3f2c = uStack_3e70._4_4_ * -0.00021219444;
        fStack_3f28 = (float)uStack_3e68 * -0.00021219444;
        auVar76._4_4_ = fStack_3f3c;
        auVar76._0_4_ = local_3f40;
        auVar76._8_4_ = fStack_3f38;
        auVar76._12_4_ = fStack_3f34;
        auVar76._16_4_ = fStack_3f30;
        auVar76._20_4_ = fStack_3f2c;
        auVar76._24_4_ = fStack_3f28;
        auVar76._28_4_ = uStack_3e68._4_4_;
        local_7a80 = vsubps_avx(auVar3,auVar76);
        local_7a20 = local_7a80._0_8_;
        uStack_7a18 = local_7a80._8_8_;
        uStack_7a10 = local_7a80._16_8_;
        uStack_7a08 = local_7a80._24_8_;
        local_7a00._0_4_ = local_7a80._0_4_;
        local_7a00._4_4_ = local_7a80._4_4_;
        uStack_79f8._0_4_ = local_7a80._8_4_;
        uStack_79f8._4_4_ = local_7a80._12_4_;
        uStack_79f0._0_4_ = local_7a80._16_4_;
        uStack_79f0._4_4_ = local_7a80._20_4_;
        uStack_79e8._0_4_ = local_7a80._24_4_;
        uStack_79e8._4_4_ = local_7a80._28_4_;
        local_7aa0 = CONCAT44(local_7a00._4_4_ * local_7a00._4_4_,
                              (float)local_7a00 * (float)local_7a00);
        uStack_7a98._0_4_ = (float)uStack_79f8 * (float)uStack_79f8;
        uStack_7a98._4_4_ = uStack_79f8._4_4_ * uStack_79f8._4_4_;
        uStack_7a90._0_4_ = (float)uStack_79f0 * (float)uStack_79f0;
        uStack_7a90._4_4_ = uStack_79f0._4_4_ * uStack_79f0._4_4_;
        auVar184 = _local_7aa0;
        uStack_7a88._0_4_ = (float)uStack_79e8 * (float)uStack_79e8;
        uStack_7a88._4_4_ = uStack_79e8._4_4_;
        auVar2 = _local_7aa0;
        auVar5._8_4_ = 0x39506967;
        auVar5._0_8_ = 0x3950696739506967;
        auVar5._12_4_ = 0x39506967;
        auVar38._16_4_ = 0x39506967;
        auVar38._0_16_ = auVar5;
        auVar38._20_4_ = 0x39506967;
        auVar37._24_4_ = 0x39506967;
        auVar37._0_24_ = auVar38;
        auVar37._28_4_ = 0x39506967;
        local_6100 = local_7a80._0_8_;
        uStack_60f8 = local_7a80._8_8_;
        uStack_60f0 = local_7a80._16_8_;
        uStack_60e8 = local_7a80._24_8_;
        local_60a0 = 0x3950696739506967;
        local_60e0._8_8_ = auVar5._8_8_;
        uStack_6098 = local_60e0._8_8_;
        local_60e0._16_8_ = auVar38._16_8_;
        uStack_6090 = local_60e0._16_8_;
        local_60e0._24_8_ = auVar37._24_8_;
        uStack_6088 = local_60e0._24_8_;
        local_60c0 = local_7a80._0_8_;
        uStack_60b8 = local_7a80._8_8_;
        uStack_60b0 = local_7a80._16_8_;
        uStack_60a8 = local_7a80._24_8_;
        fStack_6044 = uStack_79e8._4_4_;
        local_6060 = (float)local_7a00 * 0.00019875691;
        fStack_605c = local_7a00._4_4_ * 0.00019875691;
        fStack_6058 = (float)uStack_79f8 * 0.00019875691;
        fStack_6054 = uStack_79f8._4_4_ * 0.00019875691;
        fStack_6050 = (float)uStack_79f0 * 0.00019875691;
        fStack_604c = uStack_79f0._4_4_ * 0.00019875691;
        fStack_6048 = (float)uStack_79e8 * 0.00019875691;
        local_6080 = 0x3ab743ce3ab743ce;
        uStack_6078 = 0x3ab743ce3ab743ce;
        uStack_6070 = 0x3ab743ce3ab743ce;
        uStack_6068 = 0x3ab743ce3ab743ce;
        local_6180 = CONCAT44(fStack_605c + 0.0013981999,local_6060 + 0.0013981999);
        auVar6._8_4_ = fStack_6058 + 0.0013981999;
        auVar6._0_8_ = local_6180;
        auVar6._12_4_ = fStack_6054 + 0.0013981999;
        auVar40._16_4_ = fStack_6050 + 0.0013981999;
        auVar40._0_16_ = auVar6;
        auVar40._20_4_ = fStack_604c + 0.0013981999;
        auVar39._24_4_ = fStack_6048 + 0.0013981999;
        auVar39._0_24_ = auVar40;
        auVar39._28_4_ = uStack_79e8._4_4_ + 0.0013981999;
        local_61e0 = local_7a80._0_8_;
        uStack_61d8 = local_7a80._8_8_;
        uStack_61d0 = local_7a80._16_8_;
        uStack_61c8 = local_7a80._24_8_;
        local_61c0._8_8_ = auVar6._8_8_;
        uStack_6178 = local_61c0._8_8_;
        local_61c0._16_8_ = auVar40._16_8_;
        uStack_6170 = local_61c0._16_8_;
        local_61c0._24_8_ = auVar39._24_8_;
        uStack_6168 = local_61c0._24_8_;
        local_61a0 = local_7a80._0_8_;
        uStack_6198 = local_7a80._8_8_;
        uStack_6190 = local_7a80._16_8_;
        uStack_6188 = local_7a80._24_8_;
        fStack_6124 = uStack_79e8._4_4_;
        local_6140 = (float)local_7a00 * (local_6060 + 0.0013981999);
        fStack_613c = local_7a00._4_4_ * (fStack_605c + 0.0013981999);
        fStack_6138 = (float)uStack_79f8 * (fStack_6058 + 0.0013981999);
        fStack_6134 = uStack_79f8._4_4_ * (fStack_6054 + 0.0013981999);
        fStack_6130 = (float)uStack_79f0 * (fStack_6050 + 0.0013981999);
        fStack_612c = uStack_79f0._4_4_ * (fStack_604c + 0.0013981999);
        fStack_6128 = (float)uStack_79e8 * (fStack_6048 + 0.0013981999);
        local_6160 = 0x3c0889083c088908;
        uStack_6158 = 0x3c0889083c088908;
        uStack_6150 = 0x3c0889083c088908;
        uStack_6148 = 0x3c0889083c088908;
        local_6260 = CONCAT44(fStack_613c + 0.008333452,local_6140 + 0.008333452);
        auVar1._8_4_ = fStack_6138 + 0.008333452;
        auVar1._0_8_ = local_6260;
        auVar1._12_4_ = fStack_6134 + 0.008333452;
        auVar42._16_4_ = fStack_6130 + 0.008333452;
        auVar42._0_16_ = auVar1;
        auVar42._20_4_ = fStack_612c + 0.008333452;
        auVar41._24_4_ = fStack_6128 + 0.008333452;
        auVar41._0_24_ = auVar42;
        auVar41._28_4_ = uStack_79e8._4_4_ + 0.008333452;
        local_62c0 = local_7a80._0_8_;
        uStack_62b8 = local_7a80._8_8_;
        uStack_62b0 = local_7a80._16_8_;
        uStack_62a8 = local_7a80._24_8_;
        local_62a0._8_8_ = auVar1._8_8_;
        uStack_6258 = local_62a0._8_8_;
        local_62a0._16_8_ = auVar42._16_8_;
        uStack_6250 = local_62a0._16_8_;
        local_62a0._24_8_ = auVar41._24_8_;
        uStack_6248 = local_62a0._24_8_;
        local_6280 = local_7a80._0_8_;
        uStack_6278 = local_7a80._8_8_;
        uStack_6270 = local_7a80._16_8_;
        uStack_6268 = local_7a80._24_8_;
        fStack_6204 = uStack_79e8._4_4_;
        local_6220 = (local_6140 + 0.008333452) * (float)local_7a00;
        fStack_621c = (fStack_613c + 0.008333452) * local_7a00._4_4_;
        fStack_6218 = (fStack_6138 + 0.008333452) * (float)uStack_79f8;
        fStack_6214 = (fStack_6134 + 0.008333452) * uStack_79f8._4_4_;
        fStack_6210 = (fStack_6130 + 0.008333452) * (float)uStack_79f0;
        fStack_620c = (fStack_612c + 0.008333452) * uStack_79f0._4_4_;
        fStack_6208 = (fStack_6128 + 0.008333452) * (float)uStack_79e8;
        local_6240 = 0x3d2aa9c13d2aa9c1;
        uStack_6238 = 0x3d2aa9c13d2aa9c1;
        uStack_6230 = 0x3d2aa9c13d2aa9c1;
        uStack_6228 = 0x3d2aa9c13d2aa9c1;
        local_6340 = CONCAT44(fStack_621c + 0.041665796,local_6220 + 0.041665796);
        auVar7._8_4_ = fStack_6218 + 0.041665796;
        auVar7._0_8_ = local_6340;
        auVar7._12_4_ = fStack_6214 + 0.041665796;
        auVar44._16_4_ = fStack_6210 + 0.041665796;
        auVar44._0_16_ = auVar7;
        auVar44._20_4_ = fStack_620c + 0.041665796;
        auVar43._24_4_ = fStack_6208 + 0.041665796;
        auVar43._0_24_ = auVar44;
        auVar43._28_4_ = uStack_79e8._4_4_ + 0.041665796;
        local_63a0 = local_7a80._0_8_;
        uStack_6398 = local_7a80._8_8_;
        uStack_6390 = local_7a80._16_8_;
        uStack_6388 = local_7a80._24_8_;
        local_6380._8_8_ = auVar7._8_8_;
        uStack_6338 = local_6380._8_8_;
        local_6380._16_8_ = auVar44._16_8_;
        uStack_6330 = local_6380._16_8_;
        local_6380._24_8_ = auVar43._24_8_;
        uStack_6328 = local_6380._24_8_;
        local_6360 = local_7a80._0_8_;
        uStack_6358 = local_7a80._8_8_;
        uStack_6350 = local_7a80._16_8_;
        uStack_6348 = local_7a80._24_8_;
        fStack_62e4 = uStack_79e8._4_4_;
        local_6300 = (local_6220 + 0.041665796) * (float)local_7a00;
        fStack_62fc = (fStack_621c + 0.041665796) * local_7a00._4_4_;
        fStack_62f8 = (fStack_6218 + 0.041665796) * (float)uStack_79f8;
        fStack_62f4 = (fStack_6214 + 0.041665796) * uStack_79f8._4_4_;
        fStack_62f0 = (fStack_6210 + 0.041665796) * (float)uStack_79f0;
        fStack_62ec = (fStack_620c + 0.041665796) * uStack_79f0._4_4_;
        fStack_62e8 = (fStack_6208 + 0.041665796) * (float)uStack_79e8;
        local_6320 = 0x3e2aaaaa3e2aaaaa;
        uStack_6318 = 0x3e2aaaaa3e2aaaaa;
        uStack_6310 = 0x3e2aaaaa3e2aaaaa;
        uStack_6308 = 0x3e2aaaaa3e2aaaaa;
        local_6460 = CONCAT44(fStack_62fc + 0.16666666,local_6300 + 0.16666666);
        uStack_6458 = CONCAT44(fStack_62f4 + 0.16666666,fStack_62f8 + 0.16666666);
        uStack_6450 = CONCAT44(fStack_62ec + 0.16666666,fStack_62f0 + 0.16666666);
        uStack_6448 = CONCAT44(uStack_79e8._4_4_ + 0.16666666,fStack_62e8 + 0.16666666);
        local_6480 = local_7a80._0_8_;
        uStack_6478 = local_7a80._8_8_;
        uStack_6470 = local_7a80._16_8_;
        uStack_6468 = local_7a80._24_8_;
        local_6440 = local_7a80._0_8_;
        uStack_6438 = local_7a80._8_8_;
        uStack_6430 = local_7a80._16_8_;
        uStack_6428 = local_7a80._24_8_;
        fStack_63c4 = uStack_79e8._4_4_;
        local_63e0 = (local_6300 + 0.16666666) * (float)local_7a00;
        fStack_63dc = (fStack_62fc + 0.16666666) * local_7a00._4_4_;
        fStack_63d8 = (fStack_62f8 + 0.16666666) * (float)uStack_79f8;
        fStack_63d4 = (fStack_62f4 + 0.16666666) * uStack_79f8._4_4_;
        fStack_63d0 = (fStack_62f0 + 0.16666666) * (float)uStack_79f0;
        fStack_63cc = (fStack_62ec + 0.16666666) * uStack_79f0._4_4_;
        fStack_63c8 = (fStack_62e8 + 0.16666666) * (float)uStack_79e8;
        local_6400 = 0x3f0000003f000000;
        uStack_63f8 = 0x3f0000003f000000;
        uStack_63f0 = 0x3f0000003f000000;
        uStack_63e8 = 0x3f0000003f000000;
        local_6500 = CONCAT44(fStack_63dc + 0.5,local_63e0 + 0.5);
        auVar8._8_4_ = fStack_63d8 + 0.5;
        auVar8._0_8_ = local_6500;
        auVar8._12_4_ = fStack_63d4 + 0.5;
        auVar46._16_4_ = fStack_63d0 + 0.5;
        auVar46._0_16_ = auVar8;
        auVar46._20_4_ = fStack_63cc + 0.5;
        auVar45._24_4_ = fStack_63c8 + 0.5;
        auVar45._0_24_ = auVar46;
        auVar45._28_4_ = uStack_79e8._4_4_ + 0.5;
        local_6560 = local_7aa0;
        uStack_6558 = uStack_7a98;
        uStack_7a90 = auVar184._16_8_;
        uStack_6550 = uStack_7a90;
        uStack_7a88 = auVar2._24_8_;
        uStack_6548 = uStack_7a88;
        local_6580 = local_7a80._0_8_;
        uStack_6578 = local_7a80._8_8_;
        uStack_6570 = local_7a80._16_8_;
        uStack_6568 = local_7a80._24_8_;
        local_6540._8_8_ = auVar8._8_8_;
        uStack_64f8 = local_6540._8_8_;
        local_6540._16_8_ = auVar46._16_8_;
        uStack_64f0 = local_6540._16_8_;
        local_6540._24_8_ = auVar45._24_8_;
        uStack_64e8 = local_6540._24_8_;
        local_6520 = local_7aa0;
        uStack_6518 = uStack_7a98;
        uStack_6510 = uStack_7a90;
        uStack_6508 = uStack_7a88;
        fStack_64a4 = uStack_79e8._4_4_;
        local_64c0 = (local_63e0 + 0.5) * (float)local_7a00 * (float)local_7a00;
        fStack_64bc = (fStack_63dc + 0.5) * local_7a00._4_4_ * local_7a00._4_4_;
        fStack_64b8 = (fStack_63d8 + 0.5) * (float)uStack_79f8 * (float)uStack_79f8;
        fStack_64b4 = (fStack_63d4 + 0.5) * uStack_79f8._4_4_ * uStack_79f8._4_4_;
        fStack_64b0 = (fStack_63d0 + 0.5) * (float)uStack_79f0 * (float)uStack_79f0;
        fStack_64ac = (fStack_63cc + 0.5) * uStack_79f0._4_4_ * uStack_79f0._4_4_;
        fStack_64a8 = (fStack_63c8 + 0.5) * (float)uStack_79e8 * (float)uStack_79e8;
        local_64e0 = local_7a80._0_8_;
        uStack_64d8 = local_7a80._8_8_;
        uStack_64d0 = local_7a80._16_8_;
        uStack_64c8 = local_7a80._24_8_;
        local_79c0 = CONCAT44(fStack_64bc + local_7a00._4_4_,local_64c0 + (float)local_7a00);
        uStack_79b8 = CONCAT44(fStack_64b4 + uStack_79f8._4_4_,fStack_64b8 + (float)uStack_79f8);
        uStack_79b0 = CONCAT44(fStack_64ac + uStack_79f0._4_4_,fStack_64b0 + (float)uStack_79f0);
        uStack_79a8 = CONCAT44(uStack_79e8._4_4_ + uStack_79e8._4_4_,
                               fStack_64a8 + (float)uStack_79e8);
        local_79e0 = 0x3f8000003f800000;
        uStack_79d8 = 0x3f8000003f800000;
        uStack_79d0 = 0x3f8000003f800000;
        uStack_79c8 = 0x3f8000003f800000;
        local_7b40 = local_64c0 + (float)local_7a00 + 1.0;
        fStack_7b3c = fStack_64bc + local_7a00._4_4_ + 1.0;
        fStack_7b38 = fStack_64b8 + (float)uStack_79f8 + 1.0;
        fStack_7b34 = fStack_64b4 + uStack_79f8._4_4_ + 1.0;
        fStack_7b30 = fStack_64b0 + (float)uStack_79f0 + 1.0;
        fStack_7b2c = fStack_64ac + uStack_79f0._4_4_ + 1.0;
        fStack_7b28 = fStack_64a8 + (float)uStack_79e8 + 1.0;
        fStack_7b24 = uStack_79e8._4_4_ + uStack_79e8._4_4_ + 1.0;
        local_36c0 = local_7ac0;
        uStack_36b8 = uStack_7ab8;
        uStack_36b0 = uStack_7ab0;
        uStack_36a8 = uStack_7aa8;
        local_7ae0 = CONCAT44((int)local_3e80._4_4_,(int)(float)local_3e80);
        uStack_7ad8 = CONCAT44((int)uStack_3e78._4_4_,(int)(float)uStack_3e78);
        uStack_7ad0 = CONCAT44((int)uStack_3e70._4_4_,(int)(float)uStack_3e70);
        uStack_7ac8 = CONCAT44((int)uStack_3e68._4_4_,(int)(float)uStack_3e68);
        local_3480 = local_7ae0;
        uStack_3478 = uStack_7ad8;
        uStack_3470 = uStack_7ad0;
        uStack_3468 = uStack_7ac8;
        local_3520 = local_7ae0;
        uStack_3518 = uStack_7ad8;
        uStack_3510 = uStack_7ad0;
        uStack_3508 = uStack_7ac8;
        local_3540 = 0x7f0000007f;
        uStack_3538 = 0x7f0000007f;
        uStack_3530 = 0x7f0000007f;
        uStack_3528 = 0x7f0000007f;
        local_34d0 = 0x7f0000007f;
        uStack_34c8 = 0x7f0000007f;
        local_34e0 = 0x7f0000007f;
        uStack_34d8 = 0x7f0000007f;
        local_2e30 = local_7ae0;
        uStack_2e28 = uStack_7ad8;
        local_2e40 = 0x7f0000007f;
        uStack_2e38 = 0x7f0000007f;
        auVar105._8_8_ = uStack_7ad8;
        auVar105._0_8_ = local_7ae0;
        auVar104._8_8_ = 0x7f0000007f;
        auVar104._0_8_ = 0x7f0000007f;
        local_34b0 = vpaddd_avx(auVar105,auVar104);
        local_2e50 = uStack_7ad0;
        uStack_2e48 = uStack_7ac8;
        local_2e60 = 0x7f0000007f;
        uStack_2e58 = 0x7f0000007f;
        auVar103._8_8_ = uStack_7ac8;
        auVar103._0_8_ = uStack_7ad0;
        auVar102._8_8_ = 0x7f0000007f;
        auVar102._0_8_ = 0x7f0000007f;
        local_34c0 = vpaddd_avx(auVar103,auVar102);
        local_3560 = local_34b0._0_8_;
        uStack_3558 = local_34b0._8_8_;
        uStack_3550 = local_34c0._0_8_;
        uStack_3548 = local_34c0._8_8_;
        local_3500 = local_34b0._0_8_;
        uStack_34f8 = local_34b0._8_8_;
        uStack_34f0 = local_34c0._0_8_;
        uStack_34e8 = local_34c0._8_8_;
        local_3100 = local_34b0._0_8_;
        uStack_30f8 = local_34b0._8_8_;
        uStack_30f0 = local_34c0._0_8_;
        uStack_30e8 = local_34c0._8_8_;
        local_3104 = 0x17;
        local_3180 = local_34b0._0_8_;
        uStack_3178 = local_34b0._8_8_;
        uStack_3170 = local_34c0._0_8_;
        uStack_3168 = local_34c0._8_8_;
        local_2d30 = local_34b0._0_8_;
        uStack_2d28 = local_34b0._8_8_;
        local_2d34 = 0x17;
        local_3120 = vpslld_avx(local_34b0,ZEXT416(0x17));
        local_2d50 = local_34c0._0_8_;
        uStack_2d48 = local_34c0._8_8_;
        local_2d54 = 0x17;
        local_3130 = vpslld_avx(local_34c0,ZEXT416(0x17));
        local_31a0 = local_3120._0_8_;
        uStack_3198 = local_3120._8_8_;
        uStack_3190 = local_3130._0_8_;
        uStack_3188 = local_3130._8_8_;
        local_3160 = local_3120._0_8_;
        uStack_3158 = local_3120._8_8_;
        uStack_3150 = local_3130._0_8_;
        uStack_3148 = local_3130._8_8_;
        local_7ae0 = local_3120._0_8_;
        uStack_7ad8 = local_3120._8_8_;
        uStack_7ad0 = local_3130._0_8_;
        uStack_7ac8 = local_3130._8_8_;
        local_2f40 = local_3120._0_8_;
        uStack_2f38 = local_3120._8_8_;
        uStack_2f30 = local_3130._0_8_;
        uStack_2f28 = local_3130._8_8_;
        local_7b60 = local_3120._0_8_;
        uStack_7b58 = local_3120._8_8_;
        uStack_7b50 = local_3130._0_8_;
        uStack_7b48 = local_3130._8_8_;
        local_7a40._4_4_ = fStack_7b3c;
        local_7a40._0_4_ = local_7b40;
        local_7a40._8_4_ = fStack_7b38;
        local_7a40._12_4_ = fStack_7b34;
        local_7a40._16_4_ = fStack_7b30;
        local_7a40._20_4_ = fStack_7b2c;
        local_7a40._24_4_ = fStack_7b28;
        local_7a40._28_4_ = fStack_7b24;
        local_7a60._0_4_ = local_3120._0_4_;
        local_7a60._4_4_ = local_3120._4_4_;
        uStack_7a58._0_4_ = local_3120._8_4_;
        uStack_7a58._4_4_ = local_3120._12_4_;
        uStack_7a50._0_4_ = local_3130._0_4_;
        uStack_7a50._4_4_ = local_3130._4_4_;
        uStack_7a48._0_4_ = local_3130._8_4_;
        local_7b40 = local_7b40 * (float)local_7a60;
        fStack_7b3c = fStack_7b3c * local_7a60._4_4_;
        fStack_7b38 = fStack_7b38 * (float)uStack_7a58;
        fStack_7b34 = fStack_7b34 * uStack_7a58._4_4_;
        fStack_7b30 = fStack_7b30 * (float)uStack_7a50;
        fStack_7b2c = fStack_7b2c * uStack_7a50._4_4_;
        fStack_7b28 = fStack_7b28 * (float)uStack_7a48;
        local_7ba0 = CONCAT44(fStack_7b3c,local_7b40);
        uStack_7b98 = CONCAT44(fStack_7b34,fStack_7b38);
        uStack_7b90 = CONCAT44(fStack_7b2c,fStack_7b30);
        uStack_7b88 = CONCAT44(fStack_7b24,fStack_7b28);
        local_7b80._0_4_ = local_2ca0._0_4_;
        local_7b80._4_4_ = local_2ca0._4_4_;
        fStack_7b78 = local_2ca0._8_4_;
        fStack_7b74 = local_2ca0._12_4_;
        fStack_7b70 = auStack_2c90._0_4_;
        fStack_7b6c = auStack_2c90._4_4_;
        fStack_7b68 = auStack_2c90._8_4_;
        fStack_7b64 = auStack_2c90._12_4_;
        local_75e0 = (float)local_7b80._0_4_ + local_7b40;
        fStack_75dc = (float)local_7b80._4_4_ + fStack_7b3c;
        fStack_75d8 = fStack_7b78 + fStack_7b38;
        fStack_75d4 = fStack_7b74 + fStack_7b34;
        fStack_75d0 = fStack_7b70 + fStack_7b30;
        fStack_75cc = fStack_7b6c + fStack_7b2c;
        fStack_75c8 = fStack_7b68 + fStack_7b28;
        fStack_75c4 = fStack_7b64 + fStack_7b24;
        auVar51._4_4_ = fStack_75dc;
        auVar51._0_4_ = local_75e0;
        auVar51._8_4_ = fStack_75d8;
        auVar51._12_4_ = fStack_75d4;
        auVar51._16_4_ = fStack_75d0;
        auVar51._20_4_ = fStack_75cc;
        auVar51._24_4_ = fStack_75c8;
        auVar51._28_4_ = fStack_75c4;
        _local_87a0 = vdivps_avx(local_75c0,auVar51);
        local_87c0 = local_2b20._0_8_;
        uStack_87b8 = local_2b20._8_8_;
        uStack_87b0 = auStack_2b10._0_8_;
        uStack_87a8 = auStack_2b10._8_8_;
        local_7c40._4_4_ = (float)local_87a0._4_4_ * local_8780._4_4_;
        local_7c40._0_4_ = (float)local_87a0._0_4_ * (float)local_8780;
        local_7c40._8_4_ = fStack_8798 * (float)uStack_8778;
        local_7c40._12_4_ = fStack_8794 * uStack_8778._4_4_;
        local_7c40._16_4_ = fStack_8790 * (float)uStack_8770;
        local_7c40._20_4_ = fStack_878c * uStack_8770._4_4_;
        local_7c40._24_4_ = fStack_8788 * (float)uStack_8768;
        local_7c40._28_4_ = local_87a0._28_4_;
        local_7c60 = local_2b60._0_8_;
        uStack_7c58 = local_2b60._8_8_;
        uStack_7c50 = auStack_2b50._0_8_;
        uStack_7c48 = auStack_2b50._8_8_;
        auVar4._16_8_ = auStack_2b50._0_8_;
        auVar4._0_16_ = local_2b60;
        auVar4._24_8_ = auStack_2b50._8_8_;
        _local_8940 = vsubps_avx(local_7c40,auVar4);
        local_8920._0_4_ = auVar179._0_4_;
        local_8920._4_4_ = auVar179._4_4_;
        fStack_8918 = auVar179._8_4_;
        fStack_8914 = auVar179._12_4_;
        fStack_8910 = auVar179._16_4_;
        fStack_890c = auVar179._20_4_;
        fStack_8908 = (float)uStack_8c48;
        uStack_8904 = (undefined4)((ulong)uStack_8c48 >> 0x20);
        local_8ee0 = CONCAT44((float)local_8920._4_4_ * (float)local_8940._4_4_,
                              (float)local_8920._0_4_ * (float)local_8940._0_4_);
        uStack_8ed8 = CONCAT44(fStack_8914 * fStack_8934,fStack_8918 * fStack_8938);
        uStack_8ed0 = CONCAT44(fStack_890c * fStack_892c,fStack_8910 * fStack_8930);
        uStack_8ec8 = CONCAT44(uStack_8904,fStack_8908 * fStack_8928);
        local_8be8 = local_8e60;
        local_8c20 = local_8ee0;
        uStack_8c18 = uStack_8ed8;
        uStack_8c10 = uStack_8ed0;
        uStack_8c08 = uStack_8ec8;
        auVar3._8_8_ = uStack_8ed8;
        auVar3._0_8_ = local_8ee0;
        auVar3._16_8_ = uStack_8ed0;
        auVar3._24_8_ = uStack_8ec8;
        *local_8e60 = auVar3;
        local_8e60 = local_8e60 + 1;
        _local_8920 = auVar30;
        local_8780 = local_2b20._0_8_;
        uStack_8778 = local_2b20._8_8_;
        uStack_8770 = auStack_2b10._0_8_;
        uStack_8768 = auStack_2b10._8_8_;
        local_8760 = local_8560;
        uStack_8758 = uStack_8558;
        uStack_8750 = uStack_8550;
        uStack_8748 = uStack_8548;
        _local_8460 = auVar54;
        local_83a0 = local_83c0;
        uStack_8398 = uStack_83b8;
        uStack_8390 = uStack_83b0;
        uStack_8388 = uStack_83a8;
        local_8380 = uVar22;
        uStack_8378 = uVar23;
        uStack_8370 = uVar24;
        uStack_8368 = uVar25;
        local_8340 = local_8520._0_8_;
        uStack_8338 = local_8520._8_8_;
        uStack_8330 = local_8520._16_8_;
        uStack_8328 = local_8520._24_8_;
        local_8320 = uVar18;
        uStack_8318 = uVar19;
        uStack_8310 = uVar20;
        uStack_8308 = uVar21;
        local_82e0 = uVar14;
        uStack_82d8 = uVar15;
        uStack_82d0 = uVar16;
        uStack_82c8 = uVar17;
        local_81c0 = local_2c60._0_8_;
        uStack_81b8 = local_2c60._8_8_;
        uStack_81b0 = auStack_2c50._0_8_;
        uStack_81a8 = auStack_2c50._8_8_;
        local_7f60 = local_84a0;
        uStack_7f58 = uStack_8498;
        uStack_7f50 = uStack_8490;
        uStack_7f48 = uStack_8488;
        _local_7f00 = auVar62;
        local_7ec0 = local_3060._0_8_;
        uStack_7eb8 = local_3060._8_8_;
        uStack_7eb0 = local_3070._0_8_;
        uStack_7ea8 = local_3070._8_8_;
        local_7e60 = local_7e80;
        uStack_7e58 = uStack_7e78;
        uStack_7e50 = uStack_7e70;
        uStack_7e48 = uStack_7e68;
        _local_7b80 = local_75c0;
        local_7b00 = local_84a0;
        uStack_7af8 = uStack_8498;
        uStack_7af0 = uStack_8490;
        uStack_7ae8 = uStack_8488;
        _local_7aa0 = auVar2;
        local_7a60 = local_3120._0_8_;
        uStack_7a58 = local_3120._8_8_;
        uStack_7a50 = local_3130._0_8_;
        uStack_7a48 = local_3130._8_8_;
        local_7a00 = local_7a20;
        uStack_79f8 = uStack_7a18;
        uStack_79f0 = uStack_7a10;
        uStack_79e8 = uStack_7a08;
        local_74e0 = local_7540;
        uStack_74d8 = uStack_7538;
        uStack_74d0 = uStack_7530;
        uStack_74c8 = uStack_7528;
        local_7420 = local_7460;
        uStack_7418 = uStack_7458;
        uStack_7410 = uStack_7450;
        uStack_7408 = uStack_7448;
        local_6540 = auVar45;
        local_64a0 = local_6ea0;
        uStack_6498 = uStack_6e98;
        uStack_6490 = uStack_6e90;
        uStack_6488 = uStack_6e88;
        local_6420 = local_6460;
        uStack_6418 = uStack_6458;
        uStack_6410 = uStack_6450;
        uStack_6408 = uStack_6448;
        local_6380 = auVar43;
        local_62a0 = auVar41;
        local_61c0 = auVar39;
        local_60e0 = auVar37;
        local_6040 = local_6ea0;
        uStack_6038 = uStack_6e98;
        uStack_6030 = uStack_6e90;
        uStack_6028 = uStack_6e88;
        local_5fc0 = uVar26;
        uStack_5fb8 = uVar27;
        uStack_5fb0 = uVar28;
        uStack_5fa8 = uVar29;
        local_5e80 = local_6ea0;
        uStack_5e78 = uStack_6e98;
        uStack_5e70 = uStack_6e90;
        uStack_5e68 = uStack_6e88;
        local_5da0 = local_63c0;
        uStack_5d98 = uStack_63b8;
        uStack_5d90 = uStack_63b0;
        uStack_5d88 = uStack_63a8;
        local_5cc0 = local_62e0;
        uStack_5cb8 = uStack_62d8;
        uStack_5cb0 = uStack_62d0;
        uStack_5ca8 = uStack_62c8;
        local_5be0 = local_6200;
        uStack_5bd8 = uStack_61f8;
        uStack_5bd0 = uStack_61f0;
        uStack_5bc8 = uStack_61e8;
        local_5b00 = local_6120;
        uStack_5af8 = uStack_6118;
        uStack_5af0 = uStack_6110;
        uStack_5ae8 = uStack_6108;
        local_5a20 = local_6ea0;
        uStack_5a18 = uStack_6e98;
        uStack_5a10 = uStack_6e90;
        uStack_5a08 = uStack_6e88;
        local_5a00 = local_6020;
        uStack_59f8 = uStack_6018;
        uStack_59f0 = uStack_6010;
        uStack_59e8 = uStack_6008;
        local_59a0 = uVar10;
        uStack_5998 = uVar11;
        uStack_5990 = uVar12;
        uStack_5988 = uVar13;
        local_51c0 = local_84e0;
        uStack_51b8 = uStack_84d8;
        uStack_51b0 = uStack_84d0;
        uStack_51a8 = uStack_84c8;
        fStack_5084 = fStack_8524;
        fStack_4fa4 = fStack_8524;
        fStack_4ec4 = fStack_8524;
        fStack_4de4 = fStack_8524;
        fStack_4d04 = fStack_8524;
        fStack_4c24 = fStack_8524;
        fStack_4b44 = fStack_8524;
        fStack_4a64 = fStack_8524;
        local_3fc0 = local_5220;
        uStack_3fb8 = uStack_5218;
        uStack_3fb0 = uStack_5210;
        uStack_3fa8 = uStack_5208;
        local_3ee0 = local_5300;
        uStack_3ed8 = uStack_52f8;
        uStack_3ed0 = uStack_52f0;
        uStack_3ec8 = uStack_52e8;
        local_3e80 = local_7ac0;
        uStack_3e78 = uStack_7ab8;
        uStack_3e70 = uStack_7ab0;
        uStack_3e68 = uStack_7aa8;
        local_3e00 = local_5220;
        uStack_3df8 = uStack_5218;
        uStack_3df0 = uStack_5210;
        uStack_3de8 = uStack_5208;
        local_3d20 = local_5300;
        uStack_3d18 = uStack_52f8;
        uStack_3d10 = uStack_52f0;
        uStack_3d08 = uStack_52e8;
        local_3cc0 = local_7f20;
        uStack_3cb8 = uStack_7f18;
        uStack_3cb0 = uStack_7f10;
        uStack_3ca8 = uStack_7f08;
        local_3a80 = local_6ea0;
        uStack_3a78 = uStack_6e98;
        uStack_3a70 = uStack_6e90;
        uStack_3a68 = uStack_6e88;
        local_3a20 = local_3a60;
        uStack_3a18 = uStack_3a58;
        uStack_3a10 = uStack_3a50;
        uStack_3a08 = uStack_3a48;
        fStack_39e4 = fStack_8524;
        local_3760 = local_37a0;
        uStack_3758 = uStack_3798;
        uStack_3750 = uStack_3790;
        uStack_3748 = uStack_3788;
        uStack_3728 = uStack_8c48;
        local_2c7c = local_2c80;
        local_2c78 = local_2c80;
        local_2c74 = local_2c80;
        local_2c70 = local_2c80;
        local_2c6c = local_2c80;
        local_2c68 = local_2c80;
        local_2c64 = local_2c80;
        local_2c3c = local_2c40;
        local_2c38 = local_2c40;
        local_2c34 = local_2c40;
        local_2c30 = local_2c40;
        local_2c2c = local_2c40;
        local_2c28 = local_2c40;
        local_2c24 = local_2c40;
        local_2b3c = local_2b40;
        local_2b38 = local_2b40;
        local_2b34 = local_2b40;
        local_2b30 = local_2b40;
        local_2b2c = local_2b40;
        local_2b28 = local_2b40;
        local_2b24 = local_2b40;
        local_2aec = local_2af0;
        local_2ae8 = local_2af0;
        local_2ae4 = local_2af0;
        local_2ae0 = local_2af0;
        local_2adc = local_2af0;
        local_2ad8 = local_2af0;
        local_2ad4 = local_2af0;
      }
      for (; local_8a40 = local_8c80, local_8e88 = local_8ac0, local_8eac + 3 < local_8d48;
          local_8eac = local_8eac + 4) {
        local_8ba0 = local_8e60;
        local_8b90 = *(undefined8 *)*local_8e60;
        uStack_8b88 = *(undefined8 *)(*local_8e60 + 8);
        auVar7 = *(undefined1 (*) [16])*local_8e60;
        local_1d60 = ZEXT816(0) << 0x20;
        local_2820 = 0x3f8000003f800000;
        uStack_2818 = 0x3f8000003f800000;
        local_1d0 = 0x42b0c0a542b0c0a5;
        uStack_1c8 = 0x42b0c0a542b0c0a5;
        auVar173._8_8_ = 0x42b0c0a542b0c0a5;
        auVar173._0_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(*(undefined1 (*) [16])*local_8e60,auVar173);
        local_2480._0_8_ = auVar5._0_8_;
        local_1c80 = local_2480._0_8_;
        local_2480._8_8_ = auVar5._8_8_;
        uStack_1c78 = local_2480._8_8_;
        local_1cb0 = 0xc2b0c0a5c2b0c0a5;
        uStack_1ca8 = 0xc2b0c0a5c2b0c0a5;
        auVar135._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar5,auVar135);
        local_2480._0_8_ = auVar1._0_8_;
        uVar10 = local_2480._0_8_;
        local_2480._8_8_ = auVar1._8_8_;
        uVar11 = local_2480._8_8_;
        local_23f0 = 0x3fb8aa3b3fb8aa3b;
        uStack_23e8 = 0x3fb8aa3b3fb8aa3b;
        local_23e0._0_4_ = auVar1._0_4_;
        local_23e0._4_4_ = auVar1._4_4_;
        uStack_23d8._0_4_ = auVar1._8_4_;
        uStack_23d8._4_4_ = auVar1._12_4_;
        local_24a0._4_4_ = local_23e0._4_4_ * 1.442695;
        local_24a0._0_4_ = (float)local_23e0 * 1.442695;
        uStack_2498._0_4_ = (float)uStack_23d8 * 1.442695;
        uStack_2498._4_4_ = uStack_23d8._4_4_ * 1.442695;
        local_23a0 = local_24a0;
        uStack_2398 = uStack_2498;
        local_23b0 = 0x3f0000003f000000;
        uStack_23a8 = 0x3f0000003f000000;
        local_24a0._0_4_ = (float)local_23e0 * 1.442695 + 0.5;
        local_24a0._4_4_ = local_23e0._4_4_ * 1.442695 + 0.5;
        fVar190 = (float)uStack_23d8 * 1.442695 + 0.5;
        fVar191 = uStack_23d8._4_4_ * 1.442695 + 0.5;
        uStack_2498._0_4_ = fVar190;
        uStack_2498._4_4_ = fVar191;
        local_120 = local_24a0;
        uStack_118 = uStack_2498;
        local_24b0._4_4_ = (int)(float)local_24a0._4_4_;
        local_24b0._0_4_ = (int)(float)local_24a0._0_4_;
        local_24b0._8_4_ = (int)fVar190;
        local_24b0._12_4_ = (int)fVar191;
        local_1a10 = local_24b0._0_8_;
        uStack_1a08 = local_24b0._8_8_;
        auVar155._8_8_ = local_24b0._8_8_;
        auVar155._0_8_ = local_24b0._0_8_;
        auVar6 = vcvtdq2ps_avx(auVar155);
        local_2490 = auVar6._0_8_;
        local_a0 = local_2490;
        uStack_2488 = auVar6._8_8_;
        uStack_98 = uStack_2488;
        local_b0 = local_24a0;
        uStack_a8 = uStack_2498;
        auVar177._8_8_ = uStack_2498;
        auVar177._0_8_ = local_24a0;
        auVar5 = vcmpps_avx(auVar177,auVar6,1);
        local_24d0._0_8_ = auVar5._0_8_;
        local_1ba0 = local_24d0._0_8_;
        local_24d0._8_8_ = auVar5._8_8_;
        uStack_1b98 = local_24d0._8_8_;
        local_1bb0 = 0x3f8000003f800000;
        uStack_1ba8 = 0x3f8000003f800000;
        auVar143._8_8_ = 0x3f8000003f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        local_24d0 = vpand_avx(auVar5,auVar143);
        local_22c0 = local_2490;
        uStack_22b8 = uStack_2488;
        local_22d0 = local_24d0._0_8_;
        uStack_22c8 = local_24d0._8_8_;
        _local_24a0 = vsubps_avx(auVar6,local_24d0);
        local_400 = local_24a0;
        uStack_3f8 = uStack_2498;
        local_420 = local_2480._0_8_;
        uStack_418 = local_2480._8_8_;
        local_f00 = 0x3f3180003f318000;
        uStack_ef8 = 0x3f3180003f318000;
        local_3c0 = local_2480._0_8_;
        uStack_3b8 = local_2480._8_8_;
        local_3f0 = 0x3f3180003f318000;
        uStack_3e8 = 0x3f3180003f318000;
        local_3e0._0_4_ = local_24a0._0_4_;
        local_3e0._4_4_ = local_24a0._4_4_;
        uStack_3d8._0_4_ = local_24a0._8_4_;
        uStack_3d8._4_4_ = local_24a0._12_4_;
        local_3d0 = (float)local_3e0 * 0.6933594;
        fStack_3cc = local_3e0._4_4_ * 0.6933594;
        fStack_3c8 = (float)uStack_3d8 * 0.6933594;
        fStack_3c4 = uStack_3d8._4_4_ * 0.6933594;
        auVar164._4_4_ = fStack_3cc;
        auVar164._0_4_ = local_3d0;
        auVar164._8_4_ = fStack_3c8;
        auVar164._12_4_ = fStack_3c4;
        auVar5 = vsubps_avx(auVar1,auVar164);
        local_470 = local_24a0;
        uStack_468 = uStack_2498;
        local_2480._0_8_ = auVar5._0_8_;
        local_490 = local_2480._0_8_;
        local_2480._8_8_ = auVar5._8_8_;
        uStack_488 = local_2480._8_8_;
        local_e90 = 0xb95e8083b95e8083;
        uStack_e88 = 0xb95e8083b95e8083;
        local_430 = local_2480._0_8_;
        uStack_428 = local_2480._8_8_;
        local_450 = local_24a0;
        uStack_448 = uStack_2498;
        local_460 = 0xb95e8083b95e8083;
        uStack_458 = 0xb95e8083b95e8083;
        local_440 = (float)local_3e0 * -0.00021219444;
        fStack_43c = local_3e0._4_4_ * -0.00021219444;
        fStack_438 = (float)uStack_3d8 * -0.00021219444;
        fStack_434 = uStack_3d8._4_4_ * -0.00021219444;
        auVar163._4_4_ = fStack_43c;
        auVar163._0_4_ = local_440;
        auVar163._8_4_ = fStack_438;
        auVar163._12_4_ = fStack_434;
        local_2480 = vsubps_avx(auVar5,auVar163);
        local_2410 = local_2480._0_8_;
        uStack_2408 = local_2480._8_8_;
        local_2400._0_4_ = local_2480._0_4_;
        local_2400._4_4_ = local_2480._4_4_;
        uStack_23f8._0_4_ = local_2480._8_4_;
        uStack_23f8._4_4_ = local_2480._12_4_;
        local_2490 = CONCAT44(local_2400._4_4_ * local_2400._4_4_,
                              (float)local_2400 * (float)local_2400);
        uStack_2488._0_4_ = (float)uStack_23f8 * (float)uStack_23f8;
        uStack_2488._4_4_ = uStack_23f8._4_4_ * uStack_23f8._4_4_;
        local_1200 = 0x3950696739506967;
        uStack_11f8 = 0x3950696739506967;
        local_1210 = local_2480._0_8_;
        uStack_1208 = local_2480._8_8_;
        local_14c0 = 0x3ab743ce3ab743ce;
        uStack_14b8 = 0x3ab743ce3ab743ce;
        local_11e0 = 0x3950696739506967;
        uStack_11d8 = 0x3950696739506967;
        local_11f0 = local_2480._0_8_;
        uStack_11e8 = local_2480._8_8_;
        local_11c0 = (float)local_2400 * 0.00019875691;
        fStack_11bc = local_2400._4_4_ * 0.00019875691;
        fStack_11b8 = (float)uStack_23f8 * 0.00019875691;
        fStack_11b4 = uStack_23f8._4_4_ * 0.00019875691;
        local_11d0 = 0x3ab743ce3ab743ce;
        uStack_11c8 = 0x3ab743ce3ab743ce;
        local_24e0 = CONCAT44(fStack_11bc + 0.0013981999,local_11c0 + 0.0013981999);
        uStack_24d8 = CONCAT44(fStack_11b4 + 0.0013981999,fStack_11b8 + 0.0013981999);
        local_1270 = local_24e0;
        uStack_1268 = uStack_24d8;
        local_1280 = local_2480._0_8_;
        uStack_1278 = local_2480._8_8_;
        local_1530 = 0x3c0889083c088908;
        uStack_1528 = 0x3c0889083c088908;
        local_1250 = local_24e0;
        uStack_1248 = uStack_24d8;
        local_1260 = local_2480._0_8_;
        uStack_1258 = local_2480._8_8_;
        local_1230 = (local_11c0 + 0.0013981999) * (float)local_2400;
        fStack_122c = (fStack_11bc + 0.0013981999) * local_2400._4_4_;
        fStack_1228 = (fStack_11b8 + 0.0013981999) * (float)uStack_23f8;
        fStack_1224 = (fStack_11b4 + 0.0013981999) * uStack_23f8._4_4_;
        local_1240 = 0x3c0889083c088908;
        uStack_1238 = 0x3c0889083c088908;
        local_24e0 = CONCAT44(fStack_122c + 0.008333452,local_1230 + 0.008333452);
        uStack_24d8 = CONCAT44(fStack_1224 + 0.008333452,fStack_1228 + 0.008333452);
        local_12e0 = local_24e0;
        uStack_12d8 = uStack_24d8;
        local_12f0 = local_2480._0_8_;
        uStack_12e8 = local_2480._8_8_;
        local_15a0 = 0x3d2aa9c13d2aa9c1;
        uStack_1598 = 0x3d2aa9c13d2aa9c1;
        local_12c0 = local_24e0;
        uStack_12b8 = uStack_24d8;
        local_12d0 = local_2480._0_8_;
        uStack_12c8 = local_2480._8_8_;
        local_12a0 = (local_1230 + 0.008333452) * (float)local_2400;
        fStack_129c = (fStack_122c + 0.008333452) * local_2400._4_4_;
        fStack_1298 = (fStack_1228 + 0.008333452) * (float)uStack_23f8;
        fStack_1294 = (fStack_1224 + 0.008333452) * uStack_23f8._4_4_;
        local_12b0 = 0x3d2aa9c13d2aa9c1;
        uStack_12a8 = 0x3d2aa9c13d2aa9c1;
        local_24e0 = CONCAT44(fStack_129c + 0.041665796,local_12a0 + 0.041665796);
        uStack_24d8 = CONCAT44(fStack_1294 + 0.041665796,fStack_1298 + 0.041665796);
        local_1350 = local_24e0;
        uStack_1348 = uStack_24d8;
        local_1360 = local_2480._0_8_;
        uStack_1358 = local_2480._8_8_;
        local_1610 = 0x3e2aaaaa3e2aaaaa;
        uStack_1608 = 0x3e2aaaaa3e2aaaaa;
        local_1330 = local_24e0;
        uStack_1328 = uStack_24d8;
        local_1340 = local_2480._0_8_;
        uStack_1338 = local_2480._8_8_;
        local_1310 = (local_12a0 + 0.041665796) * (float)local_2400;
        fStack_130c = (fStack_129c + 0.041665796) * local_2400._4_4_;
        fStack_1308 = (fStack_1298 + 0.041665796) * (float)uStack_23f8;
        fStack_1304 = (fStack_1294 + 0.041665796) * uStack_23f8._4_4_;
        local_1320 = 0x3e2aaaaa3e2aaaaa;
        uStack_1318 = 0x3e2aaaaa3e2aaaaa;
        local_24e0 = CONCAT44(fStack_130c + 0.16666666,local_1310 + 0.16666666);
        uStack_24d8 = CONCAT44(fStack_1304 + 0.16666666,fStack_1308 + 0.16666666);
        local_13c0 = local_24e0;
        uStack_13b8 = uStack_24d8;
        local_13d0 = local_2480._0_8_;
        uStack_13c8 = local_2480._8_8_;
        local_13a0 = local_24e0;
        uStack_1398 = uStack_24d8;
        local_13b0 = local_2480._0_8_;
        uStack_13a8 = local_2480._8_8_;
        local_1380 = (local_1310 + 0.16666666) * (float)local_2400;
        fStack_137c = (fStack_130c + 0.16666666) * local_2400._4_4_;
        fStack_1378 = (fStack_1308 + 0.16666666) * (float)uStack_23f8;
        fStack_1374 = (fStack_1304 + 0.16666666) * uStack_23f8._4_4_;
        local_1390 = 0x3f0000003f000000;
        uStack_1388 = 0x3f0000003f000000;
        local_24e0 = CONCAT44(fStack_137c + 0.5,local_1380 + 0.5);
        uStack_24d8 = CONCAT44(fStack_1374 + 0.5,fStack_1378 + 0.5);
        local_1430 = local_24e0;
        uStack_1428 = uStack_24d8;
        local_1440 = local_2490;
        uStack_1438 = uStack_2488;
        local_1450 = local_2480._0_8_;
        uStack_1448 = local_2480._8_8_;
        local_1410 = local_24e0;
        uStack_1408 = uStack_24d8;
        local_1420 = local_2490;
        uStack_1418 = uStack_2488;
        local_13f0 = (local_1380 + 0.5) * (float)local_2400 * (float)local_2400;
        fStack_13ec = (fStack_137c + 0.5) * local_2400._4_4_ * local_2400._4_4_;
        fStack_13e8 = (fStack_1378 + 0.5) * (float)uStack_23f8 * (float)uStack_23f8;
        fStack_13e4 = (fStack_1374 + 0.5) * uStack_23f8._4_4_ * uStack_23f8._4_4_;
        local_1400 = local_2480._0_8_;
        uStack_13f8 = local_2480._8_8_;
        local_24e0 = CONCAT44(fStack_13ec + local_2400._4_4_,local_13f0 + (float)local_2400);
        uStack_24d8 = CONCAT44(fStack_13e4 + uStack_23f8._4_4_,fStack_13e8 + (float)uStack_23f8);
        local_23c0 = local_24e0;
        uStack_23b8 = uStack_24d8;
        local_23d0 = 0x3f8000003f800000;
        uStack_23c8 = 0x3f8000003f800000;
        fVar190 = local_13f0 + (float)local_2400 + 1.0;
        fVar191 = fStack_13ec + local_2400._4_4_ + 1.0;
        fVar192 = fStack_13e8 + (float)uStack_23f8 + 1.0;
        fVar193 = fStack_13e4 + uStack_23f8._4_4_ + 1.0;
        local_24e0 = CONCAT44(fVar191,fVar190);
        uStack_24d8 = CONCAT44(fVar193,fVar192);
        local_130 = local_24a0;
        uStack_128 = uStack_2498;
        local_24b0._4_4_ = (int)local_3e0._4_4_;
        local_24b0._0_4_ = (int)(float)local_3e0;
        local_24b0._8_4_ = (int)(float)uStack_3d8;
        local_24b0._12_4_ = (int)uStack_3d8._4_4_;
        local_2460 = local_24b0._0_8_;
        uStack_2458 = local_24b0._8_8_;
        local_27d0 = 0x7f0000007f;
        uStack_27c8 = 0x7f0000007f;
        auVar115._8_8_ = local_24b0._8_8_;
        auVar115._0_8_ = local_24b0._0_8_;
        auVar114._8_8_ = 0x7f0000007f;
        auVar114._0_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx(auVar115,auVar114);
        local_24b0._0_8_ = auVar5._0_8_;
        local_2440 = local_24b0._0_8_;
        local_24b0._8_8_ = auVar5._8_8_;
        uStack_2438 = local_24b0._8_8_;
        local_2444 = 0x17;
        local_24b0 = vpslld_avx(auVar5,ZEXT416(0x17));
        local_50 = local_24b0._0_8_;
        uStack_48 = local_24b0._8_8_;
        local_24f0 = local_24b0._0_8_;
        uStack_24e8 = local_24b0._8_8_;
        local_2420 = local_24e0;
        uStack_2418 = uStack_24d8;
        local_2430._0_4_ = local_24b0._0_4_;
        local_2430._4_4_ = local_24b0._4_4_;
        uStack_2428._0_4_ = local_24b0._8_4_;
        uStack_2428._4_4_ = local_24b0._12_4_;
        fVar190 = fVar190 * (float)local_2430;
        fVar191 = fVar191 * local_2430._4_4_;
        fVar192 = fVar192 * (float)uStack_2428;
        fVar193 = fVar193 * uStack_2428._4_4_;
        local_24e0 = CONCAT44(fVar191,fVar190);
        uStack_24d8 = CONCAT44(fVar193,fVar192);
        local_2660 = local_24e0;
        uStack_2658 = uStack_24d8;
        local_22d4 = 0x3f800000;
        local_22f0 = 0x3f800000;
        local_2670 = 0x3f8000003f800000;
        uStack_2668 = 0x3f8000003f800000;
        local_2800._4_4_ = fVar191 + 1.0;
        local_2800._0_4_ = fVar190 + 1.0;
        uStack_27f8._0_4_ = fVar192 + 1.0;
        uStack_27f8._4_4_ = fVar193 + 1.0;
        local_1d00 = local_2800;
        uStack_1cf8 = uStack_27f8;
        local_1d10 = 0;
        local_1d30._8_8_ = SUB168(ZEXT816(0),4);
        uStack_1d08 = local_1d30._8_8_;
        auVar131._8_8_ = uStack_27f8;
        auVar131._0_8_ = local_2800;
        auVar182._8_8_ = 0;
        auVar182._0_8_ = local_1d30._8_8_;
        local_2830 = vcmpps_avx(auVar131,auVar182 << 0x40,2);
        local_1c40 = local_2800;
        uStack_1c38 = uStack_27f8;
        local_1c50 = 0x80000000800000;
        uStack_1c48 = 0x80000000800000;
        auVar138._8_8_ = uStack_27f8;
        auVar138._0_8_ = local_2800;
        auVar137._8_8_ = 0x80000000800000;
        auVar137._0_8_ = 0x80000000800000;
        auVar5 = vmaxps_avx(auVar138,auVar137);
        local_2800 = auVar5._0_8_;
        local_1c10 = local_2800;
        uStack_27f8 = auVar5._8_8_;
        uStack_1c08 = uStack_27f8;
        local_27e0 = local_2800;
        uStack_27d8 = uStack_27f8;
        local_27e4 = 0x17;
        auVar1 = vpsrld_avx(auVar5,ZEXT416(0x17));
        local_1b20 = local_2800;
        uStack_1b18 = uStack_27f8;
        local_1b30 = 0x807fffff807fffff;
        uStack_1b28 = 0x807fffff807fffff;
        auVar146._8_8_ = 0x807fffff807fffff;
        auVar146._0_8_ = 0x807fffff807fffff;
        auVar5 = vpand_avx(auVar5,auVar146);
        local_2800 = auVar5._0_8_;
        local_1a80 = local_2800;
        uStack_27f8 = auVar5._8_8_;
        uStack_1a78 = uStack_27f8;
        auVar150._8_8_ = 0x3f0000003f000000;
        auVar150._0_8_ = 0x3f0000003f000000;
        auVar6 = vpor_avx(auVar5,auVar150);
        local_2810._0_8_ = auVar1._0_8_;
        local_27c0 = local_2810._0_8_;
        local_2810._8_8_ = auVar1._8_8_;
        uStack_27b8 = local_2810._8_8_;
        auVar111._8_8_ = 0x7f0000007f;
        auVar111._0_8_ = 0x7f0000007f;
        local_2810 = vpsubd_avx(auVar1,auVar111);
        local_19f0 = local_2810._0_8_;
        uStack_19e8 = local_2810._8_8_;
        auVar5 = vcvtdq2ps_avx(local_2810);
        local_2840 = auVar5._0_8_;
        uVar12 = local_2840;
        uStack_2838 = auVar5._8_8_;
        uVar13 = uStack_2838;
        local_2710 = 0x3f8000003f800000;
        uStack_2708 = 0x3f8000003f800000;
        local_2700._0_4_ = auVar5._0_4_;
        local_2700._4_4_ = auVar5._4_4_;
        uStack_26f8._0_4_ = auVar5._8_4_;
        uStack_26f8._4_4_ = auVar5._12_4_;
        local_2840._4_4_ = local_2700._4_4_ + 1.0;
        local_2840._0_4_ = (float)local_2700 + 1.0;
        uStack_2838._0_4_ = (float)uStack_26f8 + 1.0;
        uStack_2838._4_4_ = uStack_26f8._4_4_ + 1.0;
        local_2800 = auVar6._0_8_;
        local_19c0 = local_2800;
        uStack_27f8 = auVar6._8_8_;
        uStack_19b8 = uStack_27f8;
        local_19d0 = 0x3f3504f33f3504f3;
        uStack_19c8 = 0x3f3504f33f3504f3;
        auVar157._8_8_ = 0x3f3504f33f3504f3;
        auVar157._0_8_ = 0x3f3504f33f3504f3;
        local_2850 = vcmpps_avx(auVar6,auVar157,1);
        local_1b40 = local_2800;
        uStack_1b38 = uStack_27f8;
        local_1b50 = local_2850._0_8_;
        uStack_1b48 = local_2850._8_8_;
        local_2860 = vpand_avx(auVar6,local_2850);
        local_2260 = local_2800;
        uStack_2258 = uStack_27f8;
        local_2270 = 0x3f8000003f800000;
        uStack_2268 = 0x3f8000003f800000;
        auVar117._8_8_ = 0x3f8000003f800000;
        auVar117._0_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar6,auVar117);
        local_2280 = local_2840;
        uStack_2278 = uStack_2838;
        local_1b60 = 0x3f8000003f800000;
        uStack_1b58 = 0x3f8000003f800000;
        local_1b70 = local_2850._0_8_;
        uStack_1b68 = local_2850._8_8_;
        auVar145._8_8_ = 0x3f8000003f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        local_2290 = vpand_avx(auVar145,local_2850);
        auVar116._8_8_ = uStack_2838;
        auVar116._0_8_ = local_2840;
        _local_2840 = vsubps_avx(auVar116,local_2290);
        local_2800 = auVar5._0_8_;
        uVar14 = local_2800;
        uStack_27f8 = auVar5._8_8_;
        uVar15 = uStack_27f8;
        local_2720._0_4_ = auVar5._0_4_;
        local_2720._4_4_ = auVar5._4_4_;
        uStack_2718._0_4_ = auVar5._8_4_;
        uStack_2718._4_4_ = auVar5._12_4_;
        local_2730._0_4_ = local_2860._0_4_;
        local_2730._4_4_ = local_2860._4_4_;
        uStack_2728._0_4_ = local_2860._8_4_;
        uStack_2728._4_4_ = local_2860._12_4_;
        local_2720._0_4_ = (float)local_2720 + (float)local_2730;
        local_2720._4_4_ = local_2720._4_4_ + local_2730._4_4_;
        uStack_2718._0_4_ = (float)uStack_2718 + (float)uStack_2728;
        uStack_2718._4_4_ = uStack_2718._4_4_ + uStack_2728._4_4_;
        local_2800._4_4_ = local_2720._4_4_;
        local_2800._0_4_ = (float)local_2720;
        uStack_27f8._0_4_ = (float)uStack_2718;
        uStack_27f8._4_4_ = uStack_2718._4_4_;
        local_2770 = local_2800;
        uStack_2768 = uStack_27f8;
        local_2870 = (float)local_2720 * (float)local_2720;
        fStack_286c = local_2720._4_4_ * local_2720._4_4_;
        fStack_2868 = (float)uStack_2718 * (float)uStack_2718;
        fStack_2864 = uStack_2718._4_4_ * uStack_2718._4_4_;
        local_b00 = 0x3d9021bb3d9021bb;
        uStack_af8 = 0x3d9021bb3d9021bb;
        local_b10 = local_2800;
        uStack_b08 = uStack_27f8;
        local_b20 = 0xbdebd1b8bdebd1b8;
        uStack_b18 = 0xbdebd1b8bdebd1b8;
        local_ae0 = 0x3d9021bb3d9021bb;
        uStack_ad8 = 0x3d9021bb3d9021bb;
        local_af0 = local_2800;
        uStack_ae8 = uStack_27f8;
        local_ac0 = (float)local_2720 * 0.070376836;
        fStack_abc = local_2720._4_4_ * 0.070376836;
        fStack_ab8 = (float)uStack_2718 * 0.070376836;
        fStack_ab4 = uStack_2718._4_4_ * 0.070376836;
        local_ad0 = 0xbdebd1b8bdebd1b8;
        uStack_ac8 = 0xbdebd1b8bdebd1b8;
        local_2880._4_4_ = fStack_abc + -0.1151461;
        local_2880._0_4_ = local_ac0 + -0.1151461;
        uStack_2878._0_4_ = fStack_ab8 + -0.1151461;
        uStack_2878._4_4_ = fStack_ab4 + -0.1151461;
        local_b70 = local_2880;
        uStack_b68 = uStack_2878;
        local_b80 = local_2800;
        uStack_b78 = uStack_27f8;
        local_b90 = 0x3def251a3def251a;
        uStack_b88 = 0x3def251a3def251a;
        local_b50 = local_2880;
        uStack_b48 = uStack_2878;
        local_b60 = local_2800;
        uStack_b58 = uStack_27f8;
        local_b30 = (local_ac0 + -0.1151461) * (float)local_2720;
        fStack_b2c = (fStack_abc + -0.1151461) * local_2720._4_4_;
        fStack_b28 = (fStack_ab8 + -0.1151461) * (float)uStack_2718;
        fStack_b24 = (fStack_ab4 + -0.1151461) * uStack_2718._4_4_;
        local_b40 = 0x3def251a3def251a;
        uStack_b38 = 0x3def251a3def251a;
        local_2880._4_4_ = fStack_b2c + 0.116769984;
        local_2880._0_4_ = local_b30 + 0.116769984;
        uStack_2878._0_4_ = fStack_b28 + 0.116769984;
        uStack_2878._4_4_ = fStack_b24 + 0.116769984;
        local_be0 = local_2880;
        uStack_bd8 = uStack_2878;
        local_bf0 = local_2800;
        uStack_be8 = uStack_27f8;
        local_c00 = 0xbdfe5d4fbdfe5d4f;
        uStack_bf8 = 0xbdfe5d4fbdfe5d4f;
        local_bc0 = local_2880;
        uStack_bb8 = uStack_2878;
        local_bd0 = local_2800;
        uStack_bc8 = uStack_27f8;
        local_ba0 = (local_b30 + 0.116769984) * (float)local_2720;
        fStack_b9c = (fStack_b2c + 0.116769984) * local_2720._4_4_;
        fStack_b98 = (fStack_b28 + 0.116769984) * (float)uStack_2718;
        fStack_b94 = (fStack_b24 + 0.116769984) * uStack_2718._4_4_;
        local_bb0 = 0xbdfe5d4fbdfe5d4f;
        uStack_ba8 = 0xbdfe5d4fbdfe5d4f;
        local_2880._4_4_ = fStack_b9c + -0.12420141;
        local_2880._0_4_ = local_ba0 + -0.12420141;
        uStack_2878._0_4_ = fStack_b98 + -0.12420141;
        uStack_2878._4_4_ = fStack_b94 + -0.12420141;
        local_c50 = local_2880;
        uStack_c48 = uStack_2878;
        local_c60 = local_2800;
        uStack_c58 = uStack_27f8;
        local_c70 = 0x3e11e9bf3e11e9bf;
        uStack_c68 = 0x3e11e9bf3e11e9bf;
        local_c30 = local_2880;
        uStack_c28 = uStack_2878;
        local_c40 = local_2800;
        uStack_c38 = uStack_27f8;
        local_c10 = (local_ba0 + -0.12420141) * (float)local_2720;
        fStack_c0c = (fStack_b9c + -0.12420141) * local_2720._4_4_;
        fStack_c08 = (fStack_b98 + -0.12420141) * (float)uStack_2718;
        fStack_c04 = (fStack_b94 + -0.12420141) * uStack_2718._4_4_;
        local_c20 = 0x3e11e9bf3e11e9bf;
        uStack_c18 = 0x3e11e9bf3e11e9bf;
        local_2880._4_4_ = fStack_c0c + 0.14249323;
        local_2880._0_4_ = local_c10 + 0.14249323;
        uStack_2878._0_4_ = fStack_c08 + 0.14249323;
        uStack_2878._4_4_ = fStack_c04 + 0.14249323;
        local_cc0 = local_2880;
        uStack_cb8 = uStack_2878;
        local_cd0 = local_2800;
        uStack_cc8 = uStack_27f8;
        local_ce0 = 0xbe2aae50be2aae50;
        uStack_cd8 = 0xbe2aae50be2aae50;
        local_ca0 = local_2880;
        uStack_c98 = uStack_2878;
        local_cb0 = local_2800;
        uStack_ca8 = uStack_27f8;
        local_c80 = (local_c10 + 0.14249323) * (float)local_2720;
        fStack_c7c = (fStack_c0c + 0.14249323) * local_2720._4_4_;
        fStack_c78 = (fStack_c08 + 0.14249323) * (float)uStack_2718;
        fStack_c74 = (fStack_c04 + 0.14249323) * uStack_2718._4_4_;
        local_c90 = 0xbe2aae50be2aae50;
        uStack_c88 = 0xbe2aae50be2aae50;
        local_2880._4_4_ = fStack_c7c + -0.16668057;
        local_2880._0_4_ = local_c80 + -0.16668057;
        uStack_2878._0_4_ = fStack_c78 + -0.16668057;
        uStack_2878._4_4_ = fStack_c74 + -0.16668057;
        local_d30 = local_2880;
        uStack_d28 = uStack_2878;
        local_d40 = local_2800;
        uStack_d38 = uStack_27f8;
        local_d50 = 0x3e4cceac3e4cceac;
        uStack_d48 = 0x3e4cceac3e4cceac;
        local_d10 = local_2880;
        uStack_d08 = uStack_2878;
        local_d20 = local_2800;
        uStack_d18 = uStack_27f8;
        local_cf0 = (local_c80 + -0.16668057) * (float)local_2720;
        fStack_cec = (fStack_c7c + -0.16668057) * local_2720._4_4_;
        fStack_ce8 = (fStack_c78 + -0.16668057) * (float)uStack_2718;
        fStack_ce4 = (fStack_c74 + -0.16668057) * uStack_2718._4_4_;
        local_d00 = 0x3e4cceac3e4cceac;
        uStack_cf8 = 0x3e4cceac3e4cceac;
        local_2880._4_4_ = fStack_cec + 0.20000714;
        local_2880._0_4_ = local_cf0 + 0.20000714;
        uStack_2878._0_4_ = fStack_ce8 + 0.20000714;
        uStack_2878._4_4_ = fStack_ce4 + 0.20000714;
        local_da0 = local_2880;
        uStack_d98 = uStack_2878;
        local_db0 = local_2800;
        uStack_da8 = uStack_27f8;
        local_dc0 = 0xbe7ffffcbe7ffffc;
        uStack_db8 = 0xbe7ffffcbe7ffffc;
        local_d80 = local_2880;
        uStack_d78 = uStack_2878;
        local_d90 = local_2800;
        uStack_d88 = uStack_27f8;
        local_d60 = (local_cf0 + 0.20000714) * (float)local_2720;
        fStack_d5c = (fStack_cec + 0.20000714) * local_2720._4_4_;
        fStack_d58 = (fStack_ce8 + 0.20000714) * (float)uStack_2718;
        fStack_d54 = (fStack_ce4 + 0.20000714) * uStack_2718._4_4_;
        local_d70 = 0xbe7ffffcbe7ffffc;
        uStack_d68 = 0xbe7ffffcbe7ffffc;
        local_2880._4_4_ = fStack_d5c + -0.24999994;
        local_2880._0_4_ = local_d60 + -0.24999994;
        uStack_2878._0_4_ = fStack_d58 + -0.24999994;
        uStack_2878._4_4_ = fStack_d54 + -0.24999994;
        local_e10 = local_2880;
        uStack_e08 = uStack_2878;
        local_e20 = local_2800;
        uStack_e18 = uStack_27f8;
        local_e30 = 0x3eaaaaaa3eaaaaaa;
        uStack_e28 = 0x3eaaaaaa3eaaaaaa;
        local_df0 = local_2880;
        uStack_de8 = uStack_2878;
        local_e00 = local_2800;
        uStack_df8 = uStack_27f8;
        local_dd0 = (local_d60 + -0.24999994) * (float)local_2720;
        fStack_dcc = (fStack_d5c + -0.24999994) * local_2720._4_4_;
        fStack_dc8 = (fStack_d58 + -0.24999994) * (float)uStack_2718;
        fStack_dc4 = (fStack_d54 + -0.24999994) * uStack_2718._4_4_;
        local_de0 = 0x3eaaaaaa3eaaaaaa;
        uStack_dd8 = 0x3eaaaaaa3eaaaaaa;
        local_2880._4_4_ = fStack_dcc + 0.3333333;
        local_2880._0_4_ = local_dd0 + 0.3333333;
        uStack_2878._0_4_ = fStack_dc8 + 0.3333333;
        uStack_2878._4_4_ = fStack_dc4 + 0.3333333;
        local_2780 = local_2880;
        uStack_2778 = uStack_2878;
        local_2790 = local_2800;
        uStack_2788 = uStack_27f8;
        local_2880._0_4_ = (local_dd0 + 0.3333333) * (float)local_2720;
        local_2880._4_4_ = (fStack_dcc + 0.3333333) * local_2720._4_4_;
        fVar190 = (fStack_dc8 + 0.3333333) * (float)uStack_2718;
        fVar191 = (fStack_dc4 + 0.3333333) * uStack_2718._4_4_;
        uStack_2878._0_4_ = fVar190;
        uStack_2878._4_4_ = fVar191;
        local_27a0 = local_2880;
        uStack_2798 = uStack_2878;
        local_27b0 = CONCAT44(fStack_286c,local_2870);
        uStack_27a8 = CONCAT44(fStack_2864,fStack_2868);
        local_2880._0_4_ = (float)local_2880._0_4_ * local_2870;
        local_2880._4_4_ = (float)local_2880._4_4_ * fStack_286c;
        fVar190 = fVar190 * fStack_2868;
        fVar191 = fVar191 * fStack_2864;
        uStack_2878._0_4_ = fVar190;
        uStack_2878._4_4_ = fVar191;
        local_e80 = local_2840;
        uStack_e78 = uStack_2838;
        local_ea0 = local_2880;
        uStack_e98 = uStack_2878;
        local_e70 = 0xb95e8083b95e8083;
        uStack_e68 = 0xb95e8083b95e8083;
        local_e60._0_4_ = local_2840._0_4_;
        local_e60._4_4_ = local_2840._4_4_;
        uStack_e58._0_4_ = local_2840._8_4_;
        uStack_e58._4_4_ = local_2840._12_4_;
        local_e40 = (float)local_e60 * -0.00021219444;
        fStack_e3c = local_e60._4_4_ * -0.00021219444;
        fStack_e38 = (float)uStack_e58 * -0.00021219444;
        fStack_e34 = uStack_e58._4_4_ * -0.00021219444;
        local_e50 = local_2880;
        uStack_e48 = uStack_2878;
        local_2880._4_4_ = fStack_e3c + (float)local_2880._4_4_;
        local_2880._0_4_ = local_e40 + (float)local_2880._0_4_;
        uStack_2878._0_4_ = fStack_e38 + fVar190;
        uStack_2878._4_4_ = fStack_e34 + fVar191;
        local_2b0 = CONCAT44(fStack_286c,local_2870);
        uStack_2a8 = CONCAT44(fStack_2864,fStack_2868);
        local_2d0 = local_2880;
        uStack_2c8 = uStack_2878;
        local_270 = local_2880;
        uStack_268 = uStack_2878;
        local_2a0 = 0x3f0000003f000000;
        uStack_298 = 0x3f0000003f000000;
        local_280 = local_2870 * 0.5;
        fStack_27c = fStack_286c * 0.5;
        fStack_278 = fStack_2868 * 0.5;
        fStack_274 = fStack_2864 * 0.5;
        auVar168._8_8_ = uStack_2878;
        auVar168._0_8_ = local_2880;
        auVar167._4_4_ = fStack_27c;
        auVar167._0_4_ = local_280;
        auVar167._8_4_ = fStack_278;
        auVar167._12_4_ = fStack_274;
        _local_2880 = vsubps_avx(auVar168,auVar167);
        local_2740 = local_2800;
        uStack_2738 = uStack_27f8;
        local_2750._0_4_ = local_2880._0_4_;
        local_2750._4_4_ = local_2880._4_4_;
        uStack_2748._0_4_ = local_2880._8_4_;
        uStack_2748._4_4_ = local_2880._12_4_;
        local_2800._4_4_ = local_2720._4_4_ + local_2750._4_4_;
        local_2800._0_4_ = (float)local_2720 + (float)local_2750;
        uStack_27f8._0_4_ = (float)uStack_2718 + (float)uStack_2748;
        uStack_27f8._4_4_ = uStack_2718._4_4_ + uStack_2748._4_4_;
        local_ef0 = local_2840;
        uStack_ee8 = uStack_2838;
        local_f10 = local_2800;
        uStack_f08 = uStack_27f8;
        local_ed0 = local_2840;
        uStack_ec8 = uStack_2838;
        local_ee0 = 0x3f3180003f318000;
        uStack_ed8 = 0x3f3180003f318000;
        local_eb0 = (float)local_e60 * 0.6933594;
        fStack_eac = local_e60._4_4_ * 0.6933594;
        fStack_ea8 = (float)uStack_e58 * 0.6933594;
        fStack_ea4 = uStack_e58._4_4_ * 0.6933594;
        local_ec0 = local_2800;
        uStack_eb8 = uStack_27f8;
        local_2800._4_4_ = fStack_eac + local_2720._4_4_ + local_2750._4_4_;
        local_2800._0_4_ = local_eb0 + (float)local_2720 + (float)local_2750;
        uStack_27f8._0_4_ = fStack_ea8 + (float)uStack_2718 + (float)uStack_2748;
        uStack_27f8._4_4_ = fStack_ea4 + uStack_2718._4_4_ + uStack_2748._4_4_;
        local_1aa0 = local_2800;
        uStack_1a98 = uStack_27f8;
        local_1ab0 = local_2830._0_8_;
        uStack_1aa8 = local_2830._8_8_;
        auVar149._8_8_ = uStack_27f8;
        auVar149._0_8_ = local_2800;
        _local_2800 = vpor_avx(auVar149,local_2830);
        local_2a00 = local_2800;
        uStack_29f8 = uStack_27f8;
        local_2354 = 0x3f800000;
        local_2370 = 0x3f800000;
        local_2a10 = 0x3f8000003f800000;
        uStack_2a08 = 0x3f8000003f800000;
        local_2374 = 0x40000000;
        local_2390 = 0x40000000;
        local_2a20 = 0x4000000040000000;
        uStack_2a18 = 0x4000000040000000;
        local_29c0._0_4_ = local_2800._0_4_;
        local_29c0._4_4_ = local_2800._4_4_;
        uStack_29b8._0_4_ = local_2800._8_4_;
        uStack_29b8._4_4_ = local_2800._12_4_;
        local_21c0 = (float)local_29c0 * 2.0;
        fStack_21bc = local_29c0._4_4_ * 2.0;
        fStack_21b8 = (float)uStack_29b8 * 2.0;
        fStack_21b4 = uStack_29b8._4_4_ * 2.0;
        local_2014 = 0x3f800000;
        local_2030 = 0x3f800000;
        local_21d0 = 0x3f8000003f800000;
        uStack_21c8 = 0x3f8000003f800000;
        local_21a0._8_8_ = 0x3f8000003f800000;
        local_21a0._0_8_ = 0x3f8000003f800000;
        local_1fe0 = 0;
        uStack_1fd8 = local_1d30._8_8_;
        local_1ff0 = CONCAT44(fStack_21bc,local_21c0);
        uStack_1fe8 = CONCAT44(fStack_21b4,fStack_21b8);
        auVar183._8_8_ = 0;
        auVar183._0_8_ = local_1d30._8_8_;
        auVar124._8_8_ = uStack_1fe8;
        auVar124._0_8_ = local_1ff0;
        auVar5 = vsubps_avx(auVar183 << 0x40,auVar124);
        local_1d70 = 0;
        uStack_1d68 = local_1d30._8_8_;
        local_2110 = 0x7f0000007f;
        uStack_2108 = 0x7f0000007f;
        local_2120._0_8_ = auVar5._0_8_;
        local_1c0 = local_2120._0_8_;
        local_2120._8_8_ = auVar5._8_8_;
        uStack_1b8 = local_2120._8_8_;
        auVar172._8_8_ = 0x42b0c0a542b0c0a5;
        auVar172._0_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar172);
        local_2120._0_8_ = auVar5._0_8_;
        local_1ca0 = local_2120._0_8_;
        local_2120._8_8_ = auVar5._8_8_;
        uStack_1c98 = local_2120._8_8_;
        auVar134._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar134._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar5,auVar134);
        local_2120._0_8_ = auVar1._0_8_;
        uVar16 = local_2120._0_8_;
        local_2120._8_8_ = auVar1._8_8_;
        uVar17 = local_2120._8_8_;
        local_2080._0_4_ = auVar1._0_4_;
        local_2080._4_4_ = auVar1._4_4_;
        uStack_2078._0_4_ = auVar1._8_4_;
        uStack_2078._4_4_ = auVar1._12_4_;
        local_2140._4_4_ = local_2080._4_4_ * 1.442695;
        local_2140._0_4_ = (float)local_2080 * 1.442695;
        uStack_2138._0_4_ = (float)uStack_2078 * 1.442695;
        uStack_2138._4_4_ = uStack_2078._4_4_ * 1.442695;
        local_2040 = local_2140;
        uStack_2038 = uStack_2138;
        local_2140._0_4_ = (float)local_2080 * 1.442695 + 0.5;
        local_2140._4_4_ = local_2080._4_4_ * 1.442695 + 0.5;
        fVar190 = (float)uStack_2078 * 1.442695 + 0.5;
        fVar191 = uStack_2078._4_4_ * 1.442695 + 0.5;
        uStack_2138._0_4_ = fVar190;
        uStack_2138._4_4_ = fVar191;
        local_140 = local_2140;
        uStack_138 = uStack_2138;
        local_2150._4_4_ = (int)(float)local_2140._4_4_;
        local_2150._0_4_ = (int)(float)local_2140._0_4_;
        local_2150._8_4_ = (int)fVar190;
        local_2150._12_4_ = (int)fVar191;
        local_1a20 = local_2150._0_8_;
        uStack_1a18 = local_2150._8_8_;
        auVar154._8_8_ = local_2150._8_8_;
        auVar154._0_8_ = local_2150._0_8_;
        auVar6 = vcvtdq2ps_avx(auVar154);
        local_2130 = auVar6._0_8_;
        local_c0 = local_2130;
        uStack_2128 = auVar6._8_8_;
        uStack_b8 = uStack_2128;
        local_d0 = local_2140;
        uStack_c8 = uStack_2138;
        auVar176._8_8_ = uStack_2138;
        auVar176._0_8_ = local_2140;
        auVar5 = vcmpps_avx(auVar176,auVar6,1);
        local_2170._0_8_ = auVar5._0_8_;
        local_1bc0 = local_2170._0_8_;
        local_2170._8_8_ = auVar5._8_8_;
        uStack_1bb8 = local_2170._8_8_;
        local_1bd0 = 0x3f8000003f800000;
        uStack_1bc8 = 0x3f8000003f800000;
        auVar142._8_8_ = 0x3f8000003f800000;
        auVar142._0_8_ = 0x3f8000003f800000;
        local_2170 = vpand_avx(auVar5,auVar142);
        local_2000 = local_2130;
        uStack_1ff8 = uStack_2128;
        local_2010 = local_2170._0_8_;
        uStack_2008 = local_2170._8_8_;
        _local_2140 = vsubps_avx(auVar6,local_2170);
        local_4e0 = local_2140;
        uStack_4d8 = uStack_2138;
        local_500 = local_2120._0_8_;
        uStack_4f8 = local_2120._8_8_;
        local_4a0 = local_2120._0_8_;
        uStack_498 = local_2120._8_8_;
        local_4d0 = 0x3f3180003f318000;
        uStack_4c8 = 0x3f3180003f318000;
        local_4c0._0_4_ = local_2140._0_4_;
        local_4c0._4_4_ = local_2140._4_4_;
        uStack_4b8._0_4_ = local_2140._8_4_;
        uStack_4b8._4_4_ = local_2140._12_4_;
        local_4b0 = (float)local_4c0 * 0.6933594;
        fStack_4ac = local_4c0._4_4_ * 0.6933594;
        fStack_4a8 = (float)uStack_4b8 * 0.6933594;
        fStack_4a4 = uStack_4b8._4_4_ * 0.6933594;
        auVar162._4_4_ = fStack_4ac;
        auVar162._0_4_ = local_4b0;
        auVar162._8_4_ = fStack_4a8;
        auVar162._12_4_ = fStack_4a4;
        auVar5 = vsubps_avx(auVar1,auVar162);
        local_550 = local_2140;
        uStack_548 = uStack_2138;
        local_2120._0_8_ = auVar5._0_8_;
        local_570 = local_2120._0_8_;
        local_2120._8_8_ = auVar5._8_8_;
        uStack_568 = local_2120._8_8_;
        local_510 = local_2120._0_8_;
        uStack_508 = local_2120._8_8_;
        local_530 = local_2140;
        uStack_528 = uStack_2138;
        local_540 = 0xb95e8083b95e8083;
        uStack_538 = 0xb95e8083b95e8083;
        local_520 = (float)local_4c0 * -0.00021219444;
        fStack_51c = local_4c0._4_4_ * -0.00021219444;
        fStack_518 = (float)uStack_4b8 * -0.00021219444;
        fStack_514 = uStack_4b8._4_4_ * -0.00021219444;
        auVar161._4_4_ = fStack_51c;
        auVar161._0_4_ = local_520;
        auVar161._8_4_ = fStack_518;
        auVar161._12_4_ = fStack_514;
        local_2120 = vsubps_avx(auVar5,auVar161);
        local_20b0 = local_2120._0_8_;
        uStack_20a8 = local_2120._8_8_;
        local_20a0._0_4_ = local_2120._0_4_;
        local_20a0._4_4_ = local_2120._4_4_;
        uStack_2098._0_4_ = local_2120._8_4_;
        uStack_2098._4_4_ = local_2120._12_4_;
        local_2130 = CONCAT44(local_20a0._4_4_ * local_20a0._4_4_,
                              (float)local_20a0 * (float)local_20a0);
        uStack_2128._0_4_ = (float)uStack_2098 * (float)uStack_2098;
        uStack_2128._4_4_ = uStack_2098._4_4_ * uStack_2098._4_4_;
        local_1480 = 0x3950696739506967;
        local_14a0._8_4_ = 0x39506967;
        local_14a0._0_8_ = 0x3950696739506967;
        local_14a0._12_4_ = 0x39506967;
        local_14b0 = local_2120._0_8_;
        uStack_14a8 = local_2120._8_8_;
        uStack_1478 = local_14a0._8_8_;
        local_1490 = local_2120._0_8_;
        uStack_1488 = local_2120._8_8_;
        local_1460 = (float)local_20a0 * 0.00019875691;
        fStack_145c = local_20a0._4_4_ * 0.00019875691;
        fStack_1458 = (float)uStack_2098 * 0.00019875691;
        fStack_1454 = uStack_2098._4_4_ * 0.00019875691;
        local_1470 = 0x3ab743ce3ab743ce;
        uStack_1468 = 0x3ab743ce3ab743ce;
        local_14f0 = CONCAT44(fStack_145c + 0.0013981999,local_1460 + 0.0013981999);
        local_1510._8_4_ = fStack_1458 + 0.0013981999;
        local_1510._0_8_ = local_14f0;
        local_1510._12_4_ = fStack_1454 + 0.0013981999;
        local_1520 = local_2120._0_8_;
        uStack_1518 = local_2120._8_8_;
        uStack_14e8 = local_1510._8_8_;
        local_1500 = local_2120._0_8_;
        uStack_14f8 = local_2120._8_8_;
        local_14d0 = (float)local_20a0 * (local_1460 + 0.0013981999);
        fStack_14cc = local_20a0._4_4_ * (fStack_145c + 0.0013981999);
        fStack_14c8 = (float)uStack_2098 * (fStack_1458 + 0.0013981999);
        fStack_14c4 = uStack_2098._4_4_ * (fStack_1454 + 0.0013981999);
        local_14e0 = 0x3c0889083c088908;
        uStack_14d8 = 0x3c0889083c088908;
        local_1560 = CONCAT44(fStack_14cc + 0.008333452,local_14d0 + 0.008333452);
        local_1580._8_4_ = fStack_14c8 + 0.008333452;
        local_1580._0_8_ = local_1560;
        local_1580._12_4_ = fStack_14c4 + 0.008333452;
        local_1590 = local_2120._0_8_;
        uStack_1588 = local_2120._8_8_;
        uStack_1558 = local_1580._8_8_;
        local_1570 = local_2120._0_8_;
        uStack_1568 = local_2120._8_8_;
        local_1540 = (local_14d0 + 0.008333452) * (float)local_20a0;
        fStack_153c = (fStack_14cc + 0.008333452) * local_20a0._4_4_;
        fStack_1538 = (fStack_14c8 + 0.008333452) * (float)uStack_2098;
        fStack_1534 = (fStack_14c4 + 0.008333452) * uStack_2098._4_4_;
        local_1550 = 0x3d2aa9c13d2aa9c1;
        uStack_1548 = 0x3d2aa9c13d2aa9c1;
        local_15d0 = CONCAT44(fStack_153c + 0.041665796,local_1540 + 0.041665796);
        local_15f0._8_4_ = fStack_1538 + 0.041665796;
        local_15f0._0_8_ = local_15d0;
        local_15f0._12_4_ = fStack_1534 + 0.041665796;
        local_1600 = local_2120._0_8_;
        uStack_15f8 = local_2120._8_8_;
        uStack_15c8 = local_15f0._8_8_;
        local_15e0 = local_2120._0_8_;
        uStack_15d8 = local_2120._8_8_;
        local_15b0 = (local_1540 + 0.041665796) * (float)local_20a0;
        fStack_15ac = (fStack_153c + 0.041665796) * local_20a0._4_4_;
        fStack_15a8 = (fStack_1538 + 0.041665796) * (float)uStack_2098;
        fStack_15a4 = (fStack_1534 + 0.041665796) * uStack_2098._4_4_;
        local_15c0 = 0x3e2aaaaa3e2aaaaa;
        uStack_15b8 = 0x3e2aaaaa3e2aaaaa;
        local_1660 = CONCAT44(fStack_15ac + 0.16666666,local_15b0 + 0.16666666);
        uStack_1658 = CONCAT44(fStack_15a4 + 0.16666666,fStack_15a8 + 0.16666666);
        local_1670 = local_2120._0_8_;
        uStack_1668 = local_2120._8_8_;
        local_1650 = local_2120._0_8_;
        uStack_1648 = local_2120._8_8_;
        local_1620 = (local_15b0 + 0.16666666) * (float)local_20a0;
        fStack_161c = (fStack_15ac + 0.16666666) * local_20a0._4_4_;
        fStack_1618 = (fStack_15a8 + 0.16666666) * (float)uStack_2098;
        fStack_1614 = (fStack_15a4 + 0.16666666) * uStack_2098._4_4_;
        local_1630 = 0x3f0000003f000000;
        uStack_1628 = 0x3f0000003f000000;
        local_16b0 = CONCAT44(fStack_161c + 0.5,local_1620 + 0.5);
        local_16d0._8_4_ = fStack_1618 + 0.5;
        local_16d0._0_8_ = local_16b0;
        local_16d0._12_4_ = fStack_1614 + 0.5;
        local_16e0 = local_2130;
        uStack_16d8 = uStack_2128;
        local_16f0 = local_2120._0_8_;
        uStack_16e8 = local_2120._8_8_;
        uStack_16a8 = local_16d0._8_8_;
        local_16c0 = local_2130;
        uStack_16b8 = uStack_2128;
        local_1690 = (local_1620 + 0.5) * (float)local_20a0 * (float)local_20a0;
        fStack_168c = (fStack_161c + 0.5) * local_20a0._4_4_ * local_20a0._4_4_;
        fStack_1688 = (fStack_1618 + 0.5) * (float)uStack_2098 * (float)uStack_2098;
        fStack_1684 = (fStack_1614 + 0.5) * uStack_2098._4_4_ * uStack_2098._4_4_;
        local_16a0 = local_2120._0_8_;
        uStack_1698 = local_2120._8_8_;
        local_2060 = CONCAT44(fStack_168c + local_20a0._4_4_,local_1690 + (float)local_20a0);
        uStack_2058 = CONCAT44(fStack_1684 + uStack_2098._4_4_,fStack_1688 + (float)uStack_2098);
        local_2070 = 0x3f8000003f800000;
        uStack_2068 = 0x3f8000003f800000;
        local_2180 = local_1690 + (float)local_20a0 + 1.0;
        fStack_217c = fStack_168c + local_20a0._4_4_ + 1.0;
        fStack_2178 = fStack_1688 + (float)uStack_2098 + 1.0;
        fStack_2174 = fStack_1684 + uStack_2098._4_4_ + 1.0;
        local_150 = local_2140;
        uStack_148 = uStack_2138;
        local_2150._4_4_ = (int)local_4c0._4_4_;
        local_2150._0_4_ = (int)(float)local_4c0;
        local_2150._8_4_ = (int)(float)uStack_4b8;
        local_2150._12_4_ = (int)uStack_4b8._4_4_;
        local_2100 = local_2150._0_8_;
        uStack_20f8 = local_2150._8_8_;
        auVar123._8_8_ = local_2150._8_8_;
        auVar123._0_8_ = local_2150._0_8_;
        auVar122._8_8_ = 0x7f0000007f;
        auVar122._0_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx(auVar123,auVar122);
        local_2150._0_8_ = auVar5._0_8_;
        local_20e0 = local_2150._0_8_;
        local_2150._8_8_ = auVar5._8_8_;
        uStack_20d8 = local_2150._8_8_;
        local_20e4 = 0x17;
        local_2150 = vpslld_avx(auVar5,ZEXT416(0x17));
        local_60 = local_2150._0_8_;
        uStack_58 = local_2150._8_8_;
        local_2190 = local_2150._0_8_;
        uStack_2188 = local_2150._8_8_;
        local_20c0._4_4_ = fStack_217c;
        local_20c0._0_4_ = local_2180;
        local_20c0._8_4_ = fStack_2178;
        local_20c0._12_4_ = fStack_2174;
        local_20d0._0_4_ = local_2150._0_4_;
        local_20d0._4_4_ = local_2150._4_4_;
        uStack_20c8._0_4_ = local_2150._8_4_;
        uStack_20c8._4_4_ = local_2150._12_4_;
        local_2180 = local_2180 * (float)local_20d0;
        fStack_217c = fStack_217c * local_20d0._4_4_;
        fStack_2178 = fStack_2178 * (float)uStack_20c8;
        fStack_2174 = fStack_2174 * uStack_20c8._4_4_;
        local_21b0 = CONCAT44(fStack_217c,local_2180);
        uStack_21a8 = CONCAT44(fStack_2174,fStack_2178);
        local_1db0 = local_2180 + 1.0;
        fStack_1dac = fStack_217c + 1.0;
        fStack_1da8 = fStack_2178 + 1.0;
        fStack_1da4 = fStack_2174 + 1.0;
        auVar130._4_4_ = fStack_1dac;
        auVar130._0_4_ = local_1db0;
        auVar130._8_4_ = fStack_1da8;
        auVar130._12_4_ = fStack_1da4;
        _local_29e0 = vdivps_avx(local_21a0,auVar130);
        local_2200._0_4_ = (float)local_29e0._0_4_ * 2.0;
        local_2200._4_4_ = (float)local_29e0._4_4_ * 2.0;
        local_2200._8_4_ = fStack_29d8 * 2.0;
        local_2200._12_4_ = fStack_29d4 * 2.0;
        auVar120._8_8_ = 0x3f8000003f800000;
        auVar120._0_8_ = 0x3f8000003f800000;
        _local_2ab0 = vsubps_avx(local_2200,auVar120);
        local_2aa0._0_4_ = (undefined4)local_8b90;
        local_2aa0._4_4_ = (undefined4)((ulong)local_8b90 >> 0x20);
        fStack_2a98 = (float)uStack_8b88;
        fStack_2a94 = (float)((ulong)uStack_8b88 >> 0x20);
        local_8ef0 = CONCAT44((float)local_2aa0._4_4_ * (float)local_2ab0._4_4_,
                              (float)local_2aa0._0_4_ * (float)local_2ab0._0_4_);
        uStack_8ee8 = CONCAT44(fStack_2a94 * fStack_2aa4,fStack_2a98 * fStack_2aa8);
        local_8b58 = local_8e60;
        local_8b70 = local_8ef0;
        uStack_8b68 = uStack_8ee8;
        auVar31._8_8_ = uStack_8ee8;
        auVar31._0_8_ = local_8ef0;
        *(undefined1 (*) [16])*local_8e60 = auVar31;
        local_8e60 = (undefined1 (*) [32])(*local_8e60 + 0x10);
        _local_2aa0 = auVar7;
        local_29f0 = local_2a20;
        uStack_29e8 = uStack_2a18;
        local_29d0 = local_2a20;
        uStack_29c8 = uStack_2a18;
        local_29c0 = local_2800;
        uStack_29b8 = uStack_27f8;
        local_2760 = local_2770;
        uStack_2758 = uStack_2768;
        local_2750 = local_2880;
        uStack_2748 = uStack_2878;
        local_2730 = local_2860._0_8_;
        uStack_2728 = local_2860._8_8_;
        local_2720 = uVar14;
        uStack_2718 = uVar15;
        local_2700 = uVar12;
        uStack_26f8 = uVar13;
        local_24c0 = local_2820;
        uStack_24b8 = uStack_2818;
        local_2470 = local_27d0;
        uStack_2468 = uStack_27c8;
        local_2430 = local_24b0._0_8_;
        uStack_2428 = local_24b0._8_8_;
        local_2400 = local_2410;
        uStack_23f8 = uStack_2408;
        local_23e0 = uVar10;
        uStack_23d8 = uVar11;
        uStack_238c = local_2390;
        uStack_2388 = local_2390;
        uStack_2384 = local_2390;
        uStack_236c = local_2370;
        uStack_2368 = local_2370;
        uStack_2364 = local_2370;
        uStack_22ec = local_22f0;
        uStack_22e8 = local_22f0;
        uStack_22e4 = local_22f0;
        local_2210 = local_2a10;
        uStack_2208 = uStack_2a08;
        local_2160 = local_2820;
        uStack_2158 = uStack_2818;
        local_20d0 = local_2150._0_8_;
        uStack_20c8 = local_2150._8_8_;
        local_20a0 = local_20b0;
        uStack_2098 = uStack_20a8;
        local_2090 = local_23f0;
        uStack_2088 = uStack_23e8;
        local_2080 = uVar16;
        uStack_2078 = uVar17;
        local_2050 = local_23b0;
        uStack_2048 = uStack_23a8;
        uStack_202c = local_2030;
        uStack_2028 = local_2030;
        uStack_2024 = local_2030;
        local_1da0 = local_21a0;
        local_1d50 = local_1d60;
        local_1d30 = local_1d60;
        local_1c90 = local_1cb0;
        uStack_1c88 = uStack_1ca8;
        local_1a90 = local_23b0;
        uStack_1a88 = uStack_23a8;
        local_1680 = local_23b0;
        uStack_1678 = uStack_23a8;
        local_1640 = local_1660;
        uStack_1638 = uStack_1658;
        local_13e0 = local_23b0;
        uStack_13d8 = uStack_23a8;
        local_1370 = local_1610;
        uStack_1368 = uStack_1608;
        local_1300 = local_15a0;
        uStack_12f8 = uStack_1598;
        local_1290 = local_1530;
        uStack_1288 = uStack_1528;
        local_1220 = local_14c0;
        uStack_1218 = uStack_14b8;
        local_e60 = local_2840;
        uStack_e58 = uStack_2838;
        local_560 = local_e90;
        uStack_558 = uStack_e88;
        local_4f0 = local_f00;
        uStack_4e8 = uStack_ef8;
        local_4c0 = local_2140;
        uStack_4b8 = uStack_2138;
        local_480 = local_e90;
        uStack_478 = uStack_e88;
        local_410 = local_f00;
        uStack_408 = uStack_ef8;
        local_3e0 = local_24a0;
        uStack_3d8 = uStack_2498;
        local_2c0 = local_23b0;
        uStack_2b8 = uStack_23a8;
        local_290 = local_2b0;
        uStack_288 = uStack_2a8;
        local_1b0 = local_1d0;
        uStack_1a8 = uStack_1c8;
        local_1a0 = local_8b90;
        uStack_198 = uStack_8b88;
      }
      for (; local_8eac < local_8d48; local_8eac = local_8eac + 1) {
        fVar190 = *(float *)*local_8e60;
        dVar185 = std::exp((double)(ulong)*(uint *)*local_8e60);
        dVar185 = std::log((double)(ulong)(uint)(SUB84(dVar185,0) + 1.0));
        dVar185 = std::tanh(dVar185);
        *(float *)*local_8e60 = fVar190 * SUB84(dVar185,0);
        local_8e60 = (undefined1 (*) [32])(*local_8e60 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}